

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O1

void embree::avx512::CurveNiMBIntersectorK<4,8>::
     intersect_t<embree::avx512::RibbonCurve1IntersectorK<embree::BSplineCurveT,8,8>,embree::avx512::Intersect1KEpilogMU<8,8,true>>
               (Precalculations *pre,RayHitK<8> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  int iVar1;
  int iVar2;
  float *pfVar3;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar4;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar5;
  Primitive PVar6;
  uint uVar7;
  int iVar8;
  undefined4 uVar9;
  __int_type_conflict _Var10;
  long lVar11;
  RTCFilterFunctionN p_Var12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined8 uVar26;
  ulong uVar27;
  uint uVar28;
  long lVar29;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  int iVar72;
  int iVar73;
  int iVar74;
  int iVar75;
  int iVar76;
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  byte bVar87;
  byte bVar88;
  ulong uVar89;
  uint uVar90;
  long lVar91;
  long lVar92;
  Geometry *pGVar93;
  uint uVar94;
  ulong uVar95;
  byte bVar96;
  float fVar97;
  float fVar98;
  float fVar149;
  float fVar151;
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  float fVar150;
  float fVar152;
  float fVar153;
  float fVar154;
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  float fVar155;
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined4 uVar156;
  undefined8 uVar157;
  vint4 bi_2;
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  undefined1 auVar168 [32];
  undefined1 auVar169 [32];
  undefined1 auVar170 [32];
  undefined1 auVar171 [32];
  vint4 bi_1;
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  vint4 bi;
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  float fVar187;
  float fVar191;
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [32];
  float fVar192;
  float fVar193;
  float fVar208;
  float fVar210;
  vint4 ai_2;
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  float fVar211;
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  float fVar209;
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [32];
  undefined1 auVar203 [32];
  undefined1 auVar204 [32];
  undefined1 auVar205 [32];
  undefined1 auVar206 [32];
  undefined1 auVar207 [32];
  vint4 ai_1;
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [32];
  undefined1 auVar218 [32];
  undefined1 auVar219 [32];
  undefined1 auVar220 [32];
  vint4 ai;
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [32];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [32];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [32];
  undefined1 auVar234 [16];
  undefined1 auVar235 [64];
  undefined1 auVar236 [16];
  undefined1 auVar237 [32];
  undefined1 auVar238 [32];
  undefined1 auVar239 [64];
  undefined1 auVar240 [64];
  undefined1 auVar241 [64];
  undefined1 auVar242 [64];
  undefined1 auVar243 [64];
  undefined1 auVar244 [16];
  undefined1 auVar245 [64];
  undefined1 auVar246 [64];
  undefined1 auVar247 [64];
  undefined1 auVar248 [64];
  undefined1 auVar249 [64];
  RTCFilterFunctionNArguments args;
  RibbonHit<embree::BSplineCurveT<embree::Vec3fx>,_8> bhit;
  undefined8 local_770;
  undefined8 uStack_768;
  RTCFilterFunctionNArguments local_760;
  Geometry *local_730;
  undefined1 (*local_728) [32];
  undefined1 local_720 [32];
  undefined1 local_700 [32];
  undefined1 local_6e0 [8];
  float fStack_6d8;
  float fStack_6d4;
  undefined1 local_6d0 [8];
  undefined8 uStack_6c8;
  undefined1 local_6c0 [16];
  undefined1 local_6b0 [16];
  undefined1 local_6a0 [32];
  undefined1 local_680 [32];
  undefined1 local_660 [32];
  undefined1 local_640 [32];
  undefined1 local_620 [32];
  undefined1 local_600 [32];
  undefined1 local_5e0 [32];
  undefined8 local_5c0;
  undefined8 uStack_5b8;
  undefined8 uStack_5b0;
  undefined8 uStack_5a8;
  float local_5a0;
  float fStack_59c;
  float fStack_598;
  float fStack_594;
  undefined8 local_590;
  undefined8 uStack_588;
  undefined4 local_580;
  undefined4 uStack_57c;
  undefined8 uStack_578;
  LinearSpace3fa *local_570;
  Primitive *local_568;
  float local_560;
  float fStack_55c;
  float fStack_558;
  float fStack_554;
  float fStack_550;
  float fStack_54c;
  float fStack_548;
  float fStack_544;
  undefined1 local_540 [32];
  undefined1 local_520 [32];
  undefined1 local_500 [32];
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [32];
  undefined4 local_4a0;
  undefined4 uStack_49c;
  undefined4 uStack_498;
  undefined4 uStack_494;
  undefined4 uStack_490;
  undefined4 uStack_48c;
  undefined4 uStack_488;
  undefined4 uStack_484;
  undefined1 local_480 [8];
  float fStack_478;
  float fStack_474;
  float fStack_470;
  float fStack_46c;
  float fStack_468;
  float fStack_464;
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  undefined1 local_420 [32];
  undefined4 local_400;
  int local_3fc;
  undefined8 local_3f0;
  undefined8 uStack_3e8;
  undefined8 local_3e0;
  undefined8 uStack_3d8;
  undefined8 local_3d0;
  undefined8 uStack_3c8;
  undefined8 local_3c0;
  undefined8 uStack_3b8;
  byte local_3b0;
  float local_3a0 [4];
  float fStack_390;
  float fStack_38c;
  float fStack_388;
  float fStack_384;
  undefined8 local_380;
  undefined8 uStack_378;
  undefined8 uStack_370;
  undefined8 uStack_368;
  undefined1 local_360 [32];
  undefined1 local_340 [32];
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined1 local_2b0 [16];
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  int local_260;
  int iStack_25c;
  int iStack_258;
  int iStack_254;
  int iStack_250;
  int iStack_24c;
  int iStack_248;
  int iStack_244;
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  undefined1 local_200 [32];
  undefined4 local_1e0;
  undefined4 uStack_1dc;
  undefined4 uStack_1d8;
  undefined4 uStack_1d4;
  undefined4 uStack_1d0;
  undefined4 uStack_1cc;
  undefined4 uStack_1c8;
  undefined4 uStack_1c4;
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  undefined8 uStack_1b0;
  undefined8 uStack_1a8;
  undefined1 local_1a0 [32];
  uint local_180;
  uint uStack_17c;
  uint uStack_178;
  uint uStack_174;
  uint uStack_170;
  uint uStack_16c;
  uint uStack_168;
  uint uStack_164;
  uint local_160;
  uint uStack_15c;
  uint uStack_158;
  uint uStack_154;
  uint uStack_150;
  uint uStack_14c;
  uint uStack_148;
  uint uStack_144;
  undefined1 local_140 [32];
  undefined1 local_120 [32];
  undefined1 local_100 [32];
  undefined1 local_e0 [8];
  float fStack_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  float fStack_c8;
  undefined4 uStack_c4;
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  
  PVar6 = prim[1];
  uVar89 = (ulong)(byte)PVar6;
  lVar29 = uVar89 * 0x25;
  fVar193 = *(float *)(prim + lVar29 + 0x12);
  auVar103 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                           0x10);
  auVar103 = vinsertps_avx(auVar103,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar102 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                           ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar102 = vinsertps_avx(auVar102,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  auVar103 = vsubps_avx(auVar103,*(undefined1 (*) [16])(prim + lVar29 + 6));
  auVar188._0_4_ = fVar193 * auVar103._0_4_;
  auVar188._4_4_ = fVar193 * auVar103._4_4_;
  auVar188._8_4_ = fVar193 * auVar103._8_4_;
  auVar188._12_4_ = fVar193 * auVar103._12_4_;
  auVar103 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar89 * 4 + 6)));
  auVar158._0_4_ = fVar193 * auVar102._0_4_;
  auVar158._4_4_ = fVar193 * auVar102._4_4_;
  auVar158._8_4_ = fVar193 * auVar102._8_4_;
  auVar158._12_4_ = fVar193 * auVar102._12_4_;
  auVar103 = vcvtdq2ps_avx(auVar103);
  auVar102 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar89 * 5 + 6)));
  auVar102 = vcvtdq2ps_avx(auVar102);
  auVar104 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar89 * 6 + 6)));
  auVar20 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar89 * 0xf + 6)));
  auVar104 = vcvtdq2ps_avx(auVar104);
  auVar20 = vcvtdq2ps_avx(auVar20);
  auVar244 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar6 * 0x10 + 6)));
  auVar244 = vcvtdq2ps_avx(auVar244);
  auVar21 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar6 * 0x10 + uVar89 + 6)));
  auVar21 = vcvtdq2ps_avx(auVar21);
  auVar22 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar89 * 0x1a + 6)));
  auVar22 = vcvtdq2ps_avx(auVar22);
  auVar23 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar89 * 0x1b + 6)));
  auVar23 = vcvtdq2ps_avx(auVar23);
  auVar24 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar89 * 0x1c + 6)));
  auVar24 = vcvtdq2ps_avx(auVar24);
  auVar212._4_4_ = auVar158._0_4_;
  auVar212._0_4_ = auVar158._0_4_;
  auVar212._8_4_ = auVar158._0_4_;
  auVar212._12_4_ = auVar158._0_4_;
  auVar25 = vshufps_avx(auVar158,auVar158,0x55);
  auVar105 = vshufps_avx(auVar158,auVar158,0xaa);
  fVar193 = auVar105._0_4_;
  auVar178._0_4_ = fVar193 * auVar104._0_4_;
  fVar209 = auVar105._4_4_;
  auVar178._4_4_ = fVar209 * auVar104._4_4_;
  fVar192 = auVar105._8_4_;
  auVar178._8_4_ = fVar192 * auVar104._8_4_;
  fVar208 = auVar105._12_4_;
  auVar178._12_4_ = fVar208 * auVar104._12_4_;
  auVar172._0_4_ = auVar21._0_4_ * fVar193;
  auVar172._4_4_ = auVar21._4_4_ * fVar209;
  auVar172._8_4_ = auVar21._8_4_ * fVar192;
  auVar172._12_4_ = auVar21._12_4_ * fVar208;
  auVar159._0_4_ = auVar24._0_4_ * fVar193;
  auVar159._4_4_ = auVar24._4_4_ * fVar209;
  auVar159._8_4_ = auVar24._8_4_ * fVar192;
  auVar159._12_4_ = auVar24._12_4_ * fVar208;
  auVar105 = vfmadd231ps_fma(auVar178,auVar25,auVar102);
  auVar106 = vfmadd231ps_fma(auVar172,auVar25,auVar244);
  auVar25 = vfmadd231ps_fma(auVar159,auVar23,auVar25);
  auVar31 = vfmadd231ps_fma(auVar105,auVar212,auVar103);
  auVar106 = vfmadd231ps_fma(auVar106,auVar212,auVar20);
  auVar107 = vfmadd231ps_fma(auVar25,auVar22,auVar212);
  auVar234._4_4_ = auVar188._0_4_;
  auVar234._0_4_ = auVar188._0_4_;
  auVar234._8_4_ = auVar188._0_4_;
  auVar234._12_4_ = auVar188._0_4_;
  auVar25 = vshufps_avx(auVar188,auVar188,0x55);
  auVar105 = vshufps_avx(auVar188,auVar188,0xaa);
  fVar193 = auVar105._0_4_;
  auVar213._0_4_ = fVar193 * auVar104._0_4_;
  fVar209 = auVar105._4_4_;
  auVar213._4_4_ = fVar209 * auVar104._4_4_;
  fVar192 = auVar105._8_4_;
  auVar213._8_4_ = fVar192 * auVar104._8_4_;
  fVar208 = auVar105._12_4_;
  auVar213._12_4_ = fVar208 * auVar104._12_4_;
  auVar194._0_4_ = auVar21._0_4_ * fVar193;
  auVar194._4_4_ = auVar21._4_4_ * fVar209;
  auVar194._8_4_ = auVar21._8_4_ * fVar192;
  auVar194._12_4_ = auVar21._12_4_ * fVar208;
  auVar189._0_4_ = auVar24._0_4_ * fVar193;
  auVar189._4_4_ = auVar24._4_4_ * fVar209;
  auVar189._8_4_ = auVar24._8_4_ * fVar192;
  auVar189._12_4_ = auVar24._12_4_ * fVar208;
  auVar102 = vfmadd231ps_fma(auVar213,auVar25,auVar102);
  auVar104 = vfmadd231ps_fma(auVar194,auVar25,auVar244);
  auVar244 = vfmadd231ps_fma(auVar189,auVar25,auVar23);
  auVar32 = vfmadd231ps_fma(auVar102,auVar234,auVar103);
  auVar158 = vfmadd231ps_fma(auVar104,auVar234,auVar20);
  auVar226._8_4_ = 0x7fffffff;
  auVar226._0_8_ = 0x7fffffff7fffffff;
  auVar226._12_4_ = 0x7fffffff;
  auVar159 = vfmadd231ps_fma(auVar244,auVar234,auVar22);
  auVar103 = vandps_avx(auVar226,auVar31);
  auVar223._8_4_ = 0x219392ef;
  auVar223._0_8_ = 0x219392ef219392ef;
  auVar223._12_4_ = 0x219392ef;
  uVar95 = vcmpps_avx512vl(auVar103,auVar223,1);
  bVar13 = (bool)((byte)uVar95 & 1);
  auVar99._0_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar31._0_4_;
  bVar13 = (bool)((byte)(uVar95 >> 1) & 1);
  auVar99._4_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar31._4_4_;
  bVar13 = (bool)((byte)(uVar95 >> 2) & 1);
  auVar99._8_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar31._8_4_;
  bVar13 = (bool)((byte)(uVar95 >> 3) & 1);
  auVar99._12_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar31._12_4_;
  auVar103 = vandps_avx(auVar226,auVar106);
  uVar95 = vcmpps_avx512vl(auVar103,auVar223,1);
  bVar13 = (bool)((byte)uVar95 & 1);
  auVar100._0_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar106._0_4_;
  bVar13 = (bool)((byte)(uVar95 >> 1) & 1);
  auVar100._4_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar106._4_4_;
  bVar13 = (bool)((byte)(uVar95 >> 2) & 1);
  auVar100._8_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar106._8_4_;
  bVar13 = (bool)((byte)(uVar95 >> 3) & 1);
  auVar100._12_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar106._12_4_;
  auVar103 = vandps_avx(auVar226,auVar107);
  uVar95 = vcmpps_avx512vl(auVar103,auVar223,1);
  bVar13 = (bool)((byte)uVar95 & 1);
  auVar101._0_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar107._0_4_;
  bVar13 = (bool)((byte)(uVar95 >> 1) & 1);
  auVar101._4_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar107._4_4_;
  bVar13 = (bool)((byte)(uVar95 >> 2) & 1);
  auVar101._8_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar107._8_4_;
  bVar13 = (bool)((byte)(uVar95 >> 3) & 1);
  auVar101._12_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar107._12_4_;
  auVar102 = vrcp14ps_avx512vl(auVar99);
  auVar224._8_4_ = 0x3f800000;
  auVar224._0_8_ = &DAT_3f8000003f800000;
  auVar224._12_4_ = 0x3f800000;
  auVar103 = vfnmadd213ps_fma(auVar99,auVar102,auVar224);
  auVar31 = vfmadd132ps_fma(auVar103,auVar102,auVar102);
  auVar102 = vrcp14ps_avx512vl(auVar100);
  auVar103 = vfnmadd213ps_fma(auVar100,auVar102,auVar224);
  auVar107 = vfmadd132ps_fma(auVar103,auVar102,auVar102);
  auVar102 = vrcp14ps_avx512vl(auVar101);
  auVar103 = vfnmadd213ps_fma(auVar101,auVar102,auVar224);
  auVar30 = vfmadd132ps_fma(auVar103,auVar102,auVar102);
  fVar193 = (*(float *)(ray + k * 4 + 0xe0) - *(float *)(prim + lVar29 + 0x16)) *
            *(float *)(prim + lVar29 + 0x1a);
  auVar221._4_4_ = fVar193;
  auVar221._0_4_ = fVar193;
  auVar221._8_4_ = fVar193;
  auVar221._12_4_ = fVar193;
  auVar103._8_8_ = 0;
  auVar103._0_8_ = *(ulong *)(prim + uVar89 * 7 + 6);
  auVar103 = vpmovsxwd_avx(auVar103);
  auVar103 = vcvtdq2ps_avx(auVar103);
  auVar102._8_8_ = 0;
  auVar102._0_8_ = *(ulong *)(prim + uVar89 * 0xb + 6);
  auVar102 = vpmovsxwd_avx(auVar102);
  auVar102 = vcvtdq2ps_avx(auVar102);
  auVar20 = vsubps_avx(auVar102,auVar103);
  auVar104._8_8_ = 0;
  auVar104._0_8_ = *(ulong *)(prim + uVar89 * 9 + 6);
  auVar102 = vpmovsxwd_avx(auVar104);
  auVar104 = vfmadd213ps_fma(auVar20,auVar221,auVar103);
  auVar103 = vcvtdq2ps_avx(auVar102);
  auVar20._8_8_ = 0;
  auVar20._0_8_ = *(ulong *)(prim + uVar89 * 0xd + 6);
  auVar102 = vpmovsxwd_avx(auVar20);
  auVar102 = vcvtdq2ps_avx(auVar102);
  auVar102 = vsubps_avx(auVar102,auVar103);
  auVar20 = vfmadd213ps_fma(auVar102,auVar221,auVar103);
  auVar244._8_8_ = 0;
  auVar244._0_8_ = *(ulong *)(prim + uVar89 * 0x12 + 6);
  auVar103 = vpmovsxwd_avx(auVar244);
  auVar103 = vcvtdq2ps_avx(auVar103);
  uVar95 = (ulong)(uint)((int)(uVar89 * 5) << 2);
  auVar21._8_8_ = 0;
  auVar21._0_8_ = *(ulong *)(prim + uVar89 * 2 + uVar95 + 6);
  auVar102 = vpmovsxwd_avx(auVar21);
  auVar102 = vcvtdq2ps_avx(auVar102);
  auVar102 = vsubps_avx(auVar102,auVar103);
  auVar244 = vfmadd213ps_fma(auVar102,auVar221,auVar103);
  auVar22._8_8_ = 0;
  auVar22._0_8_ = *(ulong *)(prim + uVar95 + 6);
  auVar103 = vpmovsxwd_avx(auVar22);
  auVar103 = vcvtdq2ps_avx(auVar103);
  auVar23._8_8_ = 0;
  auVar23._0_8_ = *(ulong *)(prim + uVar89 * 0x18 + 6);
  auVar102 = vpmovsxwd_avx(auVar23);
  auVar102 = vcvtdq2ps_avx(auVar102);
  auVar102 = vsubps_avx(auVar102,auVar103);
  auVar21 = vfmadd213ps_fma(auVar102,auVar221,auVar103);
  auVar24._8_8_ = 0;
  auVar24._0_8_ = *(ulong *)(prim + uVar89 * 0x1d + 6);
  auVar103 = vpmovsxwd_avx(auVar24);
  auVar103 = vcvtdq2ps_avx(auVar103);
  auVar25._8_8_ = 0;
  auVar25._0_8_ = *(ulong *)(prim + uVar89 + (ulong)(byte)PVar6 * 0x20 + 6);
  auVar102 = vpmovsxwd_avx(auVar25);
  auVar102 = vcvtdq2ps_avx(auVar102);
  auVar102 = vsubps_avx(auVar102,auVar103);
  auVar22 = vfmadd213ps_fma(auVar102,auVar221,auVar103);
  auVar105._8_8_ = 0;
  auVar105._0_8_ = *(ulong *)(prim + ((ulong)(byte)PVar6 * 0x20 - uVar89) + 6);
  auVar103 = vpmovsxwd_avx(auVar105);
  auVar103 = vcvtdq2ps_avx(auVar103);
  auVar106._8_8_ = 0;
  auVar106._0_8_ = *(ulong *)(prim + uVar89 * 0x23 + 6);
  auVar102 = vpmovsxwd_avx(auVar106);
  auVar102 = vcvtdq2ps_avx(auVar102);
  auVar102 = vsubps_avx(auVar102,auVar103);
  auVar102 = vfmadd213ps_fma(auVar102,auVar221,auVar103);
  auVar103 = vsubps_avx(auVar104,auVar32);
  auVar222._0_4_ = auVar31._0_4_ * auVar103._0_4_;
  auVar222._4_4_ = auVar31._4_4_ * auVar103._4_4_;
  auVar222._8_4_ = auVar31._8_4_ * auVar103._8_4_;
  auVar222._12_4_ = auVar31._12_4_ * auVar103._12_4_;
  auVar103 = vsubps_avx(auVar20,auVar32);
  auVar179._0_4_ = auVar31._0_4_ * auVar103._0_4_;
  auVar179._4_4_ = auVar31._4_4_ * auVar103._4_4_;
  auVar179._8_4_ = auVar31._8_4_ * auVar103._8_4_;
  auVar179._12_4_ = auVar31._12_4_ * auVar103._12_4_;
  auVar103 = vsubps_avx(auVar244,auVar158);
  auVar214._0_4_ = auVar107._0_4_ * auVar103._0_4_;
  auVar214._4_4_ = auVar107._4_4_ * auVar103._4_4_;
  auVar214._8_4_ = auVar107._8_4_ * auVar103._8_4_;
  auVar214._12_4_ = auVar107._12_4_ * auVar103._12_4_;
  auVar103 = vsubps_avx(auVar21,auVar158);
  auVar173._0_4_ = auVar107._0_4_ * auVar103._0_4_;
  auVar173._4_4_ = auVar107._4_4_ * auVar103._4_4_;
  auVar173._8_4_ = auVar107._8_4_ * auVar103._8_4_;
  auVar173._12_4_ = auVar107._12_4_ * auVar103._12_4_;
  auVar103 = vsubps_avx(auVar22,auVar159);
  auVar195._0_4_ = auVar30._0_4_ * auVar103._0_4_;
  auVar195._4_4_ = auVar30._4_4_ * auVar103._4_4_;
  auVar195._8_4_ = auVar30._8_4_ * auVar103._8_4_;
  auVar195._12_4_ = auVar30._12_4_ * auVar103._12_4_;
  auVar103 = vsubps_avx(auVar102,auVar159);
  auVar160._0_4_ = auVar30._0_4_ * auVar103._0_4_;
  auVar160._4_4_ = auVar30._4_4_ * auVar103._4_4_;
  auVar160._8_4_ = auVar30._8_4_ * auVar103._8_4_;
  auVar160._12_4_ = auVar30._12_4_ * auVar103._12_4_;
  auVar103 = vpminsd_avx(auVar222,auVar179);
  auVar102 = vpminsd_avx(auVar214,auVar173);
  auVar103 = vmaxps_avx(auVar103,auVar102);
  auVar102 = vpminsd_avx(auVar195,auVar160);
  uVar156 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar31._4_4_ = uVar156;
  auVar31._0_4_ = uVar156;
  auVar31._8_4_ = uVar156;
  auVar31._12_4_ = uVar156;
  auVar102 = vmaxps_avx512vl(auVar102,auVar31);
  auVar103 = vmaxps_avx(auVar103,auVar102);
  auVar107._8_4_ = 0x3f7ffffa;
  auVar107._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar107._12_4_ = 0x3f7ffffa;
  local_2b0 = vmulps_avx512vl(auVar103,auVar107);
  auVar103 = vpmaxsd_avx(auVar222,auVar179);
  auVar102 = vpmaxsd_avx(auVar214,auVar173);
  auVar103 = vminps_avx(auVar103,auVar102);
  auVar102 = vpmaxsd_avx(auVar195,auVar160);
  uVar156 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar30._4_4_ = uVar156;
  auVar30._0_4_ = uVar156;
  auVar30._8_4_ = uVar156;
  auVar30._12_4_ = uVar156;
  auVar102 = vminps_avx512vl(auVar102,auVar30);
  auVar103 = vminps_avx(auVar103,auVar102);
  auVar32._8_4_ = 0x3f800003;
  auVar32._0_8_ = 0x3f8000033f800003;
  auVar32._12_4_ = 0x3f800003;
  auVar103 = vmulps_avx512vl(auVar103,auVar32);
  auVar102 = vpbroadcastd_avx512vl();
  uVar157 = vcmpps_avx512vl(local_2b0,auVar103,2);
  uVar95 = vpcmpgtd_avx512vl(auVar102,_DAT_01ff0cf0);
  uVar95 = ((byte)uVar157 & 0xf) & uVar95;
  if ((char)uVar95 != '\0') {
    local_570 = pre->ray_space + k;
    local_728 = (undefined1 (*) [32])&local_180;
    local_280 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
    local_568 = prim;
    do {
      lVar29 = 0;
      for (uVar89 = uVar95; (uVar89 & 1) == 0; uVar89 = uVar89 >> 1 | 0x8000000000000000) {
        lVar29 = lVar29 + 1;
      }
      uVar94 = *(uint *)(local_568 + 2);
      uVar7 = *(uint *)(local_568 + lVar29 * 4 + 6);
      pGVar93 = (context->scene->geometries).items[uVar94].ptr;
      uVar89 = (ulong)*(uint *)(*(long *)&pGVar93->field_0x58 +
                               (ulong)uVar7 *
                               pGVar93[1].super_RefCount.refCounter.
                               super___atomic_base<unsigned_long>._M_i);
      fVar193 = (pGVar93->time_range).lower;
      fVar193 = pGVar93->fnumTimeSegments *
                ((*(float *)(ray + k * 4 + 0xe0) - fVar193) /
                ((pGVar93->time_range).upper - fVar193));
      auVar103 = vroundss_avx(ZEXT416((uint)fVar193),ZEXT416((uint)fVar193),9);
      auVar103 = vminss_avx(auVar103,ZEXT416((uint)(pGVar93->fnumTimeSegments + -1.0)));
      auVar103 = vmaxss_avx(ZEXT816(0) << 0x20,auVar103);
      fVar193 = fVar193 - auVar103._0_4_;
      _Var10 = pGVar93[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      lVar92 = (long)(int)auVar103._0_4_ * 0x38;
      lVar29 = *(long *)(_Var10 + 0x10 + lVar92);
      lVar91 = *(long *)(_Var10 + 0x38 + lVar92);
      lVar11 = *(long *)(_Var10 + 0x48 + lVar92);
      auVar174._4_4_ = fVar193;
      auVar174._0_4_ = fVar193;
      auVar174._8_4_ = fVar193;
      auVar174._12_4_ = fVar193;
      pfVar3 = (float *)(lVar91 + uVar89 * lVar11);
      auVar227._0_4_ = fVar193 * *pfVar3;
      auVar227._4_4_ = fVar193 * pfVar3[1];
      auVar227._8_4_ = fVar193 * pfVar3[2];
      auVar227._12_4_ = fVar193 * pfVar3[3];
      pfVar3 = (float *)(lVar91 + (uVar89 + 1) * lVar11);
      auVar228._0_4_ = fVar193 * *pfVar3;
      auVar228._4_4_ = fVar193 * pfVar3[1];
      auVar228._8_4_ = fVar193 * pfVar3[2];
      auVar228._12_4_ = fVar193 * pfVar3[3];
      auVar103 = vmulps_avx512vl(auVar174,*(undefined1 (*) [16])(lVar91 + (uVar89 + 2) * lVar11));
      auVar102 = vmulps_avx512vl(auVar174,*(undefined1 (*) [16])(lVar91 + lVar11 * (uVar89 + 3)));
      lVar91 = *(long *)(_Var10 + lVar92);
      fVar193 = 1.0 - fVar193;
      auVar161._4_4_ = fVar193;
      auVar161._0_4_ = fVar193;
      auVar161._8_4_ = fVar193;
      auVar161._12_4_ = fVar193;
      auVar20 = vfmadd231ps_fma(auVar227,auVar161,*(undefined1 (*) [16])(lVar91 + lVar29 * uVar89));
      local_6b0 = vfmadd231ps_fma(auVar228,auVar161,
                                  *(undefined1 (*) [16])(lVar91 + lVar29 * (uVar89 + 1)));
      local_6c0 = vfmadd231ps_avx512vl
                            (auVar103,auVar161,
                             *(undefined1 (*) [16])(lVar91 + lVar29 * (uVar89 + 2)));
      _local_6d0 = vfmadd231ps_avx512vl
                             (auVar102,auVar161,
                              *(undefined1 (*) [16])(lVar91 + lVar29 * (uVar89 + 3)));
      iVar8 = (int)pGVar93[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      auVar103 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),
                               ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x1c);
      lVar29 = (long)iVar8 * 0x44;
      auVar103 = vinsertps_avx(auVar103,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
      auVar104 = vsubps_avx(auVar20,auVar103);
      uVar156 = auVar104._0_4_;
      auVar180._4_4_ = uVar156;
      auVar180._0_4_ = uVar156;
      auVar180._8_4_ = uVar156;
      auVar180._12_4_ = uVar156;
      auVar102 = vshufps_avx(auVar104,auVar104,0x55);
      aVar4 = (local_570->vx).field_0;
      aVar5 = (local_570->vy).field_0;
      fVar193 = (local_570->vz).field_0.m128[0];
      fVar209 = *(float *)((long)&(local_570->vz).field_0 + 4);
      fVar192 = *(float *)((long)&(local_570->vz).field_0 + 8);
      fVar208 = *(float *)((long)&(local_570->vz).field_0 + 0xc);
      auVar104 = vshufps_avx(auVar104,auVar104,0xaa);
      auVar230._0_4_ = fVar193 * auVar104._0_4_;
      auVar230._4_4_ = fVar209 * auVar104._4_4_;
      auVar230._8_4_ = fVar192 * auVar104._8_4_;
      auVar230._12_4_ = fVar208 * auVar104._12_4_;
      auVar102 = vfmadd231ps_fma(auVar230,(undefined1  [16])aVar5,auVar102);
      auVar244 = vfmadd231ps_fma(auVar102,(undefined1  [16])aVar4,auVar180);
      auVar104 = vsubps_avx(local_6b0,auVar103);
      uVar156 = auVar104._0_4_;
      auVar181._4_4_ = uVar156;
      auVar181._0_4_ = uVar156;
      auVar181._8_4_ = uVar156;
      auVar181._12_4_ = uVar156;
      auVar102 = vshufps_avx(auVar104,auVar104,0x55);
      auVar104 = vshufps_avx(auVar104,auVar104,0xaa);
      auVar231._0_4_ = fVar193 * auVar104._0_4_;
      auVar231._4_4_ = fVar209 * auVar104._4_4_;
      auVar231._8_4_ = fVar192 * auVar104._8_4_;
      auVar231._12_4_ = fVar208 * auVar104._12_4_;
      auVar102 = vfmadd231ps_fma(auVar231,(undefined1  [16])aVar5,auVar102);
      auVar21 = vfmadd231ps_fma(auVar102,(undefined1  [16])aVar4,auVar181);
      auVar104 = vsubps_avx512vl(local_6c0,auVar103);
      uVar156 = auVar104._0_4_;
      auVar182._4_4_ = uVar156;
      auVar182._0_4_ = uVar156;
      auVar182._8_4_ = uVar156;
      auVar182._12_4_ = uVar156;
      auVar102 = vshufps_avx(auVar104,auVar104,0x55);
      auVar104 = vshufps_avx(auVar104,auVar104,0xaa);
      auVar232._0_4_ = fVar193 * auVar104._0_4_;
      auVar232._4_4_ = fVar209 * auVar104._4_4_;
      auVar232._8_4_ = fVar192 * auVar104._8_4_;
      auVar232._12_4_ = fVar208 * auVar104._12_4_;
      auVar102 = vfmadd231ps_fma(auVar232,(undefined1  [16])aVar5,auVar102);
      auVar104 = vfmadd231ps_fma(auVar102,(undefined1  [16])aVar4,auVar182);
      auVar102 = vsubps_avx512vl(_local_6d0,auVar103);
      uVar156 = auVar102._0_4_;
      auVar175._4_4_ = uVar156;
      auVar175._0_4_ = uVar156;
      auVar175._8_4_ = uVar156;
      auVar175._12_4_ = uVar156;
      auVar103 = vshufps_avx(auVar102,auVar102,0x55);
      auVar102 = vshufps_avx(auVar102,auVar102,0xaa);
      auVar236._0_4_ = fVar193 * auVar102._0_4_;
      auVar236._4_4_ = fVar209 * auVar102._4_4_;
      auVar236._8_4_ = fVar192 * auVar102._8_4_;
      auVar236._12_4_ = fVar208 * auVar102._12_4_;
      auVar103 = vfmadd231ps_fma(auVar236,(undefined1  [16])aVar5,auVar103);
      auVar22 = vfmadd231ps_fma(auVar103,(undefined1  [16])aVar4,auVar175);
      auVar123 = *(undefined1 (*) [32])(bspline_basis0 + lVar29);
      uVar156 = auVar244._0_4_;
      local_500._4_4_ = uVar156;
      local_500._0_4_ = uVar156;
      local_500._8_4_ = uVar156;
      local_500._12_4_ = uVar156;
      local_500._16_4_ = uVar156;
      local_500._20_4_ = uVar156;
      local_500._24_4_ = uVar156;
      local_500._28_4_ = uVar156;
      auVar125 = *(undefined1 (*) [32])(bspline_basis0 + lVar29 + 0x484);
      auVar108._8_4_ = 1;
      auVar108._0_8_ = 0x100000001;
      auVar108._12_4_ = 1;
      auVar108._16_4_ = 1;
      auVar108._20_4_ = 1;
      auVar108._24_4_ = 1;
      auVar108._28_4_ = 1;
      local_4e0 = vpermps_avx2(auVar108,ZEXT1632(auVar244));
      local_520 = vbroadcastss_avx512vl(auVar21);
      local_700 = vpermps_avx512vl(auVar108,ZEXT1632(auVar21));
      auVar121 = *(undefined1 (*) [32])(bspline_basis0 + lVar29 + 0x908);
      local_720 = vbroadcastss_avx512vl(auVar104);
      local_5e0 = vpermps_avx512vl(auVar108,ZEXT1632(auVar104));
      auVar120 = *(undefined1 (*) [32])(bspline_basis0 + lVar29 + 0xd8c);
      local_600 = vbroadcastss_avx512vl(auVar22);
      auVar247 = ZEXT3264(local_600);
      local_620 = vpermps_avx512vl(auVar108,ZEXT1632(auVar22));
      auVar248 = ZEXT3264(local_620);
      auVar108 = vmulps_avx512vl(local_600,auVar120);
      auVar109 = vmulps_avx512vl(local_620,auVar120);
      auVar108 = vfmadd231ps_avx512vl(auVar108,auVar121,local_720);
      auVar109 = vfmadd231ps_avx512vl(auVar109,auVar121,local_5e0);
      auVar108 = vfmadd231ps_avx512vl(auVar108,auVar125,local_520);
      auVar110 = vfmadd231ps_avx512vl(auVar109,auVar125,local_700);
      auVar111 = vfmadd231ps_avx512vl(auVar108,auVar123,local_500);
      auVar108 = *(undefined1 (*) [32])(bspline_basis1 + lVar29);
      auVar109 = *(undefined1 (*) [32])(bspline_basis1 + lVar29 + 0x484);
      auVar119 = *(undefined1 (*) [32])(bspline_basis1 + lVar29 + 0x908);
      auVar112 = vfmadd231ps_avx512vl(auVar110,auVar123,local_4e0);
      auVar110 = *(undefined1 (*) [32])(bspline_basis1 + lVar29 + 0xd8c);
      auVar113 = vmulps_avx512vl(local_600,auVar110);
      auVar114 = vmulps_avx512vl(local_620,auVar110);
      auVar113 = vfmadd231ps_avx512vl(auVar113,auVar119,local_720);
      auVar114 = vfmadd231ps_avx512vl(auVar114,auVar119,local_5e0);
      auVar113 = vfmadd231ps_avx512vl(auVar113,auVar109,local_520);
      auVar114 = vfmadd231ps_avx512vl(auVar114,auVar109,local_700);
      auVar23 = vfmadd231ps_fma(auVar113,auVar108,local_500);
      auVar24 = vfmadd231ps_fma(auVar114,auVar108,local_4e0);
      auVar114 = vsubps_avx512vl(ZEXT1632(auVar23),auVar111);
      auVar115 = vsubps_avx512vl(ZEXT1632(auVar24),auVar112);
      auVar113 = vmulps_avx512vl(auVar112,auVar114);
      auVar116 = vmulps_avx512vl(auVar111,auVar115);
      auVar113 = vsubps_avx512vl(auVar113,auVar116);
      auVar103 = vshufps_avx(auVar20,auVar20,0xff);
      uVar157 = auVar103._0_8_;
      local_80._8_8_ = uVar157;
      local_80._0_8_ = uVar157;
      local_80._16_8_ = uVar157;
      local_80._24_8_ = uVar157;
      auVar103 = vshufps_avx(local_6b0,local_6b0,0xff);
      local_a0 = vbroadcastsd_avx512vl(auVar103);
      auVar103 = vshufps_avx512vl(local_6c0,local_6c0,0xff);
      local_c0 = vbroadcastsd_avx512vl(auVar103);
      auVar103 = vshufps_avx512vl(_local_6d0,_local_6d0,0xff);
      uVar157 = auVar103._0_8_;
      register0x00001248 = uVar157;
      local_e0 = uVar157;
      register0x00001250 = uVar157;
      register0x00001258 = uVar157;
      auVar116 = vmulps_avx512vl(_local_e0,auVar120);
      auVar116 = vfmadd231ps_avx512vl(auVar116,auVar121,local_c0);
      auVar116 = vfmadd231ps_avx512vl(auVar116,auVar125,local_a0);
      auVar116 = vfmadd231ps_avx512vl(auVar116,auVar123,local_80);
      auVar117 = vmulps_avx512vl(_local_e0,auVar110);
      auVar117 = vfmadd231ps_avx512vl(auVar117,auVar119,local_c0);
      auVar117 = vfmadd231ps_avx512vl(auVar117,auVar109,local_a0);
      auVar25 = vfmadd231ps_fma(auVar117,auVar108,local_80);
      auVar117 = vmulps_avx512vl(auVar115,auVar115);
      auVar117 = vfmadd231ps_avx512vl(auVar117,auVar114,auVar114);
      auVar118 = vmaxps_avx512vl(auVar116,ZEXT1632(auVar25));
      auVar118 = vmulps_avx512vl(auVar118,auVar118);
      auVar117 = vmulps_avx512vl(auVar118,auVar117);
      auVar113 = vmulps_avx512vl(auVar113,auVar113);
      uVar157 = vcmpps_avx512vl(auVar113,auVar117,2);
      auVar103 = vblendps_avx(auVar244,auVar20,8);
      auVar105 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      auVar102 = vandps_avx512vl(auVar103,auVar105);
      auVar103 = vblendps_avx(auVar21,local_6b0,8);
      auVar103 = vandps_avx512vl(auVar103,auVar105);
      auVar102 = vmaxps_avx(auVar102,auVar103);
      auVar103 = vblendps_avx(auVar104,local_6c0,8);
      auVar106 = vandps_avx512vl(auVar103,auVar105);
      auVar103 = vblendps_avx(auVar22,_local_6d0,8);
      auVar103 = vandps_avx512vl(auVar103,auVar105);
      auVar103 = vmaxps_avx(auVar106,auVar103);
      auVar103 = vmaxps_avx(auVar102,auVar103);
      auVar102 = vmovshdup_avx(auVar103);
      auVar102 = vmaxss_avx(auVar102,auVar103);
      auVar103 = vshufpd_avx(auVar103,auVar103,1);
      auVar103 = vmaxss_avx(auVar103,auVar102);
      _local_480 = vcvtsi2ss_avx512f(local_6c0,iVar8);
      auVar117._0_4_ = local_480._0_4_;
      auVar117._4_4_ = auVar117._0_4_;
      auVar117._8_4_ = auVar117._0_4_;
      auVar117._12_4_ = auVar117._0_4_;
      auVar117._16_4_ = auVar117._0_4_;
      auVar117._20_4_ = auVar117._0_4_;
      auVar117._24_4_ = auVar117._0_4_;
      auVar117._28_4_ = auVar117._0_4_;
      uVar26 = vcmpps_avx512vl(auVar117,_DAT_02020f40,0xe);
      bVar96 = (byte)uVar157 & (byte)uVar26;
      fVar209 = auVar103._0_4_ * 4.7683716e-07;
      auVar113._8_4_ = 2;
      auVar113._0_8_ = 0x200000002;
      auVar113._12_4_ = 2;
      auVar113._16_4_ = 2;
      auVar113._20_4_ = 2;
      auVar113._24_4_ = 2;
      auVar113._28_4_ = 2;
      local_100 = vpermps_avx512vl(auVar113,ZEXT1632(auVar244));
      local_120 = vpermps_avx512vl(auVar113,ZEXT1632(auVar21));
      local_140 = vpermps_avx512vl(auVar113,ZEXT1632(auVar104));
      auVar113 = vpermps_avx2(auVar113,ZEXT1632(auVar22));
      fVar193 = *(float *)(ray + k * 4 + 0x60);
      auVar103 = auVar115._0_16_;
      _local_6e0 = ZEXT416((uint)fVar209);
      local_770 = auVar20._0_8_;
      uStack_768 = auVar20._8_8_;
      if (bVar96 == 0) {
        auVar103 = vxorps_avx512vl(auVar103,auVar103);
        auVar245 = ZEXT1664(auVar103);
        auVar241 = ZEXT3264(local_500);
        auVar242 = ZEXT3264(local_4e0);
        auVar243 = ZEXT3264(local_520);
        auVar239 = ZEXT3264(local_700);
        auVar249 = ZEXT3264(local_720);
        auVar246 = ZEXT3264(local_5e0);
      }
      else {
        fStack_55c = 0.0;
        fStack_558 = 0.0;
        fStack_554 = 0.0;
        auVar110 = vmulps_avx512vl(auVar113,auVar110);
        auVar119 = vfmadd213ps_avx512vl(auVar119,local_140,auVar110);
        auVar109 = vfmadd213ps_avx512vl(auVar109,local_120,auVar119);
        auVar118 = vfmadd213ps_avx512vl(auVar108,local_100,auVar109);
        auVar120 = vmulps_avx512vl(auVar113,auVar120);
        auVar121 = vfmadd213ps_avx512vl(auVar121,local_140,auVar120);
        auVar109 = vfmadd213ps_avx512vl(auVar125,local_120,auVar121);
        auVar125 = *(undefined1 (*) [32])(bspline_basis0 + lVar29 + 0x1210);
        auVar121 = *(undefined1 (*) [32])(bspline_basis0 + lVar29 + 0x1694);
        auVar120 = *(undefined1 (*) [32])(bspline_basis0 + lVar29 + 0x1b18);
        auVar108 = *(undefined1 (*) [32])(bspline_basis0 + lVar29 + 0x1f9c);
        auVar122 = vfmadd213ps_avx512vl(auVar123,local_100,auVar109);
        auVar123 = vmulps_avx512vl(local_600,auVar108);
        auVar109 = vmulps_avx512vl(local_620,auVar108);
        auVar233._0_4_ = auVar113._0_4_ * auVar108._0_4_;
        auVar233._4_4_ = auVar113._4_4_ * auVar108._4_4_;
        auVar233._8_4_ = auVar113._8_4_ * auVar108._8_4_;
        auVar233._12_4_ = auVar113._12_4_ * auVar108._12_4_;
        auVar233._16_4_ = auVar113._16_4_ * auVar108._16_4_;
        auVar233._20_4_ = auVar113._20_4_ * auVar108._20_4_;
        auVar233._24_4_ = auVar113._24_4_ * auVar108._24_4_;
        auVar233._28_4_ = 0;
        auVar249 = ZEXT3264(local_720);
        auVar123 = vfmadd231ps_avx512vl(auVar123,auVar120,local_720);
        auVar108 = vfmadd231ps_avx512vl(auVar109,auVar120,local_5e0);
        auVar120 = vfmadd231ps_avx512vl(auVar233,local_140,auVar120);
        auVar123 = vfmadd231ps_avx512vl(auVar123,auVar121,local_520);
        auVar108 = vfmadd231ps_avx512vl(auVar108,auVar121,local_700);
        auVar109 = vfmadd231ps_avx512vl(auVar120,local_120,auVar121);
        auVar119 = vfmadd231ps_avx512vl(auVar123,auVar125,local_500);
        auVar108 = vfmadd231ps_avx512vl(auVar108,auVar125,local_4e0);
        auVar123 = *(undefined1 (*) [32])(bspline_basis1 + lVar29 + 0x1210);
        auVar121 = *(undefined1 (*) [32])(bspline_basis1 + lVar29 + 0x1b18);
        auVar120 = *(undefined1 (*) [32])(bspline_basis1 + lVar29 + 0x1f9c);
        auVar109 = vfmadd231ps_avx512vl(auVar109,local_100,auVar125);
        auVar110 = vmulps_avx512vl(local_600,auVar120);
        auVar124 = vmulps_avx512vl(local_620,auVar120);
        auVar125._4_4_ = auVar113._4_4_ * auVar120._4_4_;
        auVar125._0_4_ = auVar113._0_4_ * auVar120._0_4_;
        auVar125._8_4_ = auVar113._8_4_ * auVar120._8_4_;
        auVar125._12_4_ = auVar113._12_4_ * auVar120._12_4_;
        auVar125._16_4_ = auVar113._16_4_ * auVar120._16_4_;
        auVar125._20_4_ = auVar113._20_4_ * auVar120._20_4_;
        auVar125._24_4_ = auVar113._24_4_ * auVar120._24_4_;
        auVar125._28_4_ = auVar120._28_4_;
        auVar120 = vfmadd231ps_avx512vl(auVar110,auVar121,local_720);
        auVar110 = vfmadd231ps_avx512vl(auVar124,auVar121,local_5e0);
        auVar121 = vfmadd231ps_avx512vl(auVar125,local_140,auVar121);
        auVar125 = *(undefined1 (*) [32])(bspline_basis1 + lVar29 + 0x1694);
        auVar120 = vfmadd231ps_avx512vl(auVar120,auVar125,local_520);
        auVar110 = vfmadd231ps_avx512vl(auVar110,auVar125,local_700);
        auVar125 = vfmadd231ps_avx512vl(auVar121,local_120,auVar125);
        auVar121 = vfmadd231ps_avx512vl(auVar120,auVar123,local_500);
        auVar120 = vfmadd231ps_avx512vl(auVar110,auVar123,local_4e0);
        auVar110 = vfmadd231ps_avx512vl(auVar125,local_100,auVar123);
        auVar237._8_4_ = 0x7fffffff;
        auVar237._0_8_ = 0x7fffffff7fffffff;
        auVar237._12_4_ = 0x7fffffff;
        auVar237._16_4_ = 0x7fffffff;
        auVar237._20_4_ = 0x7fffffff;
        auVar237._24_4_ = 0x7fffffff;
        auVar237._28_4_ = 0x7fffffff;
        auVar123 = vandps_avx(auVar119,auVar237);
        auVar125 = vandps_avx(auVar108,auVar237);
        auVar125 = vmaxps_avx(auVar123,auVar125);
        auVar123 = vandps_avx(auVar109,auVar237);
        auVar123 = vmaxps_avx(auVar125,auVar123);
        auVar109 = vbroadcastss_avx512vl(_local_6e0);
        uVar89 = vcmpps_avx512vl(auVar123,auVar109,1);
        bVar13 = (bool)((byte)uVar89 & 1);
        auVar124._0_4_ = (float)((uint)bVar13 * auVar114._0_4_ | (uint)!bVar13 * auVar119._0_4_);
        bVar13 = (bool)((byte)(uVar89 >> 1) & 1);
        auVar124._4_4_ = (float)((uint)bVar13 * auVar114._4_4_ | (uint)!bVar13 * auVar119._4_4_);
        bVar13 = (bool)((byte)(uVar89 >> 2) & 1);
        auVar124._8_4_ = (float)((uint)bVar13 * auVar114._8_4_ | (uint)!bVar13 * auVar119._8_4_);
        bVar13 = (bool)((byte)(uVar89 >> 3) & 1);
        auVar124._12_4_ = (float)((uint)bVar13 * auVar114._12_4_ | (uint)!bVar13 * auVar119._12_4_);
        bVar13 = (bool)((byte)(uVar89 >> 4) & 1);
        auVar124._16_4_ = (float)((uint)bVar13 * auVar114._16_4_ | (uint)!bVar13 * auVar119._16_4_);
        bVar13 = (bool)((byte)(uVar89 >> 5) & 1);
        auVar124._20_4_ = (float)((uint)bVar13 * auVar114._20_4_ | (uint)!bVar13 * auVar119._20_4_);
        bVar13 = (bool)((byte)(uVar89 >> 6) & 1);
        auVar124._24_4_ = (float)((uint)bVar13 * auVar114._24_4_ | (uint)!bVar13 * auVar119._24_4_);
        bVar13 = SUB81(uVar89 >> 7,0);
        auVar124._28_4_ = (uint)bVar13 * auVar114._28_4_ | (uint)!bVar13 * auVar119._28_4_;
        bVar13 = (bool)((byte)uVar89 & 1);
        auVar126._0_4_ = (float)((uint)bVar13 * auVar115._0_4_ | (uint)!bVar13 * auVar108._0_4_);
        bVar13 = (bool)((byte)(uVar89 >> 1) & 1);
        auVar126._4_4_ = (float)((uint)bVar13 * auVar115._4_4_ | (uint)!bVar13 * auVar108._4_4_);
        bVar13 = (bool)((byte)(uVar89 >> 2) & 1);
        auVar126._8_4_ = (float)((uint)bVar13 * auVar115._8_4_ | (uint)!bVar13 * auVar108._8_4_);
        bVar13 = (bool)((byte)(uVar89 >> 3) & 1);
        auVar126._12_4_ = (float)((uint)bVar13 * auVar115._12_4_ | (uint)!bVar13 * auVar108._12_4_);
        bVar13 = (bool)((byte)(uVar89 >> 4) & 1);
        auVar126._16_4_ = (float)((uint)bVar13 * auVar115._16_4_ | (uint)!bVar13 * auVar108._16_4_);
        bVar13 = (bool)((byte)(uVar89 >> 5) & 1);
        auVar126._20_4_ = (float)((uint)bVar13 * auVar115._20_4_ | (uint)!bVar13 * auVar108._20_4_);
        bVar13 = (bool)((byte)(uVar89 >> 6) & 1);
        auVar126._24_4_ = (float)((uint)bVar13 * auVar115._24_4_ | (uint)!bVar13 * auVar108._24_4_);
        bVar13 = SUB81(uVar89 >> 7,0);
        auVar126._28_4_ = (uint)bVar13 * auVar115._28_4_ | (uint)!bVar13 * auVar108._28_4_;
        auVar123 = vandps_avx(auVar237,auVar121);
        auVar125 = vandps_avx(auVar120,auVar237);
        auVar125 = vmaxps_avx(auVar123,auVar125);
        auVar123 = vandps_avx(auVar110,auVar237);
        auVar123 = vmaxps_avx(auVar125,auVar123);
        uVar89 = vcmpps_avx512vl(auVar123,auVar109,1);
        bVar13 = (bool)((byte)uVar89 & 1);
        auVar127._0_4_ = (float)((uint)bVar13 * auVar114._0_4_ | (uint)!bVar13 * auVar121._0_4_);
        bVar13 = (bool)((byte)(uVar89 >> 1) & 1);
        auVar127._4_4_ = (float)((uint)bVar13 * auVar114._4_4_ | (uint)!bVar13 * auVar121._4_4_);
        bVar13 = (bool)((byte)(uVar89 >> 2) & 1);
        auVar127._8_4_ = (float)((uint)bVar13 * auVar114._8_4_ | (uint)!bVar13 * auVar121._8_4_);
        bVar13 = (bool)((byte)(uVar89 >> 3) & 1);
        auVar127._12_4_ = (float)((uint)bVar13 * auVar114._12_4_ | (uint)!bVar13 * auVar121._12_4_);
        bVar13 = (bool)((byte)(uVar89 >> 4) & 1);
        auVar127._16_4_ = (float)((uint)bVar13 * auVar114._16_4_ | (uint)!bVar13 * auVar121._16_4_);
        bVar13 = (bool)((byte)(uVar89 >> 5) & 1);
        auVar127._20_4_ = (float)((uint)bVar13 * auVar114._20_4_ | (uint)!bVar13 * auVar121._20_4_);
        bVar13 = (bool)((byte)(uVar89 >> 6) & 1);
        auVar127._24_4_ = (float)((uint)bVar13 * auVar114._24_4_ | (uint)!bVar13 * auVar121._24_4_);
        bVar13 = SUB81(uVar89 >> 7,0);
        auVar127._28_4_ = (uint)bVar13 * auVar114._28_4_ | (uint)!bVar13 * auVar121._28_4_;
        bVar13 = (bool)((byte)uVar89 & 1);
        auVar128._0_4_ = (float)((uint)bVar13 * auVar115._0_4_ | (uint)!bVar13 * auVar120._0_4_);
        bVar13 = (bool)((byte)(uVar89 >> 1) & 1);
        auVar128._4_4_ = (float)((uint)bVar13 * auVar115._4_4_ | (uint)!bVar13 * auVar120._4_4_);
        bVar13 = (bool)((byte)(uVar89 >> 2) & 1);
        auVar128._8_4_ = (float)((uint)bVar13 * auVar115._8_4_ | (uint)!bVar13 * auVar120._8_4_);
        bVar13 = (bool)((byte)(uVar89 >> 3) & 1);
        auVar128._12_4_ = (float)((uint)bVar13 * auVar115._12_4_ | (uint)!bVar13 * auVar120._12_4_);
        bVar13 = (bool)((byte)(uVar89 >> 4) & 1);
        auVar128._16_4_ = (float)((uint)bVar13 * auVar115._16_4_ | (uint)!bVar13 * auVar120._16_4_);
        bVar13 = (bool)((byte)(uVar89 >> 5) & 1);
        auVar128._20_4_ = (float)((uint)bVar13 * auVar115._20_4_ | (uint)!bVar13 * auVar120._20_4_);
        bVar13 = (bool)((byte)(uVar89 >> 6) & 1);
        auVar128._24_4_ = (float)((uint)bVar13 * auVar115._24_4_ | (uint)!bVar13 * auVar120._24_4_);
        bVar13 = SUB81(uVar89 >> 7,0);
        auVar128._28_4_ = (uint)bVar13 * auVar115._28_4_ | (uint)!bVar13 * auVar120._28_4_;
        auVar107 = vxorps_avx512vl(auVar103,auVar103);
        auVar245 = ZEXT1664(auVar107);
        auVar123 = vfmadd213ps_avx512vl(auVar124,auVar124,ZEXT1632(auVar107));
        auVar103 = vfmadd231ps_fma(auVar123,auVar126,auVar126);
        auVar125 = vrsqrt14ps_avx512vl(ZEXT1632(auVar103));
        fVar192 = auVar125._0_4_;
        fVar208 = auVar125._4_4_;
        fVar210 = auVar125._8_4_;
        fVar211 = auVar125._12_4_;
        fVar187 = auVar125._16_4_;
        fVar191 = auVar125._20_4_;
        fVar97 = auVar125._24_4_;
        auVar123._4_4_ = fVar208 * fVar208 * fVar208 * auVar103._4_4_ * -0.5;
        auVar123._0_4_ = fVar192 * fVar192 * fVar192 * auVar103._0_4_ * -0.5;
        auVar123._8_4_ = fVar210 * fVar210 * fVar210 * auVar103._8_4_ * -0.5;
        auVar123._12_4_ = fVar211 * fVar211 * fVar211 * auVar103._12_4_ * -0.5;
        auVar123._16_4_ = fVar187 * fVar187 * fVar187 * -0.0;
        auVar123._20_4_ = fVar191 * fVar191 * fVar191 * -0.0;
        auVar123._24_4_ = fVar97 * fVar97 * fVar97 * -0.0;
        auVar123._28_4_ = auVar110._28_4_;
        auVar108 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
        auVar123 = vfmadd231ps_avx512vl(auVar123,auVar108,auVar125);
        auVar121._4_4_ = auVar126._4_4_ * auVar123._4_4_;
        auVar121._0_4_ = auVar126._0_4_ * auVar123._0_4_;
        auVar121._8_4_ = auVar126._8_4_ * auVar123._8_4_;
        auVar121._12_4_ = auVar126._12_4_ * auVar123._12_4_;
        auVar121._16_4_ = auVar126._16_4_ * auVar123._16_4_;
        auVar121._20_4_ = auVar126._20_4_ * auVar123._20_4_;
        auVar121._24_4_ = auVar126._24_4_ * auVar123._24_4_;
        auVar121._28_4_ = 0;
        auVar120._4_4_ = auVar123._4_4_ * -auVar124._4_4_;
        auVar120._0_4_ = auVar123._0_4_ * -auVar124._0_4_;
        auVar120._8_4_ = auVar123._8_4_ * -auVar124._8_4_;
        auVar120._12_4_ = auVar123._12_4_ * -auVar124._12_4_;
        auVar120._16_4_ = auVar123._16_4_ * -auVar124._16_4_;
        auVar120._20_4_ = auVar123._20_4_ * -auVar124._20_4_;
        auVar120._24_4_ = auVar123._24_4_ * -auVar124._24_4_;
        auVar120._28_4_ = auVar126._28_4_;
        auVar123 = vmulps_avx512vl(auVar123,ZEXT1632(auVar107));
        auVar114 = ZEXT1632(auVar107);
        auVar125 = vfmadd213ps_avx512vl(auVar127,auVar127,auVar114);
        auVar103 = vfmadd231ps_fma(auVar125,auVar128,auVar128);
        auVar125 = vrsqrt14ps_avx512vl(ZEXT1632(auVar103));
        fVar192 = auVar125._0_4_;
        fVar208 = auVar125._4_4_;
        fVar210 = auVar125._8_4_;
        fVar211 = auVar125._12_4_;
        fVar187 = auVar125._16_4_;
        fVar191 = auVar125._20_4_;
        fVar97 = auVar125._24_4_;
        auVar109._4_4_ = fVar208 * fVar208 * fVar208 * auVar103._4_4_ * -0.5;
        auVar109._0_4_ = fVar192 * fVar192 * fVar192 * auVar103._0_4_ * -0.5;
        auVar109._8_4_ = fVar210 * fVar210 * fVar210 * auVar103._8_4_ * -0.5;
        auVar109._12_4_ = fVar211 * fVar211 * fVar211 * auVar103._12_4_ * -0.5;
        auVar109._16_4_ = fVar187 * fVar187 * fVar187 * -0.0;
        auVar109._20_4_ = fVar191 * fVar191 * fVar191 * -0.0;
        auVar109._24_4_ = fVar97 * fVar97 * fVar97 * -0.0;
        auVar109._28_4_ = 0;
        auVar108 = vfmadd231ps_avx512vl(auVar109,auVar108,auVar125);
        auVar119._4_4_ = auVar128._4_4_ * auVar108._4_4_;
        auVar119._0_4_ = auVar128._0_4_ * auVar108._0_4_;
        auVar119._8_4_ = auVar128._8_4_ * auVar108._8_4_;
        auVar119._12_4_ = auVar128._12_4_ * auVar108._12_4_;
        auVar119._16_4_ = auVar128._16_4_ * auVar108._16_4_;
        auVar119._20_4_ = auVar128._20_4_ * auVar108._20_4_;
        auVar119._24_4_ = auVar128._24_4_ * auVar108._24_4_;
        auVar119._28_4_ = auVar125._28_4_;
        auVar110._4_4_ = -auVar127._4_4_ * auVar108._4_4_;
        auVar110._0_4_ = -auVar127._0_4_ * auVar108._0_4_;
        auVar110._8_4_ = -auVar127._8_4_ * auVar108._8_4_;
        auVar110._12_4_ = -auVar127._12_4_ * auVar108._12_4_;
        auVar110._16_4_ = -auVar127._16_4_ * auVar108._16_4_;
        auVar110._20_4_ = -auVar127._20_4_ * auVar108._20_4_;
        auVar110._24_4_ = -auVar127._24_4_ * auVar108._24_4_;
        auVar110._28_4_ = auVar127._28_4_ ^ 0x80000000;
        auVar125 = vmulps_avx512vl(auVar108,auVar114);
        auVar103 = vfmadd213ps_fma(auVar121,auVar116,auVar111);
        auVar102 = vfmadd213ps_fma(auVar120,auVar116,auVar112);
        auVar108 = vfmadd213ps_avx512vl(auVar123,auVar116,auVar122);
        auVar109 = vfmadd213ps_avx512vl(auVar119,ZEXT1632(auVar25),ZEXT1632(auVar23));
        auVar105 = vfnmadd213ps_fma(auVar121,auVar116,auVar111);
        auVar111 = ZEXT1632(auVar25);
        auVar104 = vfmadd213ps_fma(auVar110,auVar111,ZEXT1632(auVar24));
        auVar106 = vfnmadd213ps_fma(auVar120,auVar116,auVar112);
        auVar244 = vfmadd213ps_fma(auVar125,auVar111,auVar118);
        auVar121 = vfnmadd231ps_avx512vl(auVar122,auVar116,auVar123);
        auVar23 = vfnmadd213ps_fma(auVar119,auVar111,ZEXT1632(auVar23));
        auVar24 = vfnmadd213ps_fma(auVar110,auVar111,ZEXT1632(auVar24));
        auVar31 = vfnmadd231ps_fma(auVar118,ZEXT1632(auVar25),auVar125);
        auVar125 = vsubps_avx512vl(auVar109,ZEXT1632(auVar105));
        auVar123 = vsubps_avx(ZEXT1632(auVar104),ZEXT1632(auVar106));
        auVar120 = vsubps_avx512vl(ZEXT1632(auVar244),auVar121);
        auVar119 = vmulps_avx512vl(auVar123,auVar121);
        auVar21 = vfmsub231ps_fma(auVar119,ZEXT1632(auVar106),auVar120);
        auVar111._4_4_ = auVar105._4_4_ * auVar120._4_4_;
        auVar111._0_4_ = auVar105._0_4_ * auVar120._0_4_;
        auVar111._8_4_ = auVar105._8_4_ * auVar120._8_4_;
        auVar111._12_4_ = auVar105._12_4_ * auVar120._12_4_;
        auVar111._16_4_ = auVar120._16_4_ * 0.0;
        auVar111._20_4_ = auVar120._20_4_ * 0.0;
        auVar111._24_4_ = auVar120._24_4_ * 0.0;
        auVar111._28_4_ = auVar120._28_4_;
        auVar120 = vfmsub231ps_avx512vl(auVar111,auVar121,auVar125);
        auVar112._4_4_ = auVar106._4_4_ * auVar125._4_4_;
        auVar112._0_4_ = auVar106._0_4_ * auVar125._0_4_;
        auVar112._8_4_ = auVar106._8_4_ * auVar125._8_4_;
        auVar112._12_4_ = auVar106._12_4_ * auVar125._12_4_;
        auVar112._16_4_ = auVar125._16_4_ * 0.0;
        auVar112._20_4_ = auVar125._20_4_ * 0.0;
        auVar112._24_4_ = auVar125._24_4_ * 0.0;
        auVar112._28_4_ = auVar125._28_4_;
        auVar22 = vfmsub231ps_fma(auVar112,ZEXT1632(auVar105),auVar123);
        auVar123 = vfmadd231ps_avx512vl(ZEXT1632(auVar22),auVar114,auVar120);
        auVar123 = vfmadd231ps_avx512vl(auVar123,auVar114,ZEXT1632(auVar21));
        auVar124 = ZEXT1632(auVar107);
        uVar89 = vcmpps_avx512vl(auVar123,auVar124,2);
        bVar88 = (byte)uVar89;
        fVar97 = (float)((uint)(bVar88 & 1) * auVar103._0_4_ |
                        (uint)!(bool)(bVar88 & 1) * auVar23._0_4_);
        bVar13 = (bool)((byte)(uVar89 >> 1) & 1);
        fVar149 = (float)((uint)bVar13 * auVar103._4_4_ | (uint)!bVar13 * auVar23._4_4_);
        bVar13 = (bool)((byte)(uVar89 >> 2) & 1);
        fVar151 = (float)((uint)bVar13 * auVar103._8_4_ | (uint)!bVar13 * auVar23._8_4_);
        bVar13 = (bool)((byte)(uVar89 >> 3) & 1);
        fVar153 = (float)((uint)bVar13 * auVar103._12_4_ | (uint)!bVar13 * auVar23._12_4_);
        auVar119 = ZEXT1632(CONCAT412(fVar153,CONCAT48(fVar151,CONCAT44(fVar149,fVar97))));
        fVar98 = (float)((uint)(bVar88 & 1) * auVar102._0_4_ |
                        (uint)!(bool)(bVar88 & 1) * auVar24._0_4_);
        bVar13 = (bool)((byte)(uVar89 >> 1) & 1);
        fVar150 = (float)((uint)bVar13 * auVar102._4_4_ | (uint)!bVar13 * auVar24._4_4_);
        bVar13 = (bool)((byte)(uVar89 >> 2) & 1);
        fVar152 = (float)((uint)bVar13 * auVar102._8_4_ | (uint)!bVar13 * auVar24._8_4_);
        bVar13 = (bool)((byte)(uVar89 >> 3) & 1);
        fVar154 = (float)((uint)bVar13 * auVar102._12_4_ | (uint)!bVar13 * auVar24._12_4_);
        auVar110 = ZEXT1632(CONCAT412(fVar154,CONCAT48(fVar152,CONCAT44(fVar150,fVar98))));
        auVar122._0_4_ =
             (float)((uint)(bVar88 & 1) * auVar108._0_4_ | (uint)!(bool)(bVar88 & 1) * auVar31._0_4_
                    );
        bVar13 = (bool)((byte)(uVar89 >> 1) & 1);
        auVar122._4_4_ = (float)((uint)bVar13 * auVar108._4_4_ | (uint)!bVar13 * auVar31._4_4_);
        bVar13 = (bool)((byte)(uVar89 >> 2) & 1);
        auVar122._8_4_ = (float)((uint)bVar13 * auVar108._8_4_ | (uint)!bVar13 * auVar31._8_4_);
        bVar13 = (bool)((byte)(uVar89 >> 3) & 1);
        auVar122._12_4_ = (float)((uint)bVar13 * auVar108._12_4_ | (uint)!bVar13 * auVar31._12_4_);
        fVar208 = (float)((uint)((byte)(uVar89 >> 4) & 1) * auVar108._16_4_);
        auVar122._16_4_ = fVar208;
        fVar192 = (float)((uint)((byte)(uVar89 >> 5) & 1) * auVar108._20_4_);
        auVar122._20_4_ = fVar192;
        fVar210 = (float)((uint)((byte)(uVar89 >> 6) & 1) * auVar108._24_4_);
        auVar122._24_4_ = fVar210;
        iVar1 = (uint)(byte)(uVar89 >> 7) * auVar108._28_4_;
        auVar122._28_4_ = iVar1;
        auVar125 = vblendmps_avx512vl(ZEXT1632(auVar105),auVar109);
        auVar129._0_4_ =
             (uint)(bVar88 & 1) * auVar125._0_4_ | (uint)!(bool)(bVar88 & 1) * auVar21._0_4_;
        bVar13 = (bool)((byte)(uVar89 >> 1) & 1);
        auVar129._4_4_ = (uint)bVar13 * auVar125._4_4_ | (uint)!bVar13 * auVar21._4_4_;
        bVar13 = (bool)((byte)(uVar89 >> 2) & 1);
        auVar129._8_4_ = (uint)bVar13 * auVar125._8_4_ | (uint)!bVar13 * auVar21._8_4_;
        bVar13 = (bool)((byte)(uVar89 >> 3) & 1);
        auVar129._12_4_ = (uint)bVar13 * auVar125._12_4_ | (uint)!bVar13 * auVar21._12_4_;
        auVar129._16_4_ = (uint)((byte)(uVar89 >> 4) & 1) * auVar125._16_4_;
        auVar129._20_4_ = (uint)((byte)(uVar89 >> 5) & 1) * auVar125._20_4_;
        auVar129._24_4_ = (uint)((byte)(uVar89 >> 6) & 1) * auVar125._24_4_;
        auVar129._28_4_ = (uint)(byte)(uVar89 >> 7) * auVar125._28_4_;
        auVar125 = vblendmps_avx512vl(ZEXT1632(auVar106),ZEXT1632(auVar104));
        auVar130._0_4_ =
             (float)((uint)(bVar88 & 1) * auVar125._0_4_ |
                    (uint)!(bool)(bVar88 & 1) * auVar102._0_4_);
        bVar13 = (bool)((byte)(uVar89 >> 1) & 1);
        auVar130._4_4_ = (float)((uint)bVar13 * auVar125._4_4_ | (uint)!bVar13 * auVar102._4_4_);
        bVar13 = (bool)((byte)(uVar89 >> 2) & 1);
        auVar130._8_4_ = (float)((uint)bVar13 * auVar125._8_4_ | (uint)!bVar13 * auVar102._8_4_);
        bVar13 = (bool)((byte)(uVar89 >> 3) & 1);
        auVar130._12_4_ = (float)((uint)bVar13 * auVar125._12_4_ | (uint)!bVar13 * auVar102._12_4_);
        fVar211 = (float)((uint)((byte)(uVar89 >> 4) & 1) * auVar125._16_4_);
        auVar130._16_4_ = fVar211;
        fVar187 = (float)((uint)((byte)(uVar89 >> 5) & 1) * auVar125._20_4_);
        auVar130._20_4_ = fVar187;
        fVar191 = (float)((uint)((byte)(uVar89 >> 6) & 1) * auVar125._24_4_);
        auVar130._24_4_ = fVar191;
        auVar130._28_4_ = (uint)(byte)(uVar89 >> 7) * auVar125._28_4_;
        auVar125 = vblendmps_avx512vl(auVar121,ZEXT1632(auVar244));
        auVar131._0_4_ =
             (float)((uint)(bVar88 & 1) * auVar125._0_4_ |
                    (uint)!(bool)(bVar88 & 1) * auVar108._0_4_);
        bVar13 = (bool)((byte)(uVar89 >> 1) & 1);
        auVar131._4_4_ = (float)((uint)bVar13 * auVar125._4_4_ | (uint)!bVar13 * auVar108._4_4_);
        bVar13 = (bool)((byte)(uVar89 >> 2) & 1);
        auVar131._8_4_ = (float)((uint)bVar13 * auVar125._8_4_ | (uint)!bVar13 * auVar108._8_4_);
        bVar13 = (bool)((byte)(uVar89 >> 3) & 1);
        auVar131._12_4_ = (float)((uint)bVar13 * auVar125._12_4_ | (uint)!bVar13 * auVar108._12_4_);
        bVar13 = (bool)((byte)(uVar89 >> 4) & 1);
        auVar131._16_4_ = (float)((uint)bVar13 * auVar125._16_4_ | (uint)!bVar13 * auVar108._16_4_);
        bVar13 = (bool)((byte)(uVar89 >> 5) & 1);
        auVar131._20_4_ = (float)((uint)bVar13 * auVar125._20_4_ | (uint)!bVar13 * auVar108._20_4_);
        bVar13 = (bool)((byte)(uVar89 >> 6) & 1);
        auVar131._24_4_ = (float)((uint)bVar13 * auVar125._24_4_ | (uint)!bVar13 * auVar108._24_4_);
        bVar13 = SUB81(uVar89 >> 7,0);
        auVar131._28_4_ = (uint)bVar13 * auVar125._28_4_ | (uint)!bVar13 * auVar108._28_4_;
        auVar132._0_4_ =
             (uint)(bVar88 & 1) * (int)auVar105._0_4_ | (uint)!(bool)(bVar88 & 1) * auVar109._0_4_;
        bVar13 = (bool)((byte)(uVar89 >> 1) & 1);
        auVar132._4_4_ = (uint)bVar13 * (int)auVar105._4_4_ | (uint)!bVar13 * auVar109._4_4_;
        bVar13 = (bool)((byte)(uVar89 >> 2) & 1);
        auVar132._8_4_ = (uint)bVar13 * (int)auVar105._8_4_ | (uint)!bVar13 * auVar109._8_4_;
        bVar13 = (bool)((byte)(uVar89 >> 3) & 1);
        auVar132._12_4_ = (uint)bVar13 * (int)auVar105._12_4_ | (uint)!bVar13 * auVar109._12_4_;
        auVar132._16_4_ = (uint)!(bool)((byte)(uVar89 >> 4) & 1) * auVar109._16_4_;
        auVar132._20_4_ = (uint)!(bool)((byte)(uVar89 >> 5) & 1) * auVar109._20_4_;
        auVar132._24_4_ = (uint)!(bool)((byte)(uVar89 >> 6) & 1) * auVar109._24_4_;
        auVar132._28_4_ = (uint)!SUB81(uVar89 >> 7,0) * auVar109._28_4_;
        bVar13 = (bool)((byte)(uVar89 >> 1) & 1);
        bVar15 = (bool)((byte)(uVar89 >> 2) & 1);
        bVar16 = (bool)((byte)(uVar89 >> 3) & 1);
        auVar133._0_4_ =
             (uint)(bVar88 & 1) * auVar121._0_4_ | (uint)!(bool)(bVar88 & 1) * auVar244._0_4_;
        bVar14 = (bool)((byte)(uVar89 >> 1) & 1);
        auVar133._4_4_ = (uint)bVar14 * auVar121._4_4_ | (uint)!bVar14 * auVar244._4_4_;
        bVar14 = (bool)((byte)(uVar89 >> 2) & 1);
        auVar133._8_4_ = (uint)bVar14 * auVar121._8_4_ | (uint)!bVar14 * auVar244._8_4_;
        bVar14 = (bool)((byte)(uVar89 >> 3) & 1);
        auVar133._12_4_ = (uint)bVar14 * auVar121._12_4_ | (uint)!bVar14 * auVar244._12_4_;
        auVar133._16_4_ = (uint)((byte)(uVar89 >> 4) & 1) * auVar121._16_4_;
        auVar133._20_4_ = (uint)((byte)(uVar89 >> 5) & 1) * auVar121._20_4_;
        auVar133._24_4_ = (uint)((byte)(uVar89 >> 6) & 1) * auVar121._24_4_;
        iVar2 = (uint)(byte)(uVar89 >> 7) * auVar121._28_4_;
        auVar133._28_4_ = iVar2;
        auVar111 = vsubps_avx512vl(auVar132,auVar119);
        auVar125 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar16 * (int)auVar106._12_4_ |
                                                 (uint)!bVar16 * auVar104._12_4_,
                                                 CONCAT48((uint)bVar15 * (int)auVar106._8_4_ |
                                                          (uint)!bVar15 * auVar104._8_4_,
                                                          CONCAT44((uint)bVar13 *
                                                                   (int)auVar106._4_4_ |
                                                                   (uint)!bVar13 * auVar104._4_4_,
                                                                   (uint)(bVar88 & 1) *
                                                                   (int)auVar106._0_4_ |
                                                                   (uint)!(bool)(bVar88 & 1) *
                                                                   auVar104._0_4_)))),auVar110);
        auVar121 = vsubps_avx(auVar133,auVar122);
        auVar120 = vsubps_avx(auVar119,auVar129);
        auVar108 = vsubps_avx(auVar110,auVar130);
        auVar109 = vsubps_avx(auVar122,auVar131);
        auVar114._4_4_ = auVar121._4_4_ * fVar149;
        auVar114._0_4_ = auVar121._0_4_ * fVar97;
        auVar114._8_4_ = auVar121._8_4_ * fVar151;
        auVar114._12_4_ = auVar121._12_4_ * fVar153;
        auVar114._16_4_ = auVar121._16_4_ * 0.0;
        auVar114._20_4_ = auVar121._20_4_ * 0.0;
        auVar114._24_4_ = auVar121._24_4_ * 0.0;
        auVar114._28_4_ = iVar2;
        auVar103 = vfmsub231ps_fma(auVar114,auVar122,auVar111);
        auVar115._4_4_ = fVar150 * auVar111._4_4_;
        auVar115._0_4_ = fVar98 * auVar111._0_4_;
        auVar115._8_4_ = fVar152 * auVar111._8_4_;
        auVar115._12_4_ = fVar154 * auVar111._12_4_;
        auVar115._16_4_ = auVar111._16_4_ * 0.0;
        auVar115._20_4_ = auVar111._20_4_ * 0.0;
        auVar115._24_4_ = auVar111._24_4_ * 0.0;
        auVar115._28_4_ = auVar123._28_4_;
        auVar102 = vfmsub231ps_fma(auVar115,auVar119,auVar125);
        auVar123 = vfmadd231ps_avx512vl(ZEXT1632(auVar102),auVar124,ZEXT1632(auVar103));
        auVar202._0_4_ = auVar125._0_4_ * auVar122._0_4_;
        auVar202._4_4_ = auVar125._4_4_ * auVar122._4_4_;
        auVar202._8_4_ = auVar125._8_4_ * auVar122._8_4_;
        auVar202._12_4_ = auVar125._12_4_ * auVar122._12_4_;
        auVar202._16_4_ = auVar125._16_4_ * fVar208;
        auVar202._20_4_ = auVar125._20_4_ * fVar192;
        auVar202._24_4_ = auVar125._24_4_ * fVar210;
        auVar202._28_4_ = 0;
        auVar103 = vfmsub231ps_fma(auVar202,auVar110,auVar121);
        auVar112 = vfmadd231ps_avx512vl(auVar123,auVar124,ZEXT1632(auVar103));
        auVar123 = vmulps_avx512vl(auVar109,auVar129);
        auVar123 = vfmsub231ps_avx512vl(auVar123,auVar120,auVar131);
        auVar118._4_4_ = auVar108._4_4_ * auVar131._4_4_;
        auVar118._0_4_ = auVar108._0_4_ * auVar131._0_4_;
        auVar118._8_4_ = auVar108._8_4_ * auVar131._8_4_;
        auVar118._12_4_ = auVar108._12_4_ * auVar131._12_4_;
        auVar118._16_4_ = auVar108._16_4_ * auVar131._16_4_;
        auVar118._20_4_ = auVar108._20_4_ * auVar131._20_4_;
        auVar118._24_4_ = auVar108._24_4_ * auVar131._24_4_;
        auVar118._28_4_ = auVar131._28_4_;
        auVar103 = vfmsub231ps_fma(auVar118,auVar130,auVar109);
        auVar203._0_4_ = auVar130._0_4_ * auVar120._0_4_;
        auVar203._4_4_ = auVar130._4_4_ * auVar120._4_4_;
        auVar203._8_4_ = auVar130._8_4_ * auVar120._8_4_;
        auVar203._12_4_ = auVar130._12_4_ * auVar120._12_4_;
        auVar203._16_4_ = fVar211 * auVar120._16_4_;
        auVar203._20_4_ = fVar187 * auVar120._20_4_;
        auVar203._24_4_ = fVar191 * auVar120._24_4_;
        auVar203._28_4_ = 0;
        auVar102 = vfmsub231ps_fma(auVar203,auVar108,auVar129);
        auVar123 = vfmadd231ps_avx512vl(ZEXT1632(auVar102),auVar124,auVar123);
        auVar114 = vfmadd231ps_avx512vl(auVar123,auVar124,ZEXT1632(auVar103));
        auVar123 = vmaxps_avx(auVar112,auVar114);
        uVar157 = vcmpps_avx512vl(auVar123,auVar124,2);
        bVar96 = bVar96 & (byte)uVar157;
        auVar241 = ZEXT3264(local_500);
        auVar242 = ZEXT3264(local_4e0);
        auVar243 = ZEXT3264(local_520);
        auVar239 = ZEXT3264(local_700);
        auVar235 = ZEXT1664(_local_6e0);
        if (bVar96 == 0) {
          bVar96 = 0;
        }
        else {
          auVar47._4_4_ = auVar109._4_4_ * auVar125._4_4_;
          auVar47._0_4_ = auVar109._0_4_ * auVar125._0_4_;
          auVar47._8_4_ = auVar109._8_4_ * auVar125._8_4_;
          auVar47._12_4_ = auVar109._12_4_ * auVar125._12_4_;
          auVar47._16_4_ = auVar109._16_4_ * auVar125._16_4_;
          auVar47._20_4_ = auVar109._20_4_ * auVar125._20_4_;
          auVar47._24_4_ = auVar109._24_4_ * auVar125._24_4_;
          auVar47._28_4_ = auVar123._28_4_;
          auVar104 = vfmsub231ps_fma(auVar47,auVar108,auVar121);
          auVar48._4_4_ = auVar121._4_4_ * auVar120._4_4_;
          auVar48._0_4_ = auVar121._0_4_ * auVar120._0_4_;
          auVar48._8_4_ = auVar121._8_4_ * auVar120._8_4_;
          auVar48._12_4_ = auVar121._12_4_ * auVar120._12_4_;
          auVar48._16_4_ = auVar121._16_4_ * auVar120._16_4_;
          auVar48._20_4_ = auVar121._20_4_ * auVar120._20_4_;
          auVar48._24_4_ = auVar121._24_4_ * auVar120._24_4_;
          auVar48._28_4_ = auVar121._28_4_;
          auVar102 = vfmsub231ps_fma(auVar48,auVar111,auVar109);
          auVar49._4_4_ = auVar108._4_4_ * auVar111._4_4_;
          auVar49._0_4_ = auVar108._0_4_ * auVar111._0_4_;
          auVar49._8_4_ = auVar108._8_4_ * auVar111._8_4_;
          auVar49._12_4_ = auVar108._12_4_ * auVar111._12_4_;
          auVar49._16_4_ = auVar108._16_4_ * auVar111._16_4_;
          auVar49._20_4_ = auVar108._20_4_ * auVar111._20_4_;
          auVar49._24_4_ = auVar108._24_4_ * auVar111._24_4_;
          auVar49._28_4_ = auVar108._28_4_;
          auVar244 = vfmsub231ps_fma(auVar49,auVar120,auVar125);
          auVar103 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar102),ZEXT1632(auVar244));
          auVar123 = vfmadd231ps_avx512vl(ZEXT1632(auVar103),ZEXT1632(auVar104),auVar124);
          auVar125 = vrcp14ps_avx512vl(auVar123);
          auVar38._8_4_ = 0x3f800000;
          auVar38._0_8_ = &DAT_3f8000003f800000;
          auVar38._12_4_ = 0x3f800000;
          auVar38._16_4_ = 0x3f800000;
          auVar38._20_4_ = 0x3f800000;
          auVar38._24_4_ = 0x3f800000;
          auVar38._28_4_ = 0x3f800000;
          auVar121 = vfnmadd213ps_avx512vl(auVar125,auVar123,auVar38);
          auVar103 = vfmadd132ps_fma(auVar121,auVar125,auVar125);
          auVar50._4_4_ = auVar244._4_4_ * auVar122._4_4_;
          auVar50._0_4_ = auVar244._0_4_ * auVar122._0_4_;
          auVar50._8_4_ = auVar244._8_4_ * auVar122._8_4_;
          auVar50._12_4_ = auVar244._12_4_ * auVar122._12_4_;
          auVar50._16_4_ = fVar208 * 0.0;
          auVar50._20_4_ = fVar192 * 0.0;
          auVar50._24_4_ = fVar210 * 0.0;
          auVar50._28_4_ = iVar1;
          auVar102 = vfmadd231ps_fma(auVar50,auVar110,ZEXT1632(auVar102));
          auVar102 = vfmadd231ps_fma(ZEXT1632(auVar102),auVar119,ZEXT1632(auVar104));
          fVar192 = auVar103._0_4_;
          fVar208 = auVar103._4_4_;
          fVar210 = auVar103._8_4_;
          fVar211 = auVar103._12_4_;
          auVar125 = ZEXT1632(CONCAT412(auVar102._12_4_ * fVar211,
                                        CONCAT48(auVar102._8_4_ * fVar210,
                                                 CONCAT44(auVar102._4_4_ * fVar208,
                                                          auVar102._0_4_ * fVar192))));
          auVar225._4_4_ = fVar193;
          auVar225._0_4_ = fVar193;
          auVar225._8_4_ = fVar193;
          auVar225._12_4_ = fVar193;
          auVar225._16_4_ = fVar193;
          auVar225._20_4_ = fVar193;
          auVar225._24_4_ = fVar193;
          auVar225._28_4_ = fVar193;
          uVar157 = vcmpps_avx512vl(auVar225,auVar125,2);
          uVar156 = *(undefined4 *)(ray + k * 4 + 0x100);
          auVar39._4_4_ = uVar156;
          auVar39._0_4_ = uVar156;
          auVar39._8_4_ = uVar156;
          auVar39._12_4_ = uVar156;
          auVar39._16_4_ = uVar156;
          auVar39._20_4_ = uVar156;
          auVar39._24_4_ = uVar156;
          auVar39._28_4_ = uVar156;
          uVar26 = vcmpps_avx512vl(auVar125,auVar39,2);
          bVar96 = (byte)uVar157 & (byte)uVar26 & bVar96;
          if (bVar96 != 0) {
            uVar157 = vcmpps_avx512vl(auVar123,auVar124,4);
            if ((bVar96 & (byte)uVar157) != 0) {
              bVar96 = bVar96 & (byte)uVar157;
              fVar187 = auVar112._0_4_ * fVar192;
              fVar191 = auVar112._4_4_ * fVar208;
              auVar51._4_4_ = fVar191;
              auVar51._0_4_ = fVar187;
              fVar97 = auVar112._8_4_ * fVar210;
              auVar51._8_4_ = fVar97;
              fVar98 = auVar112._12_4_ * fVar211;
              auVar51._12_4_ = fVar98;
              fVar149 = auVar112._16_4_ * 0.0;
              auVar51._16_4_ = fVar149;
              fVar150 = auVar112._20_4_ * 0.0;
              auVar51._20_4_ = fVar150;
              fVar151 = auVar112._24_4_ * 0.0;
              auVar51._24_4_ = fVar151;
              auVar51._28_4_ = auVar112._28_4_;
              fVar192 = auVar114._0_4_ * fVar192;
              fVar208 = auVar114._4_4_ * fVar208;
              auVar52._4_4_ = fVar208;
              auVar52._0_4_ = fVar192;
              fVar210 = auVar114._8_4_ * fVar210;
              auVar52._8_4_ = fVar210;
              fVar211 = auVar114._12_4_ * fVar211;
              auVar52._12_4_ = fVar211;
              fVar152 = auVar114._16_4_ * 0.0;
              auVar52._16_4_ = fVar152;
              fVar153 = auVar114._20_4_ * 0.0;
              auVar52._20_4_ = fVar153;
              fVar154 = auVar114._24_4_ * 0.0;
              auVar52._24_4_ = fVar154;
              auVar52._28_4_ = auVar114._28_4_;
              auVar217._8_4_ = 0x3f800000;
              auVar217._0_8_ = &DAT_3f8000003f800000;
              auVar217._12_4_ = 0x3f800000;
              auVar217._16_4_ = 0x3f800000;
              auVar217._20_4_ = 0x3f800000;
              auVar217._24_4_ = 0x3f800000;
              auVar217._28_4_ = 0x3f800000;
              auVar123 = vsubps_avx(auVar217,auVar51);
              local_640._0_4_ =
                   (uint)(bVar88 & 1) * (int)fVar187 | (uint)!(bool)(bVar88 & 1) * auVar123._0_4_;
              bVar13 = (bool)((byte)(uVar89 >> 1) & 1);
              local_640._4_4_ = (uint)bVar13 * (int)fVar191 | (uint)!bVar13 * auVar123._4_4_;
              bVar13 = (bool)((byte)(uVar89 >> 2) & 1);
              local_640._8_4_ = (uint)bVar13 * (int)fVar97 | (uint)!bVar13 * auVar123._8_4_;
              bVar13 = (bool)((byte)(uVar89 >> 3) & 1);
              local_640._12_4_ = (uint)bVar13 * (int)fVar98 | (uint)!bVar13 * auVar123._12_4_;
              bVar13 = (bool)((byte)(uVar89 >> 4) & 1);
              local_640._16_4_ = (uint)bVar13 * (int)fVar149 | (uint)!bVar13 * auVar123._16_4_;
              bVar13 = (bool)((byte)(uVar89 >> 5) & 1);
              local_640._20_4_ = (uint)bVar13 * (int)fVar150 | (uint)!bVar13 * auVar123._20_4_;
              bVar13 = (bool)((byte)(uVar89 >> 6) & 1);
              local_640._24_4_ = (uint)bVar13 * (int)fVar151 | (uint)!bVar13 * auVar123._24_4_;
              bVar13 = SUB81(uVar89 >> 7,0);
              local_640._28_4_ = (uint)bVar13 * auVar112._28_4_ | (uint)!bVar13 * auVar123._28_4_;
              auVar123 = vsubps_avx(auVar217,auVar52);
              bVar13 = (bool)((byte)(uVar89 >> 1) & 1);
              bVar14 = (bool)((byte)(uVar89 >> 2) & 1);
              bVar15 = (bool)((byte)(uVar89 >> 3) & 1);
              bVar16 = (bool)((byte)(uVar89 >> 4) & 1);
              bVar17 = (bool)((byte)(uVar89 >> 5) & 1);
              bVar18 = (bool)((byte)(uVar89 >> 6) & 1);
              bVar19 = SUB81(uVar89 >> 7,0);
              local_2e0._4_4_ = (uint)bVar13 * (int)fVar208 | (uint)!bVar13 * auVar123._4_4_;
              local_2e0._0_4_ =
                   (uint)(bVar88 & 1) * (int)fVar192 | (uint)!(bool)(bVar88 & 1) * auVar123._0_4_;
              local_2e0._8_4_ = (uint)bVar14 * (int)fVar210 | (uint)!bVar14 * auVar123._8_4_;
              local_2e0._12_4_ = (uint)bVar15 * (int)fVar211 | (uint)!bVar15 * auVar123._12_4_;
              local_2e0._16_4_ = (uint)bVar16 * (int)fVar152 | (uint)!bVar16 * auVar123._16_4_;
              local_2e0._20_4_ = (uint)bVar17 * (int)fVar153 | (uint)!bVar17 * auVar123._20_4_;
              local_2e0._24_4_ = (uint)bVar18 * (int)fVar154 | (uint)!bVar18 * auVar123._24_4_;
              local_2e0._28_4_ = (uint)bVar19 * auVar114._28_4_ | (uint)!bVar19 * auVar123._28_4_;
              local_660 = auVar125;
              goto LAB_01c4cfa6;
            }
          }
          bVar96 = 0;
        }
LAB_01c4cfa6:
        auVar248 = ZEXT3264(local_620);
        auVar247 = ZEXT3264(local_600);
        auVar246 = ZEXT3264(local_5e0);
        auVar240 = ZEXT3264(auVar113);
        if (bVar96 != 0) {
          auVar123 = vsubps_avx(ZEXT1632(auVar25),auVar116);
          auVar103 = vfmadd213ps_fma(auVar123,local_640,auVar116);
          uVar156 = *(undefined4 *)((long)pre->ray_space + k * 4 + -0x20);
          auVar116._4_4_ = uVar156;
          auVar116._0_4_ = uVar156;
          auVar116._8_4_ = uVar156;
          auVar116._12_4_ = uVar156;
          auVar116._16_4_ = uVar156;
          auVar116._20_4_ = uVar156;
          auVar116._24_4_ = uVar156;
          auVar116._28_4_ = uVar156;
          auVar123 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar103._12_4_ + auVar103._12_4_,
                                                        CONCAT48(auVar103._8_4_ + auVar103._8_4_,
                                                                 CONCAT44(auVar103._4_4_ +
                                                                          auVar103._4_4_,
                                                                          auVar103._0_4_ +
                                                                          auVar103._0_4_)))),
                                     auVar116);
          uVar157 = vcmpps_avx512vl(local_660,auVar123,6);
          bVar96 = bVar96 & (byte)uVar157;
          if (bVar96 != 0) {
            auVar166._8_4_ = 0xbf800000;
            auVar166._0_8_ = 0xbf800000bf800000;
            auVar166._12_4_ = 0xbf800000;
            auVar166._16_4_ = 0xbf800000;
            auVar166._20_4_ = 0xbf800000;
            auVar166._24_4_ = 0xbf800000;
            auVar166._28_4_ = 0xbf800000;
            auVar40._8_4_ = 0x40000000;
            auVar40._0_8_ = 0x4000000040000000;
            auVar40._12_4_ = 0x40000000;
            auVar40._16_4_ = 0x40000000;
            auVar40._20_4_ = 0x40000000;
            auVar40._24_4_ = 0x40000000;
            auVar40._28_4_ = 0x40000000;
            local_440 = vfmadd132ps_avx512vl(local_2e0,auVar166,auVar40);
            local_2e0 = local_440;
            auVar123 = local_2e0;
            local_400 = 0;
            local_3f0 = local_770;
            uStack_3e8 = uStack_768;
            local_3e0 = local_6b0._0_8_;
            uStack_3d8 = local_6b0._8_8_;
            local_3d0 = local_6c0._0_8_;
            uStack_3c8 = local_6c0._8_8_;
            local_3c0 = local_6d0;
            uStack_3b8 = uStack_6c8;
            local_2e0 = auVar123;
            if ((pGVar93->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
              fVar192 = 1.0 / auVar117._0_4_;
              local_3a0[0] = fVar192 * (local_640._0_4_ + 0.0);
              local_3a0[1] = fVar192 * (local_640._4_4_ + 1.0);
              local_3a0[2] = fVar192 * (local_640._8_4_ + 2.0);
              local_3a0[3] = fVar192 * (local_640._12_4_ + 3.0);
              fStack_390 = fVar192 * (local_640._16_4_ + 4.0);
              fStack_38c = fVar192 * (local_640._20_4_ + 5.0);
              fStack_388 = fVar192 * (local_640._24_4_ + 6.0);
              fStack_384 = local_640._28_4_ + 7.0;
              local_2e0._0_8_ = local_440._0_8_;
              local_2e0._8_8_ = local_440._8_8_;
              local_2e0._16_8_ = local_440._16_8_;
              local_2e0._24_8_ = local_440._24_8_;
              local_380 = local_2e0._0_8_;
              uStack_378 = local_2e0._8_8_;
              uStack_370 = local_2e0._16_8_;
              uStack_368 = local_2e0._24_8_;
              local_360 = local_660;
              auVar167._8_4_ = 0x7f800000;
              auVar167._0_8_ = 0x7f8000007f800000;
              auVar167._12_4_ = 0x7f800000;
              auVar167._16_4_ = 0x7f800000;
              auVar167._20_4_ = 0x7f800000;
              auVar167._24_4_ = 0x7f800000;
              auVar167._28_4_ = 0x7f800000;
              auVar123 = vblendmps_avx512vl(auVar167,local_660);
              auVar134._0_4_ =
                   (uint)(bVar96 & 1) * auVar123._0_4_ | (uint)!(bool)(bVar96 & 1) * 0x7f800000;
              bVar13 = (bool)(bVar96 >> 1 & 1);
              auVar134._4_4_ = (uint)bVar13 * auVar123._4_4_ | (uint)!bVar13 * 0x7f800000;
              bVar13 = (bool)(bVar96 >> 2 & 1);
              auVar134._8_4_ = (uint)bVar13 * auVar123._8_4_ | (uint)!bVar13 * 0x7f800000;
              bVar13 = (bool)(bVar96 >> 3 & 1);
              auVar134._12_4_ = (uint)bVar13 * auVar123._12_4_ | (uint)!bVar13 * 0x7f800000;
              bVar13 = (bool)(bVar96 >> 4 & 1);
              auVar134._16_4_ = (uint)bVar13 * auVar123._16_4_ | (uint)!bVar13 * 0x7f800000;
              bVar13 = (bool)(bVar96 >> 5 & 1);
              auVar134._20_4_ = (uint)bVar13 * auVar123._20_4_ | (uint)!bVar13 * 0x7f800000;
              bVar13 = (bool)(bVar96 >> 6 & 1);
              auVar134._24_4_ = (uint)bVar13 * auVar123._24_4_ | (uint)!bVar13 * 0x7f800000;
              auVar134._28_4_ =
                   (uint)(bVar96 >> 7) * auVar123._28_4_ | (uint)!(bool)(bVar96 >> 7) * 0x7f800000;
              auVar123 = vshufps_avx(auVar134,auVar134,0xb1);
              auVar123 = vminps_avx(auVar134,auVar123);
              auVar125 = vshufpd_avx(auVar123,auVar123,5);
              auVar123 = vminps_avx(auVar123,auVar125);
              auVar125 = vpermpd_avx2(auVar123,0x4e);
              auVar123 = vminps_avx(auVar123,auVar125);
              uVar157 = vcmpps_avx512vl(auVar134,auVar123,0);
              bVar87 = (byte)uVar157 & bVar96;
              bVar88 = bVar96;
              if (bVar87 != 0) {
                bVar88 = bVar87;
              }
              uVar28 = 0;
              for (uVar90 = (uint)bVar88; (uVar90 & 1) == 0; uVar90 = uVar90 >> 1 | 0x80000000) {
                uVar28 = uVar28 + 1;
              }
              uVar89 = (ulong)uVar28;
              if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                 (pGVar93->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                fVar192 = local_3a0[uVar89];
                uVar156 = *(undefined4 *)((long)&local_380 + uVar89 * 4);
                fVar208 = 1.0 - fVar192;
                auVar33._8_4_ = 0x80000000;
                auVar33._0_8_ = 0x8000000080000000;
                auVar33._12_4_ = 0x80000000;
                auVar104 = vxorps_avx512vl(ZEXT416((uint)fVar208),auVar33);
                auVar103 = ZEXT416((uint)(fVar192 * fVar208 * 4.0));
                auVar102 = vfnmsub213ss_fma(ZEXT416((uint)fVar192),ZEXT416((uint)fVar192),auVar103);
                auVar103 = vfmadd213ss_fma(ZEXT416((uint)fVar208),ZEXT416((uint)fVar208),auVar103);
                fVar208 = fVar208 * auVar104._0_4_ * 0.5;
                fVar210 = auVar102._0_4_ * 0.5;
                fVar211 = auVar103._0_4_ * 0.5;
                fVar187 = fVar192 * fVar192 * 0.5;
                auVar196._0_4_ = fVar187 * (float)local_6d0._0_4_;
                auVar196._4_4_ = fVar187 * (float)local_6d0._4_4_;
                auVar196._8_4_ = fVar187 * (float)uStack_6c8;
                auVar196._12_4_ = fVar187 * uStack_6c8._4_4_;
                auVar183._4_4_ = fVar211;
                auVar183._0_4_ = fVar211;
                auVar183._8_4_ = fVar211;
                auVar183._12_4_ = fVar211;
                auVar103 = vfmadd132ps_fma(auVar183,auVar196,local_6c0);
                auVar197._4_4_ = fVar210;
                auVar197._0_4_ = fVar210;
                auVar197._8_4_ = fVar210;
                auVar197._12_4_ = fVar210;
                auVar103 = vfmadd132ps_fma(auVar197,auVar103,local_6b0);
                auVar184._4_4_ = fVar208;
                auVar184._0_4_ = fVar208;
                auVar184._8_4_ = fVar208;
                auVar184._12_4_ = fVar208;
                auVar103 = vfmadd132ps_fma(auVar184,auVar103,auVar20);
                *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_360 + uVar89 * 4);
                *(int *)(ray + k * 4 + 0x180) = auVar103._0_4_;
                uVar9 = vextractps_avx(auVar103,1);
                *(undefined4 *)(ray + k * 4 + 0x1a0) = uVar9;
                uVar9 = vextractps_avx(auVar103,2);
                *(undefined4 *)(ray + k * 4 + 0x1c0) = uVar9;
                *(float *)(ray + k * 4 + 0x1e0) = fVar192;
                *(undefined4 *)(ray + k * 4 + 0x200) = uVar156;
                *(uint *)(ray + k * 4 + 0x220) = uVar7;
                *(uint *)(ray + k * 4 + 0x240) = uVar94;
                *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
              }
              else {
                local_340 = vpbroadcastd_avx512vl();
                local_4c0 = vpbroadcastd_avx512vl();
                local_580 = local_6b0._0_4_;
                uStack_57c = local_6b0._4_4_;
                uStack_578 = local_6b0._8_8_;
                local_590 = local_6c0._0_8_;
                uStack_588 = local_6c0._8_8_;
                local_5a0 = (float)local_6d0._0_4_;
                fStack_59c = (float)local_6d0._4_4_;
                fStack_598 = (float)uStack_6c8;
                fStack_594 = uStack_6c8._4_4_;
                local_560 = fVar193;
                local_540 = auVar113;
                local_460 = local_640;
                local_420 = local_660;
                local_3fc = iVar8;
                local_3b0 = bVar96;
                do {
                  auVar244 = auVar245._0_16_;
                  local_320._0_4_ = *(undefined4 *)(ray + k * 4 + 0x100);
                  fVar209 = local_3a0[uVar89];
                  auVar177._4_4_ = fVar209;
                  auVar177._0_4_ = fVar209;
                  auVar177._8_4_ = fVar209;
                  auVar177._12_4_ = fVar209;
                  local_200._16_4_ = fVar209;
                  local_200._0_16_ = auVar177;
                  local_200._20_4_ = fVar209;
                  local_200._24_4_ = fVar209;
                  local_200._28_4_ = fVar209;
                  local_1e0 = *(undefined4 *)((long)&local_380 + uVar89 * 4);
                  *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_360 + uVar89 * 4);
                  local_760.context = context->user;
                  fVar192 = 1.0 - fVar209;
                  auVar37._8_4_ = 0x80000000;
                  auVar37._0_8_ = 0x8000000080000000;
                  auVar37._12_4_ = 0x80000000;
                  auVar104 = vxorps_avx512vl(ZEXT416((uint)fVar192),auVar37);
                  auVar103 = ZEXT416((uint)(fVar209 * fVar192 * 4.0));
                  auVar102 = vfnmsub213ss_fma(auVar177,auVar177,auVar103);
                  auVar103 = vfmadd213ss_fma(ZEXT416((uint)fVar192),ZEXT416((uint)fVar192),auVar103)
                  ;
                  fVar192 = fVar192 * auVar104._0_4_ * 0.5;
                  fVar208 = auVar102._0_4_ * 0.5;
                  fVar210 = auVar103._0_4_ * 0.5;
                  fVar209 = fVar209 * fVar209 * 0.5;
                  auVar216._0_4_ = fVar209 * local_5a0;
                  auVar216._4_4_ = fVar209 * fStack_59c;
                  auVar216._8_4_ = fVar209 * fStack_598;
                  auVar216._12_4_ = fVar209 * fStack_594;
                  auVar164._4_4_ = fVar210;
                  auVar164._0_4_ = fVar210;
                  auVar164._8_4_ = fVar210;
                  auVar164._12_4_ = fVar210;
                  auVar83._8_8_ = uStack_588;
                  auVar83._0_8_ = local_590;
                  auVar103 = vfmadd132ps_fma(auVar164,auVar216,auVar83);
                  auVar201._4_4_ = fVar208;
                  auVar201._0_4_ = fVar208;
                  auVar201._8_4_ = fVar208;
                  auVar201._12_4_ = fVar208;
                  auVar84._4_4_ = uStack_57c;
                  auVar84._0_4_ = local_580;
                  auVar84._8_8_ = uStack_578;
                  auVar103 = vfmadd132ps_fma(auVar201,auVar103,auVar84);
                  auVar165._4_4_ = fVar192;
                  auVar165._0_4_ = fVar192;
                  auVar165._8_4_ = fVar192;
                  auVar165._12_4_ = fVar192;
                  auVar103 = vfmadd132ps_fma(auVar165,auVar103,auVar20);
                  local_260 = auVar103._0_4_;
                  auVar207._8_4_ = 1;
                  auVar207._0_8_ = 0x100000001;
                  auVar207._12_4_ = 1;
                  auVar207._16_4_ = 1;
                  auVar207._20_4_ = 1;
                  auVar207._24_4_ = 1;
                  auVar207._28_4_ = 1;
                  local_240 = vpermps_avx2(auVar207,ZEXT1632(auVar103));
                  auVar220._8_4_ = 2;
                  auVar220._0_8_ = 0x200000002;
                  auVar220._12_4_ = 2;
                  auVar220._16_4_ = 2;
                  auVar220._20_4_ = 2;
                  auVar220._24_4_ = 2;
                  auVar220._28_4_ = 2;
                  local_220 = vpermps_avx2(auVar220,ZEXT1632(auVar103));
                  iStack_25c = local_260;
                  iStack_258 = local_260;
                  iStack_254 = local_260;
                  iStack_250 = local_260;
                  iStack_24c = local_260;
                  iStack_248 = local_260;
                  iStack_244 = local_260;
                  uStack_1dc = local_1e0;
                  uStack_1d8 = local_1e0;
                  uStack_1d4 = local_1e0;
                  uStack_1d0 = local_1e0;
                  uStack_1cc = local_1e0;
                  uStack_1c8 = local_1e0;
                  uStack_1c4 = local_1e0;
                  local_1c0 = local_4c0._0_8_;
                  uStack_1b8 = local_4c0._8_8_;
                  uStack_1b0 = local_4c0._16_8_;
                  uStack_1a8 = local_4c0._24_8_;
                  local_1a0 = local_340;
                  auVar123 = vpcmpeqd_avx2(local_340,local_340);
                  local_728[1] = auVar123;
                  *local_728 = auVar123;
                  local_180 = (local_760.context)->instID[0];
                  uStack_17c = local_180;
                  uStack_178 = local_180;
                  uStack_174 = local_180;
                  uStack_170 = local_180;
                  uStack_16c = local_180;
                  uStack_168 = local_180;
                  uStack_164 = local_180;
                  local_160 = (local_760.context)->instPrimID[0];
                  uStack_15c = local_160;
                  uStack_158 = local_160;
                  uStack_154 = local_160;
                  uStack_150 = local_160;
                  uStack_14c = local_160;
                  uStack_148 = local_160;
                  uStack_144 = local_160;
                  local_5c0 = local_280._0_8_;
                  uStack_5b8 = local_280._8_8_;
                  uStack_5b0 = local_280._16_8_;
                  uStack_5a8 = local_280._24_8_;
                  local_760.valid = (int *)&local_5c0;
                  local_760.geometryUserPtr = pGVar93->userPtr;
                  local_760.hit = (RTCHitN *)&local_260;
                  local_760.N = 8;
                  local_4a0 = (undefined4)uVar89;
                  uStack_49c = (undefined4)(uVar89 >> 0x20);
                  local_760.ray = (RTCRayN *)ray;
                  if (pGVar93->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                    (*pGVar93->intersectionFilterN)(&local_760);
                    uVar89 = CONCAT44(uStack_49c,local_4a0);
                    auVar235 = ZEXT1664(_local_6e0);
                    auVar240 = ZEXT3264(local_540);
                    auVar248 = ZEXT3264(local_620);
                    auVar247 = ZEXT3264(local_600);
                    auVar246 = ZEXT3264(local_5e0);
                    auVar249 = ZEXT3264(local_720);
                    auVar239 = ZEXT3264(local_700);
                    auVar243 = ZEXT3264(local_520);
                    auVar242 = ZEXT3264(local_4e0);
                    auVar241 = ZEXT3264(local_500);
                    auVar103 = vxorps_avx512vl(auVar244,auVar244);
                    auVar245 = ZEXT1664(auVar103);
                    fVar193 = local_560;
                  }
                  auVar103 = auVar245._0_16_;
                  auVar79._8_8_ = uStack_5b8;
                  auVar79._0_8_ = local_5c0;
                  auVar79._16_8_ = uStack_5b0;
                  auVar79._24_8_ = uStack_5a8;
                  if (auVar79 == (undefined1  [32])0x0) {
LAB_01c4e62a:
                    *(undefined4 *)(ray + k * 4 + 0x100) = local_320._0_4_;
                  }
                  else {
                    p_Var12 = context->args->filter;
                    if ((p_Var12 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar93->field_8).field_0x2 & 0x40) != 0)))) {
                      (*p_Var12)(&local_760);
                      uVar89 = CONCAT44(uStack_49c,local_4a0);
                      auVar235 = ZEXT1664(_local_6e0);
                      auVar240 = ZEXT3264(local_540);
                      auVar248 = ZEXT3264(local_620);
                      auVar247 = ZEXT3264(local_600);
                      auVar246 = ZEXT3264(local_5e0);
                      auVar249 = ZEXT3264(local_720);
                      auVar239 = ZEXT3264(local_700);
                      auVar243 = ZEXT3264(local_520);
                      auVar242 = ZEXT3264(local_4e0);
                      auVar241 = ZEXT3264(local_500);
                      auVar103 = vxorps_avx512vl(auVar103,auVar103);
                      auVar245 = ZEXT1664(auVar103);
                      fVar193 = local_560;
                    }
                    auVar80._8_8_ = uStack_5b8;
                    auVar80._0_8_ = local_5c0;
                    auVar80._16_8_ = uStack_5b0;
                    auVar80._24_8_ = uStack_5a8;
                    if (auVar80 == (undefined1  [32])0x0) goto LAB_01c4e62a;
                    uVar27 = vptestmd_avx512vl(auVar80,auVar80);
                    iVar1 = *(int *)(local_760.hit + 4);
                    iVar2 = *(int *)(local_760.hit + 8);
                    iVar72 = *(int *)(local_760.hit + 0xc);
                    iVar73 = *(int *)(local_760.hit + 0x10);
                    iVar74 = *(int *)(local_760.hit + 0x14);
                    iVar75 = *(int *)(local_760.hit + 0x18);
                    iVar76 = *(int *)(local_760.hit + 0x1c);
                    bVar88 = (byte)uVar27;
                    bVar13 = (bool)((byte)(uVar27 >> 1) & 1);
                    bVar14 = (bool)((byte)(uVar27 >> 2) & 1);
                    bVar15 = (bool)((byte)(uVar27 >> 3) & 1);
                    bVar16 = (bool)((byte)(uVar27 >> 4) & 1);
                    bVar17 = (bool)((byte)(uVar27 >> 5) & 1);
                    bVar18 = (bool)((byte)(uVar27 >> 6) & 1);
                    bVar19 = SUB81(uVar27 >> 7,0);
                    *(uint *)(local_760.ray + 0x180) =
                         (uint)(bVar88 & 1) * *(int *)local_760.hit |
                         (uint)!(bool)(bVar88 & 1) * *(int *)(local_760.ray + 0x180);
                    *(uint *)(local_760.ray + 0x184) =
                         (uint)bVar13 * iVar1 | (uint)!bVar13 * *(int *)(local_760.ray + 0x184);
                    *(uint *)(local_760.ray + 0x188) =
                         (uint)bVar14 * iVar2 | (uint)!bVar14 * *(int *)(local_760.ray + 0x188);
                    *(uint *)(local_760.ray + 0x18c) =
                         (uint)bVar15 * iVar72 | (uint)!bVar15 * *(int *)(local_760.ray + 0x18c);
                    *(uint *)(local_760.ray + 400) =
                         (uint)bVar16 * iVar73 | (uint)!bVar16 * *(int *)(local_760.ray + 400);
                    *(uint *)(local_760.ray + 0x194) =
                         (uint)bVar17 * iVar74 | (uint)!bVar17 * *(int *)(local_760.ray + 0x194);
                    *(uint *)(local_760.ray + 0x198) =
                         (uint)bVar18 * iVar75 | (uint)!bVar18 * *(int *)(local_760.ray + 0x198);
                    *(uint *)(local_760.ray + 0x19c) =
                         (uint)bVar19 * iVar76 | (uint)!bVar19 * *(int *)(local_760.ray + 0x19c);
                    iVar1 = *(int *)(local_760.hit + 0x24);
                    iVar2 = *(int *)(local_760.hit + 0x28);
                    iVar72 = *(int *)(local_760.hit + 0x2c);
                    iVar73 = *(int *)(local_760.hit + 0x30);
                    iVar74 = *(int *)(local_760.hit + 0x34);
                    iVar75 = *(int *)(local_760.hit + 0x38);
                    iVar76 = *(int *)(local_760.hit + 0x3c);
                    bVar13 = (bool)((byte)(uVar27 >> 1) & 1);
                    bVar14 = (bool)((byte)(uVar27 >> 2) & 1);
                    bVar15 = (bool)((byte)(uVar27 >> 3) & 1);
                    bVar16 = (bool)((byte)(uVar27 >> 4) & 1);
                    bVar17 = (bool)((byte)(uVar27 >> 5) & 1);
                    bVar18 = (bool)((byte)(uVar27 >> 6) & 1);
                    bVar19 = SUB81(uVar27 >> 7,0);
                    *(uint *)(local_760.ray + 0x1a0) =
                         (uint)(bVar88 & 1) * *(int *)(local_760.hit + 0x20) |
                         (uint)!(bool)(bVar88 & 1) * *(int *)(local_760.ray + 0x1a0);
                    *(uint *)(local_760.ray + 0x1a4) =
                         (uint)bVar13 * iVar1 | (uint)!bVar13 * *(int *)(local_760.ray + 0x1a4);
                    *(uint *)(local_760.ray + 0x1a8) =
                         (uint)bVar14 * iVar2 | (uint)!bVar14 * *(int *)(local_760.ray + 0x1a8);
                    *(uint *)(local_760.ray + 0x1ac) =
                         (uint)bVar15 * iVar72 | (uint)!bVar15 * *(int *)(local_760.ray + 0x1ac);
                    *(uint *)(local_760.ray + 0x1b0) =
                         (uint)bVar16 * iVar73 | (uint)!bVar16 * *(int *)(local_760.ray + 0x1b0);
                    *(uint *)(local_760.ray + 0x1b4) =
                         (uint)bVar17 * iVar74 | (uint)!bVar17 * *(int *)(local_760.ray + 0x1b4);
                    *(uint *)(local_760.ray + 0x1b8) =
                         (uint)bVar18 * iVar75 | (uint)!bVar18 * *(int *)(local_760.ray + 0x1b8);
                    *(uint *)(local_760.ray + 0x1bc) =
                         (uint)bVar19 * iVar76 | (uint)!bVar19 * *(int *)(local_760.ray + 0x1bc);
                    iVar1 = *(int *)(local_760.hit + 0x44);
                    iVar2 = *(int *)(local_760.hit + 0x48);
                    iVar72 = *(int *)(local_760.hit + 0x4c);
                    iVar73 = *(int *)(local_760.hit + 0x50);
                    iVar74 = *(int *)(local_760.hit + 0x54);
                    iVar75 = *(int *)(local_760.hit + 0x58);
                    iVar76 = *(int *)(local_760.hit + 0x5c);
                    bVar13 = (bool)((byte)(uVar27 >> 1) & 1);
                    bVar14 = (bool)((byte)(uVar27 >> 2) & 1);
                    bVar15 = (bool)((byte)(uVar27 >> 3) & 1);
                    bVar16 = (bool)((byte)(uVar27 >> 4) & 1);
                    bVar17 = (bool)((byte)(uVar27 >> 5) & 1);
                    bVar18 = (bool)((byte)(uVar27 >> 6) & 1);
                    bVar19 = SUB81(uVar27 >> 7,0);
                    *(uint *)(local_760.ray + 0x1c0) =
                         (uint)(bVar88 & 1) * *(int *)(local_760.hit + 0x40) |
                         (uint)!(bool)(bVar88 & 1) * *(int *)(local_760.ray + 0x1c0);
                    *(uint *)(local_760.ray + 0x1c4) =
                         (uint)bVar13 * iVar1 | (uint)!bVar13 * *(int *)(local_760.ray + 0x1c4);
                    *(uint *)(local_760.ray + 0x1c8) =
                         (uint)bVar14 * iVar2 | (uint)!bVar14 * *(int *)(local_760.ray + 0x1c8);
                    *(uint *)(local_760.ray + 0x1cc) =
                         (uint)bVar15 * iVar72 | (uint)!bVar15 * *(int *)(local_760.ray + 0x1cc);
                    *(uint *)(local_760.ray + 0x1d0) =
                         (uint)bVar16 * iVar73 | (uint)!bVar16 * *(int *)(local_760.ray + 0x1d0);
                    *(uint *)(local_760.ray + 0x1d4) =
                         (uint)bVar17 * iVar74 | (uint)!bVar17 * *(int *)(local_760.ray + 0x1d4);
                    *(uint *)(local_760.ray + 0x1d8) =
                         (uint)bVar18 * iVar75 | (uint)!bVar18 * *(int *)(local_760.ray + 0x1d8);
                    *(uint *)(local_760.ray + 0x1dc) =
                         (uint)bVar19 * iVar76 | (uint)!bVar19 * *(int *)(local_760.ray + 0x1dc);
                    iVar1 = *(int *)(local_760.hit + 100);
                    iVar2 = *(int *)(local_760.hit + 0x68);
                    iVar72 = *(int *)(local_760.hit + 0x6c);
                    iVar73 = *(int *)(local_760.hit + 0x70);
                    iVar74 = *(int *)(local_760.hit + 0x74);
                    iVar75 = *(int *)(local_760.hit + 0x78);
                    iVar76 = *(int *)(local_760.hit + 0x7c);
                    bVar13 = (bool)((byte)(uVar27 >> 1) & 1);
                    bVar14 = (bool)((byte)(uVar27 >> 2) & 1);
                    bVar15 = (bool)((byte)(uVar27 >> 3) & 1);
                    bVar16 = (bool)((byte)(uVar27 >> 4) & 1);
                    bVar17 = (bool)((byte)(uVar27 >> 5) & 1);
                    bVar18 = (bool)((byte)(uVar27 >> 6) & 1);
                    bVar19 = SUB81(uVar27 >> 7,0);
                    *(uint *)(local_760.ray + 0x1e0) =
                         (uint)(bVar88 & 1) * *(int *)(local_760.hit + 0x60) |
                         (uint)!(bool)(bVar88 & 1) * *(int *)(local_760.ray + 0x1e0);
                    *(uint *)(local_760.ray + 0x1e4) =
                         (uint)bVar13 * iVar1 | (uint)!bVar13 * *(int *)(local_760.ray + 0x1e4);
                    *(uint *)(local_760.ray + 0x1e8) =
                         (uint)bVar14 * iVar2 | (uint)!bVar14 * *(int *)(local_760.ray + 0x1e8);
                    *(uint *)(local_760.ray + 0x1ec) =
                         (uint)bVar15 * iVar72 | (uint)!bVar15 * *(int *)(local_760.ray + 0x1ec);
                    *(uint *)(local_760.ray + 0x1f0) =
                         (uint)bVar16 * iVar73 | (uint)!bVar16 * *(int *)(local_760.ray + 0x1f0);
                    *(uint *)(local_760.ray + 500) =
                         (uint)bVar17 * iVar74 | (uint)!bVar17 * *(int *)(local_760.ray + 500);
                    *(uint *)(local_760.ray + 0x1f8) =
                         (uint)bVar18 * iVar75 | (uint)!bVar18 * *(int *)(local_760.ray + 0x1f8);
                    *(uint *)(local_760.ray + 0x1fc) =
                         (uint)bVar19 * iVar76 | (uint)!bVar19 * *(int *)(local_760.ray + 0x1fc);
                    auVar147._0_4_ =
                         (uint)(bVar88 & 1) * *(int *)(local_760.hit + 0x80) |
                         (uint)!(bool)(bVar88 & 1) * *(int *)(local_760.ray + 0x200);
                    bVar13 = (bool)((byte)(uVar27 >> 1) & 1);
                    auVar147._4_4_ =
                         (uint)bVar13 * *(int *)(local_760.hit + 0x84) |
                         (uint)!bVar13 * *(int *)(local_760.ray + 0x204);
                    bVar13 = (bool)((byte)(uVar27 >> 2) & 1);
                    auVar147._8_4_ =
                         (uint)bVar13 * *(int *)(local_760.hit + 0x88) |
                         (uint)!bVar13 * *(int *)(local_760.ray + 0x208);
                    bVar13 = (bool)((byte)(uVar27 >> 3) & 1);
                    auVar147._12_4_ =
                         (uint)bVar13 * *(int *)(local_760.hit + 0x8c) |
                         (uint)!bVar13 * *(int *)(local_760.ray + 0x20c);
                    bVar13 = (bool)((byte)(uVar27 >> 4) & 1);
                    auVar147._16_4_ =
                         (uint)bVar13 * *(int *)(local_760.hit + 0x90) |
                         (uint)!bVar13 * *(int *)(local_760.ray + 0x210);
                    bVar13 = (bool)((byte)(uVar27 >> 5) & 1);
                    auVar147._20_4_ =
                         (uint)bVar13 * *(int *)(local_760.hit + 0x94) |
                         (uint)!bVar13 * *(int *)(local_760.ray + 0x214);
                    bVar13 = (bool)((byte)(uVar27 >> 6) & 1);
                    auVar147._24_4_ =
                         (uint)bVar13 * *(int *)(local_760.hit + 0x98) |
                         (uint)!bVar13 * *(int *)(local_760.ray + 0x218);
                    bVar13 = SUB81(uVar27 >> 7,0);
                    auVar147._28_4_ =
                         (uint)bVar13 * *(int *)(local_760.hit + 0x9c) |
                         (uint)!bVar13 * *(int *)(local_760.ray + 0x21c);
                    *(undefined1 (*) [32])(local_760.ray + 0x200) = auVar147;
                    auVar123 = vmovdqu32_avx512vl(*(undefined1 (*) [32])(local_760.hit + 0xa0));
                    *(undefined1 (*) [32])(local_760.ray + 0x220) = auVar123;
                    auVar123 = vmovdqu32_avx512vl(*(undefined1 (*) [32])(local_760.hit + 0xc0));
                    *(undefined1 (*) [32])(local_760.ray + 0x240) = auVar123;
                    auVar123 = vmovdqa32_avx512vl(*(undefined1 (*) [32])(local_760.hit + 0xe0));
                    *(undefined1 (*) [32])(local_760.ray + 0x260) = auVar123;
                    auVar123 = vmovdqa32_avx512vl(*(undefined1 (*) [32])(local_760.hit + 0x100));
                    *(undefined1 (*) [32])(local_760.ray + 0x280) = auVar123;
                  }
                  auVar113 = auVar240._0_32_;
                  bVar88 = ~(byte)(1 << ((uint)uVar89 & 0x1f)) & bVar96;
                  uVar156 = *(undefined4 *)(ray + k * 4 + 0x100);
                  auVar46._4_4_ = uVar156;
                  auVar46._0_4_ = uVar156;
                  auVar46._8_4_ = uVar156;
                  auVar46._12_4_ = uVar156;
                  auVar46._16_4_ = uVar156;
                  auVar46._20_4_ = uVar156;
                  auVar46._24_4_ = uVar156;
                  auVar46._28_4_ = uVar156;
                  uVar157 = vcmpps_avx512vl(local_660,auVar46,2);
                  bVar96 = bVar88 & (byte)uVar157;
                  if ((bVar88 & (byte)uVar157) != 0) {
                    auVar171._8_4_ = 0x7f800000;
                    auVar171._0_8_ = 0x7f8000007f800000;
                    auVar171._12_4_ = 0x7f800000;
                    auVar171._16_4_ = 0x7f800000;
                    auVar171._20_4_ = 0x7f800000;
                    auVar171._24_4_ = 0x7f800000;
                    auVar171._28_4_ = 0x7f800000;
                    auVar123 = vblendmps_avx512vl(auVar171,local_660);
                    auVar148._0_4_ =
                         (uint)(bVar96 & 1) * auVar123._0_4_ |
                         (uint)!(bool)(bVar96 & 1) * 0x7f800000;
                    bVar13 = (bool)(bVar96 >> 1 & 1);
                    auVar148._4_4_ = (uint)bVar13 * auVar123._4_4_ | (uint)!bVar13 * 0x7f800000;
                    bVar13 = (bool)(bVar96 >> 2 & 1);
                    auVar148._8_4_ = (uint)bVar13 * auVar123._8_4_ | (uint)!bVar13 * 0x7f800000;
                    bVar13 = (bool)(bVar96 >> 3 & 1);
                    auVar148._12_4_ = (uint)bVar13 * auVar123._12_4_ | (uint)!bVar13 * 0x7f800000;
                    bVar13 = (bool)(bVar96 >> 4 & 1);
                    auVar148._16_4_ = (uint)bVar13 * auVar123._16_4_ | (uint)!bVar13 * 0x7f800000;
                    bVar13 = (bool)(bVar96 >> 5 & 1);
                    auVar148._20_4_ = (uint)bVar13 * auVar123._20_4_ | (uint)!bVar13 * 0x7f800000;
                    bVar13 = (bool)(bVar96 >> 6 & 1);
                    auVar148._24_4_ = (uint)bVar13 * auVar123._24_4_ | (uint)!bVar13 * 0x7f800000;
                    auVar148._28_4_ =
                         (uint)(bVar96 >> 7) * auVar123._28_4_ |
                         (uint)!(bool)(bVar96 >> 7) * 0x7f800000;
                    auVar123 = vshufps_avx(auVar148,auVar148,0xb1);
                    auVar123 = vminps_avx(auVar148,auVar123);
                    auVar125 = vshufpd_avx(auVar123,auVar123,5);
                    auVar123 = vminps_avx(auVar123,auVar125);
                    auVar125 = vpermpd_avx2(auVar123,0x4e);
                    auVar123 = vminps_avx(auVar123,auVar125);
                    uVar157 = vcmpps_avx512vl(auVar148,auVar123,0);
                    bVar87 = (byte)uVar157 & bVar96;
                    bVar88 = bVar96;
                    if (bVar87 != 0) {
                      bVar88 = bVar87;
                    }
                    uVar28 = 0;
                    for (uVar90 = (uint)bVar88; (uVar90 & 1) == 0; uVar90 = uVar90 >> 1 | 0x80000000
                        ) {
                      uVar28 = uVar28 + 1;
                    }
                    uVar89 = (ulong)uVar28;
                  }
                  fVar209 = auVar235._0_4_;
                } while (bVar96 != 0);
              }
            }
          }
        }
      }
      local_560 = fVar209;
      if (8 < iVar8) {
        auVar123 = vpbroadcastd_avx512vl();
        auVar235 = ZEXT3264(auVar123);
        fStack_470 = 1.0 / (float)local_480._0_4_;
        local_480._4_4_ = fStack_470;
        local_480._0_4_ = fStack_470;
        fStack_478 = fStack_470;
        fStack_474 = fStack_470;
        local_320 = vpbroadcastd_avx512vl();
        local_340 = vpbroadcastd_avx512vl();
        lVar91 = 8;
        fStack_55c = local_560;
        fStack_558 = local_560;
        fStack_554 = local_560;
        fStack_550 = local_560;
        fStack_54c = local_560;
        fStack_548 = local_560;
        fStack_544 = local_560;
        local_540 = auVar113;
        local_4a0 = fVar193;
        uStack_49c = fVar193;
        uStack_498 = fVar193;
        uStack_494 = fVar193;
        uStack_490 = fVar193;
        uStack_48c = fVar193;
        uStack_488 = fVar193;
        uStack_484 = fVar193;
        fStack_46c = fStack_470;
        fStack_468 = fStack_470;
        fStack_464 = fStack_470;
        do {
          auVar123 = vpbroadcastd_avx512vl();
          auVar108 = vpor_avx2(auVar123,_DAT_0205a920);
          uVar26 = vpcmpgtd_avx512vl(auVar235._0_32_,auVar108);
          auVar123 = *(undefined1 (*) [32])(bspline_basis0 + lVar91 * 4 + lVar29);
          auVar125 = *(undefined1 (*) [32])(lVar29 + 0x222bfac + lVar91 * 4);
          auVar121 = *(undefined1 (*) [32])(lVar29 + 0x222c430 + lVar91 * 4);
          auVar120 = *(undefined1 (*) [32])(lVar29 + 0x222c8b4 + lVar91 * 4);
          local_600 = auVar247._0_32_;
          auVar109 = vmulps_avx512vl(local_600,auVar120);
          local_620 = auVar248._0_32_;
          auVar119 = vmulps_avx512vl(local_620,auVar120);
          auVar53._4_4_ = auVar120._4_4_ * (float)local_e0._4_4_;
          auVar53._0_4_ = auVar120._0_4_ * (float)local_e0._0_4_;
          auVar53._8_4_ = auVar120._8_4_ * fStack_d8;
          auVar53._12_4_ = auVar120._12_4_ * fStack_d4;
          auVar53._16_4_ = auVar120._16_4_ * fStack_d0;
          auVar53._20_4_ = auVar120._20_4_ * fStack_cc;
          auVar53._24_4_ = auVar120._24_4_ * fStack_c8;
          auVar53._28_4_ = auVar108._28_4_;
          auVar128 = auVar249._0_32_;
          auVar108 = vfmadd231ps_avx512vl(auVar109,auVar121,auVar128);
          local_5e0 = auVar246._0_32_;
          auVar109 = vfmadd231ps_avx512vl(auVar119,auVar121,local_5e0);
          auVar119 = vfmadd231ps_avx512vl(auVar53,auVar121,local_c0);
          auVar127 = auVar243._0_32_;
          auVar108 = vfmadd231ps_avx512vl(auVar108,auVar125,auVar127);
          auVar124 = auVar239._0_32_;
          auVar109 = vfmadd231ps_avx512vl(auVar109,auVar125,auVar124);
          auVar103 = vfmadd231ps_fma(auVar119,auVar125,local_a0);
          auVar126 = auVar241._0_32_;
          auVar112 = vfmadd231ps_avx512vl(auVar108,auVar123,auVar126);
          local_4e0 = auVar242._0_32_;
          auVar114 = vfmadd231ps_avx512vl(auVar109,auVar123,local_4e0);
          auVar108 = *(undefined1 (*) [32])(bspline_basis1 + lVar91 * 4 + lVar29);
          auVar109 = *(undefined1 (*) [32])(lVar29 + 0x222e3cc + lVar91 * 4);
          auVar103 = vfmadd231ps_fma(ZEXT1632(auVar103),auVar123,local_80);
          auVar119 = *(undefined1 (*) [32])(lVar29 + 0x222e850 + lVar91 * 4);
          auVar110 = *(undefined1 (*) [32])(lVar29 + 0x222ecd4 + lVar91 * 4);
          auVar113 = vmulps_avx512vl(local_600,auVar110);
          auVar111 = vmulps_avx512vl(local_620,auVar110);
          auVar54._4_4_ = auVar110._4_4_ * (float)local_e0._4_4_;
          auVar54._0_4_ = auVar110._0_4_ * (float)local_e0._0_4_;
          auVar54._8_4_ = auVar110._8_4_ * fStack_d8;
          auVar54._12_4_ = auVar110._12_4_ * fStack_d4;
          auVar54._16_4_ = auVar110._16_4_ * fStack_d0;
          auVar54._20_4_ = auVar110._20_4_ * fStack_cc;
          auVar54._24_4_ = auVar110._24_4_ * fStack_c8;
          auVar54._28_4_ = uStack_c4;
          auVar113 = vfmadd231ps_avx512vl(auVar113,auVar119,auVar128);
          auVar111 = vfmadd231ps_avx512vl(auVar111,auVar119,local_5e0);
          auVar115 = vfmadd231ps_avx512vl(auVar54,auVar119,local_c0);
          auVar113 = vfmadd231ps_avx512vl(auVar113,auVar109,auVar127);
          auVar111 = vfmadd231ps_avx512vl(auVar111,auVar109,auVar124);
          auVar102 = vfmadd231ps_fma(auVar115,auVar109,local_a0);
          auVar115 = vfmadd231ps_avx512vl(auVar113,auVar108,auVar126);
          auVar116 = vfmadd231ps_avx512vl(auVar111,auVar108,local_4e0);
          auVar102 = vfmadd231ps_fma(ZEXT1632(auVar102),auVar108,local_80);
          auVar117 = vmaxps_avx512vl(ZEXT1632(auVar103),ZEXT1632(auVar102));
          auVar113 = vsubps_avx(auVar115,auVar112);
          auVar111 = vsubps_avx(auVar116,auVar114);
          auVar118 = vmulps_avx512vl(auVar114,auVar113);
          auVar122 = vmulps_avx512vl(auVar112,auVar111);
          auVar118 = vsubps_avx512vl(auVar118,auVar122);
          auVar122 = vmulps_avx512vl(auVar111,auVar111);
          auVar122 = vfmadd231ps_avx512vl(auVar122,auVar113,auVar113);
          auVar117 = vmulps_avx512vl(auVar117,auVar117);
          auVar117 = vmulps_avx512vl(auVar117,auVar122);
          auVar118 = vmulps_avx512vl(auVar118,auVar118);
          uVar157 = vcmpps_avx512vl(auVar118,auVar117,2);
          local_3b0 = (byte)uVar26 & (byte)uVar157;
          if (local_3b0 == 0) {
            auVar240 = ZEXT3264(auVar124);
            auVar249 = ZEXT3264(auVar128);
          }
          else {
            auVar110 = vmulps_avx512vl(local_540,auVar110);
            auVar119 = vfmadd213ps_avx512vl(auVar119,local_140,auVar110);
            auVar109 = vfmadd213ps_avx512vl(auVar109,local_120,auVar119);
            auVar108 = vfmadd213ps_avx512vl(auVar108,local_100,auVar109);
            auVar120 = vmulps_avx512vl(local_540,auVar120);
            auVar121 = vfmadd213ps_avx512vl(auVar121,local_140,auVar120);
            auVar125 = vfmadd213ps_avx512vl(auVar125,local_120,auVar121);
            auVar109 = vfmadd213ps_avx512vl(auVar123,local_100,auVar125);
            auVar123 = *(undefined1 (*) [32])(lVar29 + 0x222cd38 + lVar91 * 4);
            auVar125 = *(undefined1 (*) [32])(lVar29 + 0x222d1bc + lVar91 * 4);
            auVar121 = *(undefined1 (*) [32])(lVar29 + 0x222d640 + lVar91 * 4);
            auVar120 = *(undefined1 (*) [32])(lVar29 + 0x222dac4 + lVar91 * 4);
            auVar119 = vmulps_avx512vl(local_600,auVar120);
            auVar110 = vmulps_avx512vl(local_620,auVar120);
            auVar120 = vmulps_avx512vl(local_540,auVar120);
            auVar119 = vfmadd231ps_avx512vl(auVar119,auVar121,auVar128);
            auVar110 = vfmadd231ps_avx512vl(auVar110,auVar121,local_5e0);
            auVar121 = vfmadd231ps_avx512vl(auVar120,local_140,auVar121);
            auVar120 = vfmadd231ps_avx512vl(auVar119,auVar125,auVar127);
            auVar119 = vfmadd231ps_avx512vl(auVar110,auVar125,auVar124);
            auVar125 = vfmadd231ps_avx512vl(auVar121,local_120,auVar125);
            auVar120 = vfmadd231ps_avx512vl(auVar120,auVar123,auVar126);
            auVar119 = vfmadd231ps_avx512vl(auVar119,auVar123,local_4e0);
            auVar110 = vfmadd231ps_avx512vl(auVar125,local_100,auVar123);
            auVar123 = *(undefined1 (*) [32])(lVar29 + 0x222f158 + lVar91 * 4);
            auVar125 = *(undefined1 (*) [32])(lVar29 + 0x222fa60 + lVar91 * 4);
            auVar121 = *(undefined1 (*) [32])(lVar29 + 0x222fee4 + lVar91 * 4);
            auVar117 = vmulps_avx512vl(local_600,auVar121);
            auVar118 = vmulps_avx512vl(local_620,auVar121);
            auVar121 = vmulps_avx512vl(local_540,auVar121);
            auVar117 = vfmadd231ps_avx512vl(auVar117,auVar125,auVar128);
            auVar118 = vfmadd231ps_avx512vl(auVar118,auVar125,local_5e0);
            auVar121 = vfmadd231ps_avx512vl(auVar121,local_140,auVar125);
            auVar125 = *(undefined1 (*) [32])(lVar29 + 0x222f5dc + lVar91 * 4);
            auVar117 = vfmadd231ps_avx512vl(auVar117,auVar125,auVar127);
            auVar118 = vfmadd231ps_avx512vl(auVar118,auVar125,auVar124);
            auVar125 = vfmadd231ps_avx512vl(auVar121,local_120,auVar125);
            auVar121 = vfmadd231ps_avx512vl(auVar117,auVar123,auVar126);
            auVar117 = vfmadd231ps_avx512vl(auVar118,auVar123,local_4e0);
            auVar125 = vfmadd231ps_avx512vl(auVar125,local_100,auVar123);
            auVar118 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
            vandps_avx512vl(auVar120,auVar118);
            vandps_avx512vl(auVar119,auVar118);
            auVar123 = vmaxps_avx(auVar118,auVar118);
            vandps_avx512vl(auVar110,auVar118);
            auVar123 = vmaxps_avx(auVar123,auVar118);
            auVar85._4_4_ = fStack_55c;
            auVar85._0_4_ = local_560;
            auVar85._8_4_ = fStack_558;
            auVar85._12_4_ = fStack_554;
            auVar85._16_4_ = fStack_550;
            auVar85._20_4_ = fStack_54c;
            auVar85._24_4_ = fStack_548;
            auVar85._28_4_ = fStack_544;
            uVar89 = vcmpps_avx512vl(auVar123,auVar85,1);
            bVar13 = (bool)((byte)uVar89 & 1);
            auVar135._0_4_ = (float)((uint)bVar13 * auVar113._0_4_ | (uint)!bVar13 * auVar120._0_4_)
            ;
            bVar13 = (bool)((byte)(uVar89 >> 1) & 1);
            auVar135._4_4_ = (float)((uint)bVar13 * auVar113._4_4_ | (uint)!bVar13 * auVar120._4_4_)
            ;
            bVar13 = (bool)((byte)(uVar89 >> 2) & 1);
            auVar135._8_4_ = (float)((uint)bVar13 * auVar113._8_4_ | (uint)!bVar13 * auVar120._8_4_)
            ;
            bVar13 = (bool)((byte)(uVar89 >> 3) & 1);
            auVar135._12_4_ =
                 (float)((uint)bVar13 * auVar113._12_4_ | (uint)!bVar13 * auVar120._12_4_);
            bVar13 = (bool)((byte)(uVar89 >> 4) & 1);
            auVar135._16_4_ =
                 (float)((uint)bVar13 * auVar113._16_4_ | (uint)!bVar13 * auVar120._16_4_);
            bVar13 = (bool)((byte)(uVar89 >> 5) & 1);
            auVar135._20_4_ =
                 (float)((uint)bVar13 * auVar113._20_4_ | (uint)!bVar13 * auVar120._20_4_);
            bVar13 = (bool)((byte)(uVar89 >> 6) & 1);
            auVar135._24_4_ =
                 (float)((uint)bVar13 * auVar113._24_4_ | (uint)!bVar13 * auVar120._24_4_);
            bVar13 = SUB81(uVar89 >> 7,0);
            auVar135._28_4_ = (uint)bVar13 * auVar113._28_4_ | (uint)!bVar13 * auVar120._28_4_;
            bVar13 = (bool)((byte)uVar89 & 1);
            auVar136._0_4_ = (float)((uint)bVar13 * auVar111._0_4_ | (uint)!bVar13 * auVar119._0_4_)
            ;
            bVar13 = (bool)((byte)(uVar89 >> 1) & 1);
            auVar136._4_4_ = (float)((uint)bVar13 * auVar111._4_4_ | (uint)!bVar13 * auVar119._4_4_)
            ;
            bVar13 = (bool)((byte)(uVar89 >> 2) & 1);
            auVar136._8_4_ = (float)((uint)bVar13 * auVar111._8_4_ | (uint)!bVar13 * auVar119._8_4_)
            ;
            bVar13 = (bool)((byte)(uVar89 >> 3) & 1);
            auVar136._12_4_ =
                 (float)((uint)bVar13 * auVar111._12_4_ | (uint)!bVar13 * auVar119._12_4_);
            bVar13 = (bool)((byte)(uVar89 >> 4) & 1);
            auVar136._16_4_ =
                 (float)((uint)bVar13 * auVar111._16_4_ | (uint)!bVar13 * auVar119._16_4_);
            bVar13 = (bool)((byte)(uVar89 >> 5) & 1);
            auVar136._20_4_ =
                 (float)((uint)bVar13 * auVar111._20_4_ | (uint)!bVar13 * auVar119._20_4_);
            bVar13 = (bool)((byte)(uVar89 >> 6) & 1);
            auVar136._24_4_ =
                 (float)((uint)bVar13 * auVar111._24_4_ | (uint)!bVar13 * auVar119._24_4_);
            bVar13 = SUB81(uVar89 >> 7,0);
            auVar136._28_4_ = (uint)bVar13 * auVar111._28_4_ | (uint)!bVar13 * auVar119._28_4_;
            vandps_avx512vl(auVar121,auVar118);
            vandps_avx512vl(auVar117,auVar118);
            auVar123 = vmaxps_avx(auVar136,auVar136);
            vandps_avx512vl(auVar125,auVar118);
            auVar123 = vmaxps_avx(auVar123,auVar136);
            uVar89 = vcmpps_avx512vl(auVar123,auVar85,1);
            bVar13 = (bool)((byte)uVar89 & 1);
            auVar137._0_4_ = (uint)bVar13 * auVar113._0_4_ | (uint)!bVar13 * auVar121._0_4_;
            bVar13 = (bool)((byte)(uVar89 >> 1) & 1);
            auVar137._4_4_ = (uint)bVar13 * auVar113._4_4_ | (uint)!bVar13 * auVar121._4_4_;
            bVar13 = (bool)((byte)(uVar89 >> 2) & 1);
            auVar137._8_4_ = (uint)bVar13 * auVar113._8_4_ | (uint)!bVar13 * auVar121._8_4_;
            bVar13 = (bool)((byte)(uVar89 >> 3) & 1);
            auVar137._12_4_ = (uint)bVar13 * auVar113._12_4_ | (uint)!bVar13 * auVar121._12_4_;
            bVar13 = (bool)((byte)(uVar89 >> 4) & 1);
            auVar137._16_4_ = (uint)bVar13 * auVar113._16_4_ | (uint)!bVar13 * auVar121._16_4_;
            bVar13 = (bool)((byte)(uVar89 >> 5) & 1);
            auVar137._20_4_ = (uint)bVar13 * auVar113._20_4_ | (uint)!bVar13 * auVar121._20_4_;
            bVar13 = (bool)((byte)(uVar89 >> 6) & 1);
            auVar137._24_4_ = (uint)bVar13 * auVar113._24_4_ | (uint)!bVar13 * auVar121._24_4_;
            bVar13 = SUB81(uVar89 >> 7,0);
            auVar137._28_4_ = (uint)bVar13 * auVar113._28_4_ | (uint)!bVar13 * auVar121._28_4_;
            bVar13 = (bool)((byte)uVar89 & 1);
            auVar138._0_4_ = (float)((uint)bVar13 * auVar111._0_4_ | (uint)!bVar13 * auVar117._0_4_)
            ;
            bVar13 = (bool)((byte)(uVar89 >> 1) & 1);
            auVar138._4_4_ = (float)((uint)bVar13 * auVar111._4_4_ | (uint)!bVar13 * auVar117._4_4_)
            ;
            bVar13 = (bool)((byte)(uVar89 >> 2) & 1);
            auVar138._8_4_ = (float)((uint)bVar13 * auVar111._8_4_ | (uint)!bVar13 * auVar117._8_4_)
            ;
            bVar13 = (bool)((byte)(uVar89 >> 3) & 1);
            auVar138._12_4_ =
                 (float)((uint)bVar13 * auVar111._12_4_ | (uint)!bVar13 * auVar117._12_4_);
            bVar13 = (bool)((byte)(uVar89 >> 4) & 1);
            auVar138._16_4_ =
                 (float)((uint)bVar13 * auVar111._16_4_ | (uint)!bVar13 * auVar117._16_4_);
            bVar13 = (bool)((byte)(uVar89 >> 5) & 1);
            auVar138._20_4_ =
                 (float)((uint)bVar13 * auVar111._20_4_ | (uint)!bVar13 * auVar117._20_4_);
            bVar13 = (bool)((byte)(uVar89 >> 6) & 1);
            auVar138._24_4_ =
                 (float)((uint)bVar13 * auVar111._24_4_ | (uint)!bVar13 * auVar117._24_4_);
            bVar13 = SUB81(uVar89 >> 7,0);
            auVar138._28_4_ = (uint)bVar13 * auVar111._28_4_ | (uint)!bVar13 * auVar117._28_4_;
            auVar229._8_4_ = 0x80000000;
            auVar229._0_8_ = 0x8000000080000000;
            auVar229._12_4_ = 0x80000000;
            auVar229._16_4_ = 0x80000000;
            auVar229._20_4_ = 0x80000000;
            auVar229._24_4_ = 0x80000000;
            auVar229._28_4_ = 0x80000000;
            auVar123 = vxorps_avx512vl(auVar137,auVar229);
            auVar117 = auVar245._0_32_;
            auVar125 = vfmadd213ps_avx512vl(auVar135,auVar135,auVar117);
            auVar104 = vfmadd231ps_fma(auVar125,auVar136,auVar136);
            auVar125 = vrsqrt14ps_avx512vl(ZEXT1632(auVar104));
            auVar238._8_4_ = 0xbf000000;
            auVar238._0_8_ = 0xbf000000bf000000;
            auVar238._12_4_ = 0xbf000000;
            auVar238._16_4_ = 0xbf000000;
            auVar238._20_4_ = 0xbf000000;
            auVar238._24_4_ = 0xbf000000;
            auVar238._28_4_ = 0xbf000000;
            fVar193 = auVar125._0_4_;
            fVar209 = auVar125._4_4_;
            fVar192 = auVar125._8_4_;
            fVar208 = auVar125._12_4_;
            fVar210 = auVar125._16_4_;
            fVar211 = auVar125._20_4_;
            fVar187 = auVar125._24_4_;
            auVar55._4_4_ = fVar209 * fVar209 * fVar209 * auVar104._4_4_ * -0.5;
            auVar55._0_4_ = fVar193 * fVar193 * fVar193 * auVar104._0_4_ * -0.5;
            auVar55._8_4_ = fVar192 * fVar192 * fVar192 * auVar104._8_4_ * -0.5;
            auVar55._12_4_ = fVar208 * fVar208 * fVar208 * auVar104._12_4_ * -0.5;
            auVar55._16_4_ = fVar210 * fVar210 * fVar210 * -0.0;
            auVar55._20_4_ = fVar211 * fVar211 * fVar211 * -0.0;
            auVar55._24_4_ = fVar187 * fVar187 * fVar187 * -0.0;
            auVar55._28_4_ = auVar136._28_4_;
            auVar121 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
            auVar125 = vfmadd231ps_avx512vl(auVar55,auVar121,auVar125);
            auVar56._4_4_ = auVar136._4_4_ * auVar125._4_4_;
            auVar56._0_4_ = auVar136._0_4_ * auVar125._0_4_;
            auVar56._8_4_ = auVar136._8_4_ * auVar125._8_4_;
            auVar56._12_4_ = auVar136._12_4_ * auVar125._12_4_;
            auVar56._16_4_ = auVar136._16_4_ * auVar125._16_4_;
            auVar56._20_4_ = auVar136._20_4_ * auVar125._20_4_;
            auVar56._24_4_ = auVar136._24_4_ * auVar125._24_4_;
            auVar56._28_4_ = 0;
            auVar57._4_4_ = auVar125._4_4_ * -auVar135._4_4_;
            auVar57._0_4_ = auVar125._0_4_ * -auVar135._0_4_;
            auVar57._8_4_ = auVar125._8_4_ * -auVar135._8_4_;
            auVar57._12_4_ = auVar125._12_4_ * -auVar135._12_4_;
            auVar57._16_4_ = auVar125._16_4_ * -auVar135._16_4_;
            auVar57._20_4_ = auVar125._20_4_ * -auVar135._20_4_;
            auVar57._24_4_ = auVar125._24_4_ * -auVar135._24_4_;
            auVar57._28_4_ = auVar136._28_4_;
            auVar120 = vmulps_avx512vl(auVar125,auVar117);
            auVar125 = vfmadd213ps_avx512vl(auVar137,auVar137,auVar117);
            auVar125 = vfmadd231ps_avx512vl(auVar125,auVar138,auVar138);
            auVar119 = vrsqrt14ps_avx512vl(auVar125);
            auVar125 = vmulps_avx512vl(auVar125,auVar238);
            fVar193 = auVar119._0_4_;
            fVar209 = auVar119._4_4_;
            fVar192 = auVar119._8_4_;
            fVar208 = auVar119._12_4_;
            fVar210 = auVar119._16_4_;
            fVar211 = auVar119._20_4_;
            fVar187 = auVar119._24_4_;
            auVar58._4_4_ = fVar209 * fVar209 * fVar209 * auVar125._4_4_;
            auVar58._0_4_ = fVar193 * fVar193 * fVar193 * auVar125._0_4_;
            auVar58._8_4_ = fVar192 * fVar192 * fVar192 * auVar125._8_4_;
            auVar58._12_4_ = fVar208 * fVar208 * fVar208 * auVar125._12_4_;
            auVar58._16_4_ = fVar210 * fVar210 * fVar210 * auVar125._16_4_;
            auVar58._20_4_ = fVar211 * fVar211 * fVar211 * auVar125._20_4_;
            auVar58._24_4_ = fVar187 * fVar187 * fVar187 * auVar125._24_4_;
            auVar58._28_4_ = auVar125._28_4_;
            auVar125 = vfmadd231ps_avx512vl(auVar58,auVar121,auVar119);
            auVar59._4_4_ = auVar138._4_4_ * auVar125._4_4_;
            auVar59._0_4_ = auVar138._0_4_ * auVar125._0_4_;
            auVar59._8_4_ = auVar138._8_4_ * auVar125._8_4_;
            auVar59._12_4_ = auVar138._12_4_ * auVar125._12_4_;
            auVar59._16_4_ = auVar138._16_4_ * auVar125._16_4_;
            auVar59._20_4_ = auVar138._20_4_ * auVar125._20_4_;
            auVar59._24_4_ = auVar138._24_4_ * auVar125._24_4_;
            auVar59._28_4_ = auVar119._28_4_;
            auVar60._4_4_ = auVar125._4_4_ * auVar123._4_4_;
            auVar60._0_4_ = auVar125._0_4_ * auVar123._0_4_;
            auVar60._8_4_ = auVar125._8_4_ * auVar123._8_4_;
            auVar60._12_4_ = auVar125._12_4_ * auVar123._12_4_;
            auVar60._16_4_ = auVar125._16_4_ * auVar123._16_4_;
            auVar60._20_4_ = auVar125._20_4_ * auVar123._20_4_;
            auVar60._24_4_ = auVar125._24_4_ * auVar123._24_4_;
            auVar60._28_4_ = auVar123._28_4_;
            auVar123 = vmulps_avx512vl(auVar125,auVar117);
            auVar104 = vfmadd213ps_fma(auVar56,ZEXT1632(auVar103),auVar112);
            auVar125 = ZEXT1632(auVar103);
            auVar244 = vfmadd213ps_fma(auVar57,auVar125,auVar114);
            auVar121 = vfmadd213ps_avx512vl(auVar120,auVar125,auVar109);
            auVar119 = vfmadd213ps_avx512vl(auVar59,ZEXT1632(auVar102),auVar115);
            auVar25 = vfnmadd213ps_fma(auVar56,auVar125,auVar112);
            auVar110 = ZEXT1632(auVar102);
            auVar21 = vfmadd213ps_fma(auVar60,auVar110,auVar116);
            auVar105 = vfnmadd213ps_fma(auVar57,auVar125,auVar114);
            auVar22 = vfmadd213ps_fma(auVar123,auVar110,auVar108);
            auVar114 = ZEXT1632(auVar103);
            auVar107 = vfnmadd231ps_fma(auVar109,auVar114,auVar120);
            auVar106 = vfnmadd213ps_fma(auVar59,auVar110,auVar115);
            auVar31 = vfnmadd213ps_fma(auVar60,auVar110,auVar116);
            auVar30 = vfnmadd231ps_fma(auVar108,ZEXT1632(auVar102),auVar123);
            auVar108 = vsubps_avx512vl(auVar119,ZEXT1632(auVar25));
            auVar123 = vsubps_avx(ZEXT1632(auVar21),ZEXT1632(auVar105));
            auVar125 = vsubps_avx(ZEXT1632(auVar22),ZEXT1632(auVar107));
            auVar61._4_4_ = auVar123._4_4_ * auVar107._4_4_;
            auVar61._0_4_ = auVar123._0_4_ * auVar107._0_4_;
            auVar61._8_4_ = auVar123._8_4_ * auVar107._8_4_;
            auVar61._12_4_ = auVar123._12_4_ * auVar107._12_4_;
            auVar61._16_4_ = auVar123._16_4_ * 0.0;
            auVar61._20_4_ = auVar123._20_4_ * 0.0;
            auVar61._24_4_ = auVar123._24_4_ * 0.0;
            auVar61._28_4_ = auVar120._28_4_;
            auVar103 = vfmsub231ps_fma(auVar61,ZEXT1632(auVar105),auVar125);
            auVar62._4_4_ = auVar125._4_4_ * auVar25._4_4_;
            auVar62._0_4_ = auVar125._0_4_ * auVar25._0_4_;
            auVar62._8_4_ = auVar125._8_4_ * auVar25._8_4_;
            auVar62._12_4_ = auVar125._12_4_ * auVar25._12_4_;
            auVar62._16_4_ = auVar125._16_4_ * 0.0;
            auVar62._20_4_ = auVar125._20_4_ * 0.0;
            auVar62._24_4_ = auVar125._24_4_ * 0.0;
            auVar62._28_4_ = auVar125._28_4_;
            auVar23 = vfmsub231ps_fma(auVar62,ZEXT1632(auVar107),auVar108);
            auVar63._4_4_ = auVar105._4_4_ * auVar108._4_4_;
            auVar63._0_4_ = auVar105._0_4_ * auVar108._0_4_;
            auVar63._8_4_ = auVar105._8_4_ * auVar108._8_4_;
            auVar63._12_4_ = auVar105._12_4_ * auVar108._12_4_;
            auVar63._16_4_ = auVar108._16_4_ * 0.0;
            auVar63._20_4_ = auVar108._20_4_ * 0.0;
            auVar63._24_4_ = auVar108._24_4_ * 0.0;
            auVar63._28_4_ = auVar108._28_4_;
            auVar24 = vfmsub231ps_fma(auVar63,ZEXT1632(auVar25),auVar123);
            auVar123 = vfmadd231ps_avx512vl(ZEXT1632(auVar24),auVar117,ZEXT1632(auVar23));
            auVar123 = vfmadd231ps_avx512vl(auVar123,auVar117,ZEXT1632(auVar103));
            uVar89 = vcmpps_avx512vl(auVar123,auVar117,2);
            bVar96 = (byte)uVar89;
            fVar98 = (float)((uint)(bVar96 & 1) * auVar104._0_4_ |
                            (uint)!(bool)(bVar96 & 1) * auVar106._0_4_);
            bVar13 = (bool)((byte)(uVar89 >> 1) & 1);
            fVar150 = (float)((uint)bVar13 * auVar104._4_4_ | (uint)!bVar13 * auVar106._4_4_);
            bVar13 = (bool)((byte)(uVar89 >> 2) & 1);
            fVar152 = (float)((uint)bVar13 * auVar104._8_4_ | (uint)!bVar13 * auVar106._8_4_);
            bVar13 = (bool)((byte)(uVar89 >> 3) & 1);
            fVar154 = (float)((uint)bVar13 * auVar104._12_4_ | (uint)!bVar13 * auVar106._12_4_);
            auVar110 = ZEXT1632(CONCAT412(fVar154,CONCAT48(fVar152,CONCAT44(fVar150,fVar98))));
            fVar149 = (float)((uint)(bVar96 & 1) * auVar244._0_4_ |
                             (uint)!(bool)(bVar96 & 1) * auVar31._0_4_);
            bVar13 = (bool)((byte)(uVar89 >> 1) & 1);
            fVar151 = (float)((uint)bVar13 * auVar244._4_4_ | (uint)!bVar13 * auVar31._4_4_);
            bVar13 = (bool)((byte)(uVar89 >> 2) & 1);
            fVar153 = (float)((uint)bVar13 * auVar244._8_4_ | (uint)!bVar13 * auVar31._8_4_);
            bVar13 = (bool)((byte)(uVar89 >> 3) & 1);
            fVar155 = (float)((uint)bVar13 * auVar244._12_4_ | (uint)!bVar13 * auVar31._12_4_);
            auVar113 = ZEXT1632(CONCAT412(fVar155,CONCAT48(fVar153,CONCAT44(fVar151,fVar149))));
            auVar139._0_4_ =
                 (float)((uint)(bVar96 & 1) * auVar121._0_4_ |
                        (uint)!(bool)(bVar96 & 1) * auVar30._0_4_);
            bVar13 = (bool)((byte)(uVar89 >> 1) & 1);
            auVar139._4_4_ = (float)((uint)bVar13 * auVar121._4_4_ | (uint)!bVar13 * auVar30._4_4_);
            bVar13 = (bool)((byte)(uVar89 >> 2) & 1);
            auVar139._8_4_ = (float)((uint)bVar13 * auVar121._8_4_ | (uint)!bVar13 * auVar30._8_4_);
            bVar13 = (bool)((byte)(uVar89 >> 3) & 1);
            auVar139._12_4_ =
                 (float)((uint)bVar13 * auVar121._12_4_ | (uint)!bVar13 * auVar30._12_4_);
            fVar193 = (float)((uint)((byte)(uVar89 >> 4) & 1) * auVar121._16_4_);
            auVar139._16_4_ = fVar193;
            fVar192 = (float)((uint)((byte)(uVar89 >> 5) & 1) * auVar121._20_4_);
            auVar139._20_4_ = fVar192;
            fVar209 = (float)((uint)((byte)(uVar89 >> 6) & 1) * auVar121._24_4_);
            auVar139._24_4_ = fVar209;
            iVar1 = (uint)(byte)(uVar89 >> 7) * auVar121._28_4_;
            auVar139._28_4_ = iVar1;
            auVar123 = vblendmps_avx512vl(ZEXT1632(auVar25),auVar119);
            auVar140._0_4_ =
                 (uint)(bVar96 & 1) * auVar123._0_4_ | (uint)!(bool)(bVar96 & 1) * auVar103._0_4_;
            bVar13 = (bool)((byte)(uVar89 >> 1) & 1);
            auVar140._4_4_ = (uint)bVar13 * auVar123._4_4_ | (uint)!bVar13 * auVar103._4_4_;
            bVar13 = (bool)((byte)(uVar89 >> 2) & 1);
            auVar140._8_4_ = (uint)bVar13 * auVar123._8_4_ | (uint)!bVar13 * auVar103._8_4_;
            bVar13 = (bool)((byte)(uVar89 >> 3) & 1);
            auVar140._12_4_ = (uint)bVar13 * auVar123._12_4_ | (uint)!bVar13 * auVar103._12_4_;
            auVar140._16_4_ = (uint)((byte)(uVar89 >> 4) & 1) * auVar123._16_4_;
            auVar140._20_4_ = (uint)((byte)(uVar89 >> 5) & 1) * auVar123._20_4_;
            auVar140._24_4_ = (uint)((byte)(uVar89 >> 6) & 1) * auVar123._24_4_;
            auVar140._28_4_ = (uint)(byte)(uVar89 >> 7) * auVar123._28_4_;
            auVar123 = vblendmps_avx512vl(ZEXT1632(auVar105),ZEXT1632(auVar21));
            auVar141._0_4_ =
                 (float)((uint)(bVar96 & 1) * auVar123._0_4_ |
                        (uint)!(bool)(bVar96 & 1) * auVar104._0_4_);
            bVar13 = (bool)((byte)(uVar89 >> 1) & 1);
            auVar141._4_4_ = (float)((uint)bVar13 * auVar123._4_4_ | (uint)!bVar13 * auVar104._4_4_)
            ;
            bVar13 = (bool)((byte)(uVar89 >> 2) & 1);
            auVar141._8_4_ = (float)((uint)bVar13 * auVar123._8_4_ | (uint)!bVar13 * auVar104._8_4_)
            ;
            bVar13 = (bool)((byte)(uVar89 >> 3) & 1);
            auVar141._12_4_ =
                 (float)((uint)bVar13 * auVar123._12_4_ | (uint)!bVar13 * auVar104._12_4_);
            fVar210 = (float)((uint)((byte)(uVar89 >> 4) & 1) * auVar123._16_4_);
            auVar141._16_4_ = fVar210;
            fVar211 = (float)((uint)((byte)(uVar89 >> 5) & 1) * auVar123._20_4_);
            auVar141._20_4_ = fVar211;
            fVar208 = (float)((uint)((byte)(uVar89 >> 6) & 1) * auVar123._24_4_);
            auVar141._24_4_ = fVar208;
            auVar141._28_4_ = (uint)(byte)(uVar89 >> 7) * auVar123._28_4_;
            auVar123 = vblendmps_avx512vl(ZEXT1632(auVar107),ZEXT1632(auVar22));
            auVar142._0_4_ =
                 (float)((uint)(bVar96 & 1) * auVar123._0_4_ |
                        (uint)!(bool)(bVar96 & 1) * auVar244._0_4_);
            bVar13 = (bool)((byte)(uVar89 >> 1) & 1);
            auVar142._4_4_ = (float)((uint)bVar13 * auVar123._4_4_ | (uint)!bVar13 * auVar244._4_4_)
            ;
            bVar13 = (bool)((byte)(uVar89 >> 2) & 1);
            auVar142._8_4_ = (float)((uint)bVar13 * auVar123._8_4_ | (uint)!bVar13 * auVar244._8_4_)
            ;
            bVar13 = (bool)((byte)(uVar89 >> 3) & 1);
            auVar142._12_4_ =
                 (float)((uint)bVar13 * auVar123._12_4_ | (uint)!bVar13 * auVar244._12_4_);
            fVar97 = (float)((uint)((byte)(uVar89 >> 4) & 1) * auVar123._16_4_);
            auVar142._16_4_ = fVar97;
            fVar191 = (float)((uint)((byte)(uVar89 >> 5) & 1) * auVar123._20_4_);
            auVar142._20_4_ = fVar191;
            fVar187 = (float)((uint)((byte)(uVar89 >> 6) & 1) * auVar123._24_4_);
            auVar142._24_4_ = fVar187;
            iVar2 = (uint)(byte)(uVar89 >> 7) * auVar123._28_4_;
            auVar142._28_4_ = iVar2;
            auVar143._0_4_ =
                 (uint)(bVar96 & 1) * (int)auVar25._0_4_ |
                 (uint)!(bool)(bVar96 & 1) * auVar119._0_4_;
            bVar13 = (bool)((byte)(uVar89 >> 1) & 1);
            auVar143._4_4_ = (uint)bVar13 * (int)auVar25._4_4_ | (uint)!bVar13 * auVar119._4_4_;
            bVar13 = (bool)((byte)(uVar89 >> 2) & 1);
            auVar143._8_4_ = (uint)bVar13 * (int)auVar25._8_4_ | (uint)!bVar13 * auVar119._8_4_;
            bVar13 = (bool)((byte)(uVar89 >> 3) & 1);
            auVar143._12_4_ = (uint)bVar13 * (int)auVar25._12_4_ | (uint)!bVar13 * auVar119._12_4_;
            auVar143._16_4_ = (uint)!(bool)((byte)(uVar89 >> 4) & 1) * auVar119._16_4_;
            auVar143._20_4_ = (uint)!(bool)((byte)(uVar89 >> 5) & 1) * auVar119._20_4_;
            auVar143._24_4_ = (uint)!(bool)((byte)(uVar89 >> 6) & 1) * auVar119._24_4_;
            auVar143._28_4_ = (uint)!SUB81(uVar89 >> 7,0) * auVar119._28_4_;
            bVar13 = (bool)((byte)(uVar89 >> 1) & 1);
            bVar15 = (bool)((byte)(uVar89 >> 2) & 1);
            bVar17 = (bool)((byte)(uVar89 >> 3) & 1);
            bVar14 = (bool)((byte)(uVar89 >> 1) & 1);
            bVar16 = (bool)((byte)(uVar89 >> 2) & 1);
            bVar18 = (bool)((byte)(uVar89 >> 3) & 1);
            auVar119 = vsubps_avx512vl(auVar143,auVar110);
            auVar125 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar17 * (int)auVar105._12_4_ |
                                                     (uint)!bVar17 * auVar21._12_4_,
                                                     CONCAT48((uint)bVar15 * (int)auVar105._8_4_ |
                                                              (uint)!bVar15 * auVar21._8_4_,
                                                              CONCAT44((uint)bVar13 *
                                                                       (int)auVar105._4_4_ |
                                                                       (uint)!bVar13 * auVar21._4_4_
                                                                       ,(uint)(bVar96 & 1) *
                                                                        (int)auVar105._0_4_ |
                                                                        (uint)!(bool)(bVar96 & 1) *
                                                                        auVar21._0_4_)))),auVar113);
            auVar121 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar18 * (int)auVar107._12_4_ |
                                                     (uint)!bVar18 * auVar22._12_4_,
                                                     CONCAT48((uint)bVar16 * (int)auVar107._8_4_ |
                                                              (uint)!bVar16 * auVar22._8_4_,
                                                              CONCAT44((uint)bVar14 *
                                                                       (int)auVar107._4_4_ |
                                                                       (uint)!bVar14 * auVar22._4_4_
                                                                       ,(uint)(bVar96 & 1) *
                                                                        (int)auVar107._0_4_ |
                                                                        (uint)!(bool)(bVar96 & 1) *
                                                                        auVar22._0_4_)))),auVar139);
            auVar120 = vsubps_avx(auVar110,auVar140);
            auVar108 = vsubps_avx(auVar113,auVar141);
            auVar109 = vsubps_avx(auVar139,auVar142);
            auVar64._4_4_ = auVar121._4_4_ * fVar150;
            auVar64._0_4_ = auVar121._0_4_ * fVar98;
            auVar64._8_4_ = auVar121._8_4_ * fVar152;
            auVar64._12_4_ = auVar121._12_4_ * fVar154;
            auVar64._16_4_ = auVar121._16_4_ * 0.0;
            auVar64._20_4_ = auVar121._20_4_ * 0.0;
            auVar64._24_4_ = auVar121._24_4_ * 0.0;
            auVar64._28_4_ = 0;
            auVar103 = vfmsub231ps_fma(auVar64,auVar139,auVar119);
            auVar190._0_4_ = fVar149 * auVar119._0_4_;
            auVar190._4_4_ = fVar151 * auVar119._4_4_;
            auVar190._8_4_ = fVar153 * auVar119._8_4_;
            auVar190._12_4_ = fVar155 * auVar119._12_4_;
            auVar190._16_4_ = auVar119._16_4_ * 0.0;
            auVar190._20_4_ = auVar119._20_4_ * 0.0;
            auVar190._24_4_ = auVar119._24_4_ * 0.0;
            auVar190._28_4_ = 0;
            auVar104 = vfmsub231ps_fma(auVar190,auVar110,auVar125);
            auVar123 = vfmadd231ps_avx512vl(ZEXT1632(auVar104),auVar117,ZEXT1632(auVar103));
            auVar204._0_4_ = auVar125._0_4_ * auVar139._0_4_;
            auVar204._4_4_ = auVar125._4_4_ * auVar139._4_4_;
            auVar204._8_4_ = auVar125._8_4_ * auVar139._8_4_;
            auVar204._12_4_ = auVar125._12_4_ * auVar139._12_4_;
            auVar204._16_4_ = auVar125._16_4_ * fVar193;
            auVar204._20_4_ = auVar125._20_4_ * fVar192;
            auVar204._24_4_ = auVar125._24_4_ * fVar209;
            auVar204._28_4_ = 0;
            auVar103 = vfmsub231ps_fma(auVar204,auVar113,auVar121);
            auVar111 = vfmadd231ps_avx512vl(auVar123,auVar117,ZEXT1632(auVar103));
            auVar123 = vmulps_avx512vl(auVar109,auVar140);
            auVar123 = vfmsub231ps_avx512vl(auVar123,auVar120,auVar142);
            auVar65._4_4_ = auVar108._4_4_ * auVar142._4_4_;
            auVar65._0_4_ = auVar108._0_4_ * auVar142._0_4_;
            auVar65._8_4_ = auVar108._8_4_ * auVar142._8_4_;
            auVar65._12_4_ = auVar108._12_4_ * auVar142._12_4_;
            auVar65._16_4_ = auVar108._16_4_ * fVar97;
            auVar65._20_4_ = auVar108._20_4_ * fVar191;
            auVar65._24_4_ = auVar108._24_4_ * fVar187;
            auVar65._28_4_ = iVar2;
            auVar103 = vfmsub231ps_fma(auVar65,auVar141,auVar109);
            auVar205._0_4_ = auVar141._0_4_ * auVar120._0_4_;
            auVar205._4_4_ = auVar141._4_4_ * auVar120._4_4_;
            auVar205._8_4_ = auVar141._8_4_ * auVar120._8_4_;
            auVar205._12_4_ = auVar141._12_4_ * auVar120._12_4_;
            auVar205._16_4_ = fVar210 * auVar120._16_4_;
            auVar205._20_4_ = fVar211 * auVar120._20_4_;
            auVar205._24_4_ = fVar208 * auVar120._24_4_;
            auVar205._28_4_ = 0;
            auVar104 = vfmsub231ps_fma(auVar205,auVar108,auVar140);
            auVar123 = vfmadd231ps_avx512vl(ZEXT1632(auVar104),auVar117,auVar123);
            auVar112 = vfmadd231ps_avx512vl(auVar123,auVar117,ZEXT1632(auVar103));
            auVar123 = vmaxps_avx(auVar111,auVar112);
            uVar157 = vcmpps_avx512vl(auVar123,auVar117,2);
            local_3b0 = local_3b0 & (byte)uVar157;
            if (local_3b0 == 0) {
LAB_01c4dc8a:
              local_3b0 = 0;
            }
            else {
              auVar66._4_4_ = auVar109._4_4_ * auVar125._4_4_;
              auVar66._0_4_ = auVar109._0_4_ * auVar125._0_4_;
              auVar66._8_4_ = auVar109._8_4_ * auVar125._8_4_;
              auVar66._12_4_ = auVar109._12_4_ * auVar125._12_4_;
              auVar66._16_4_ = auVar109._16_4_ * auVar125._16_4_;
              auVar66._20_4_ = auVar109._20_4_ * auVar125._20_4_;
              auVar66._24_4_ = auVar109._24_4_ * auVar125._24_4_;
              auVar66._28_4_ = auVar123._28_4_;
              auVar244 = vfmsub231ps_fma(auVar66,auVar108,auVar121);
              auVar67._4_4_ = auVar121._4_4_ * auVar120._4_4_;
              auVar67._0_4_ = auVar121._0_4_ * auVar120._0_4_;
              auVar67._8_4_ = auVar121._8_4_ * auVar120._8_4_;
              auVar67._12_4_ = auVar121._12_4_ * auVar120._12_4_;
              auVar67._16_4_ = auVar121._16_4_ * auVar120._16_4_;
              auVar67._20_4_ = auVar121._20_4_ * auVar120._20_4_;
              auVar67._24_4_ = auVar121._24_4_ * auVar120._24_4_;
              auVar67._28_4_ = auVar121._28_4_;
              auVar104 = vfmsub231ps_fma(auVar67,auVar119,auVar109);
              auVar68._4_4_ = auVar108._4_4_ * auVar119._4_4_;
              auVar68._0_4_ = auVar108._0_4_ * auVar119._0_4_;
              auVar68._8_4_ = auVar108._8_4_ * auVar119._8_4_;
              auVar68._12_4_ = auVar108._12_4_ * auVar119._12_4_;
              auVar68._16_4_ = auVar108._16_4_ * auVar119._16_4_;
              auVar68._20_4_ = auVar108._20_4_ * auVar119._20_4_;
              auVar68._24_4_ = auVar108._24_4_ * auVar119._24_4_;
              auVar68._28_4_ = auVar108._28_4_;
              auVar21 = vfmsub231ps_fma(auVar68,auVar120,auVar125);
              auVar103 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar104),ZEXT1632(auVar21));
              auVar123 = vfmadd231ps_avx512vl(ZEXT1632(auVar103),ZEXT1632(auVar244),auVar117);
              auVar125 = vrcp14ps_avx512vl(auVar123);
              auVar41._8_4_ = 0x3f800000;
              auVar41._0_8_ = &DAT_3f8000003f800000;
              auVar41._12_4_ = 0x3f800000;
              auVar41._16_4_ = 0x3f800000;
              auVar41._20_4_ = 0x3f800000;
              auVar41._24_4_ = 0x3f800000;
              auVar41._28_4_ = 0x3f800000;
              auVar121 = vfnmadd213ps_avx512vl(auVar125,auVar123,auVar41);
              auVar103 = vfmadd132ps_fma(auVar121,auVar125,auVar125);
              auVar69._4_4_ = auVar21._4_4_ * auVar139._4_4_;
              auVar69._0_4_ = auVar21._0_4_ * auVar139._0_4_;
              auVar69._8_4_ = auVar21._8_4_ * auVar139._8_4_;
              auVar69._12_4_ = auVar21._12_4_ * auVar139._12_4_;
              auVar69._16_4_ = fVar193 * 0.0;
              auVar69._20_4_ = fVar192 * 0.0;
              auVar69._24_4_ = fVar209 * 0.0;
              auVar69._28_4_ = iVar1;
              auVar104 = vfmadd231ps_fma(auVar69,auVar113,ZEXT1632(auVar104));
              auVar104 = vfmadd231ps_fma(ZEXT1632(auVar104),auVar110,ZEXT1632(auVar244));
              fVar193 = auVar103._0_4_;
              fVar209 = auVar103._4_4_;
              fVar192 = auVar103._8_4_;
              fVar208 = auVar103._12_4_;
              auVar125 = ZEXT1632(CONCAT412(auVar104._12_4_ * fVar208,
                                            CONCAT48(auVar104._8_4_ * fVar192,
                                                     CONCAT44(auVar104._4_4_ * fVar209,
                                                              auVar104._0_4_ * fVar193))));
              auVar86._4_4_ = uStack_49c;
              auVar86._0_4_ = local_4a0;
              auVar86._8_4_ = uStack_498;
              auVar86._12_4_ = uStack_494;
              auVar86._16_4_ = uStack_490;
              auVar86._20_4_ = uStack_48c;
              auVar86._24_4_ = uStack_488;
              auVar86._28_4_ = uStack_484;
              uVar157 = vcmpps_avx512vl(auVar125,auVar86,0xd);
              uVar156 = *(undefined4 *)(ray + k * 4 + 0x100);
              auVar42._4_4_ = uVar156;
              auVar42._0_4_ = uVar156;
              auVar42._8_4_ = uVar156;
              auVar42._12_4_ = uVar156;
              auVar42._16_4_ = uVar156;
              auVar42._20_4_ = uVar156;
              auVar42._24_4_ = uVar156;
              auVar42._28_4_ = uVar156;
              uVar26 = vcmpps_avx512vl(auVar125,auVar42,2);
              local_3b0 = (byte)uVar157 & (byte)uVar26 & local_3b0;
              if (local_3b0 == 0) goto LAB_01c4dc8a;
              uVar157 = vcmpps_avx512vl(auVar123,auVar117,4);
              if ((local_3b0 & (byte)uVar157) == 0) {
                local_3b0 = 0;
              }
              else {
                local_3b0 = local_3b0 & (byte)uVar157;
                fVar210 = auVar111._0_4_ * fVar193;
                fVar211 = auVar111._4_4_ * fVar209;
                auVar70._4_4_ = fVar211;
                auVar70._0_4_ = fVar210;
                fVar187 = auVar111._8_4_ * fVar192;
                auVar70._8_4_ = fVar187;
                fVar191 = auVar111._12_4_ * fVar208;
                auVar70._12_4_ = fVar191;
                fVar97 = auVar111._16_4_ * 0.0;
                auVar70._16_4_ = fVar97;
                fVar98 = auVar111._20_4_ * 0.0;
                auVar70._20_4_ = fVar98;
                fVar149 = auVar111._24_4_ * 0.0;
                auVar70._24_4_ = fVar149;
                auVar70._28_4_ = auVar111._28_4_;
                fVar193 = auVar112._0_4_ * fVar193;
                fVar209 = auVar112._4_4_ * fVar209;
                auVar71._4_4_ = fVar209;
                auVar71._0_4_ = fVar193;
                fVar192 = auVar112._8_4_ * fVar192;
                auVar71._8_4_ = fVar192;
                fVar208 = auVar112._12_4_ * fVar208;
                auVar71._12_4_ = fVar208;
                fVar150 = auVar112._16_4_ * 0.0;
                auVar71._16_4_ = fVar150;
                fVar151 = auVar112._20_4_ * 0.0;
                auVar71._20_4_ = fVar151;
                fVar152 = auVar112._24_4_ * 0.0;
                auVar71._24_4_ = fVar152;
                auVar71._28_4_ = auVar112._28_4_;
                auVar218._8_4_ = 0x3f800000;
                auVar218._0_8_ = &DAT_3f8000003f800000;
                auVar218._12_4_ = 0x3f800000;
                auVar218._16_4_ = 0x3f800000;
                auVar218._20_4_ = 0x3f800000;
                auVar218._24_4_ = 0x3f800000;
                auVar218._28_4_ = 0x3f800000;
                auVar123 = vsubps_avx(auVar218,auVar70);
                local_680._0_4_ =
                     (uint)(bVar96 & 1) * (int)fVar210 | (uint)!(bool)(bVar96 & 1) * auVar123._0_4_;
                bVar13 = (bool)((byte)(uVar89 >> 1) & 1);
                local_680._4_4_ = (uint)bVar13 * (int)fVar211 | (uint)!bVar13 * auVar123._4_4_;
                bVar13 = (bool)((byte)(uVar89 >> 2) & 1);
                local_680._8_4_ = (uint)bVar13 * (int)fVar187 | (uint)!bVar13 * auVar123._8_4_;
                bVar13 = (bool)((byte)(uVar89 >> 3) & 1);
                local_680._12_4_ = (uint)bVar13 * (int)fVar191 | (uint)!bVar13 * auVar123._12_4_;
                bVar13 = (bool)((byte)(uVar89 >> 4) & 1);
                local_680._16_4_ = (uint)bVar13 * (int)fVar97 | (uint)!bVar13 * auVar123._16_4_;
                bVar13 = (bool)((byte)(uVar89 >> 5) & 1);
                local_680._20_4_ = (uint)bVar13 * (int)fVar98 | (uint)!bVar13 * auVar123._20_4_;
                bVar13 = (bool)((byte)(uVar89 >> 6) & 1);
                local_680._24_4_ = (uint)bVar13 * (int)fVar149 | (uint)!bVar13 * auVar123._24_4_;
                bVar13 = SUB81(uVar89 >> 7,0);
                local_680._28_4_ = (uint)bVar13 * auVar111._28_4_ | (uint)!bVar13 * auVar123._28_4_;
                auVar123 = vsubps_avx(auVar218,auVar71);
                bVar13 = (bool)((byte)(uVar89 >> 1) & 1);
                bVar14 = (bool)((byte)(uVar89 >> 2) & 1);
                bVar15 = (bool)((byte)(uVar89 >> 3) & 1);
                bVar16 = (bool)((byte)(uVar89 >> 4) & 1);
                bVar17 = (bool)((byte)(uVar89 >> 5) & 1);
                bVar18 = (bool)((byte)(uVar89 >> 6) & 1);
                bVar19 = SUB81(uVar89 >> 7,0);
                local_300._4_4_ = (uint)bVar13 * (int)fVar209 | (uint)!bVar13 * auVar123._4_4_;
                local_300._0_4_ =
                     (uint)(bVar96 & 1) * (int)fVar193 | (uint)!(bool)(bVar96 & 1) * auVar123._0_4_;
                local_300._8_4_ = (uint)bVar14 * (int)fVar192 | (uint)!bVar14 * auVar123._8_4_;
                local_300._12_4_ = (uint)bVar15 * (int)fVar208 | (uint)!bVar15 * auVar123._12_4_;
                local_300._16_4_ = (uint)bVar16 * (int)fVar150 | (uint)!bVar16 * auVar123._16_4_;
                local_300._20_4_ = (uint)bVar17 * (int)fVar151 | (uint)!bVar17 * auVar123._20_4_;
                local_300._24_4_ = (uint)bVar18 * (int)fVar152 | (uint)!bVar18 * auVar123._24_4_;
                local_300._28_4_ = (uint)bVar19 * auVar112._28_4_ | (uint)!bVar19 * auVar123._28_4_;
                local_6a0 = auVar125;
              }
            }
            auVar249 = ZEXT3264(local_720);
            auVar240 = ZEXT3264(local_700);
            if (local_3b0 != 0) {
              auVar123 = vsubps_avx(ZEXT1632(auVar102),auVar114);
              auVar103 = vfmadd213ps_fma(auVar123,local_680,auVar114);
              uVar156 = *(undefined4 *)((long)pre->ray_space + k * 4 + -0x20);
              auVar43._4_4_ = uVar156;
              auVar43._0_4_ = uVar156;
              auVar43._8_4_ = uVar156;
              auVar43._12_4_ = uVar156;
              auVar43._16_4_ = uVar156;
              auVar43._20_4_ = uVar156;
              auVar43._24_4_ = uVar156;
              auVar43._28_4_ = uVar156;
              auVar123 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar103._12_4_ + auVar103._12_4_,
                                                            CONCAT48(auVar103._8_4_ + auVar103._8_4_
                                                                     ,CONCAT44(auVar103._4_4_ +
                                                                               auVar103._4_4_,
                                                                               auVar103._0_4_ +
                                                                               auVar103._0_4_)))),
                                         auVar43);
              uVar157 = vcmpps_avx512vl(local_6a0,auVar123,6);
              local_3b0 = local_3b0 & (byte)uVar157;
              if (local_3b0 != 0) {
                auVar168._8_4_ = 0xbf800000;
                auVar168._0_8_ = 0xbf800000bf800000;
                auVar168._12_4_ = 0xbf800000;
                auVar168._16_4_ = 0xbf800000;
                auVar168._20_4_ = 0xbf800000;
                auVar168._24_4_ = 0xbf800000;
                auVar168._28_4_ = 0xbf800000;
                auVar44._8_4_ = 0x40000000;
                auVar44._0_8_ = 0x4000000040000000;
                auVar44._12_4_ = 0x40000000;
                auVar44._16_4_ = 0x40000000;
                auVar44._20_4_ = 0x40000000;
                auVar44._24_4_ = 0x40000000;
                auVar44._28_4_ = 0x40000000;
                local_440 = vfmadd132ps_avx512vl(local_300,auVar168,auVar44);
                local_300 = local_440;
                auVar123 = local_300;
                local_400 = (undefined4)lVar91;
                local_3f0 = local_770;
                uStack_3e8 = uStack_768;
                local_3e0 = local_6b0._0_8_;
                uStack_3d8 = local_6b0._8_8_;
                local_3d0 = local_6c0._0_8_;
                uStack_3c8 = local_6c0._8_8_;
                local_3c0 = local_6d0;
                uStack_3b8 = uStack_6c8;
                pGVar93 = (context->scene->geometries).items[uVar94].ptr;
                local_300 = auVar123;
                if ((pGVar93->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
                  auVar103 = vcvtsi2ss_avx512f(auVar239._0_16_,local_400);
                  fVar193 = auVar103._0_4_;
                  local_3a0[0] = (fVar193 + local_680._0_4_ + 0.0) * (float)local_480._0_4_;
                  local_3a0[1] = (fVar193 + local_680._4_4_ + 1.0) * (float)local_480._4_4_;
                  local_3a0[2] = (fVar193 + local_680._8_4_ + 2.0) * fStack_478;
                  local_3a0[3] = (fVar193 + local_680._12_4_ + 3.0) * fStack_474;
                  fStack_390 = (fVar193 + local_680._16_4_ + 4.0) * fStack_470;
                  fStack_38c = (fVar193 + local_680._20_4_ + 5.0) * fStack_46c;
                  fStack_388 = (fVar193 + local_680._24_4_ + 6.0) * fStack_468;
                  fStack_384 = fVar193 + local_680._28_4_ + 7.0;
                  local_300._0_8_ = local_440._0_8_;
                  local_300._8_8_ = local_440._8_8_;
                  local_300._16_8_ = local_440._16_8_;
                  local_300._24_8_ = local_440._24_8_;
                  local_380 = local_300._0_8_;
                  uStack_378 = local_300._8_8_;
                  uStack_370 = local_300._16_8_;
                  uStack_368 = local_300._24_8_;
                  local_360 = local_6a0;
                  auVar169._8_4_ = 0x7f800000;
                  auVar169._0_8_ = 0x7f8000007f800000;
                  auVar169._12_4_ = 0x7f800000;
                  auVar169._16_4_ = 0x7f800000;
                  auVar169._20_4_ = 0x7f800000;
                  auVar169._24_4_ = 0x7f800000;
                  auVar169._28_4_ = 0x7f800000;
                  auVar123 = vblendmps_avx512vl(auVar169,local_6a0);
                  auVar144._0_4_ =
                       (uint)(local_3b0 & 1) * auVar123._0_4_ |
                       (uint)!(bool)(local_3b0 & 1) * 0x7f800000;
                  bVar13 = (bool)(local_3b0 >> 1 & 1);
                  auVar144._4_4_ = (uint)bVar13 * auVar123._4_4_ | (uint)!bVar13 * 0x7f800000;
                  bVar13 = (bool)(local_3b0 >> 2 & 1);
                  auVar144._8_4_ = (uint)bVar13 * auVar123._8_4_ | (uint)!bVar13 * 0x7f800000;
                  bVar13 = (bool)(local_3b0 >> 3 & 1);
                  auVar144._12_4_ = (uint)bVar13 * auVar123._12_4_ | (uint)!bVar13 * 0x7f800000;
                  bVar13 = (bool)(local_3b0 >> 4 & 1);
                  auVar144._16_4_ = (uint)bVar13 * auVar123._16_4_ | (uint)!bVar13 * 0x7f800000;
                  bVar13 = (bool)(local_3b0 >> 5 & 1);
                  auVar144._20_4_ = (uint)bVar13 * auVar123._20_4_ | (uint)!bVar13 * 0x7f800000;
                  bVar13 = (bool)(local_3b0 >> 6 & 1);
                  auVar144._24_4_ = (uint)bVar13 * auVar123._24_4_ | (uint)!bVar13 * 0x7f800000;
                  auVar144._28_4_ =
                       (uint)(local_3b0 >> 7) * auVar123._28_4_ |
                       (uint)!(bool)(local_3b0 >> 7) * 0x7f800000;
                  auVar123 = vshufps_avx(auVar144,auVar144,0xb1);
                  auVar123 = vminps_avx(auVar144,auVar123);
                  auVar125 = vshufpd_avx(auVar123,auVar123,5);
                  auVar123 = vminps_avx(auVar123,auVar125);
                  auVar125 = vpermpd_avx2(auVar123,0x4e);
                  auVar123 = vminps_avx(auVar123,auVar125);
                  uVar157 = vcmpps_avx512vl(auVar144,auVar123,0);
                  bVar88 = (byte)uVar157 & local_3b0;
                  bVar96 = local_3b0;
                  if (bVar88 != 0) {
                    bVar96 = bVar88;
                  }
                  uVar28 = 0;
                  for (uVar90 = (uint)bVar96; (uVar90 & 1) == 0; uVar90 = uVar90 >> 1 | 0x80000000)
                  {
                    uVar28 = uVar28 + 1;
                  }
                  uVar89 = (ulong)uVar28;
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar93->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                    fVar193 = local_3a0[uVar89];
                    uVar156 = *(undefined4 *)((long)&local_380 + uVar89 * 4);
                    fVar209 = 1.0 - fVar193;
                    auVar35._8_4_ = 0x80000000;
                    auVar35._0_8_ = 0x8000000080000000;
                    auVar35._12_4_ = 0x80000000;
                    auVar104 = vxorps_avx512vl(ZEXT416((uint)fVar209),auVar35);
                    auVar103 = ZEXT416((uint)(fVar193 * fVar209 * 4.0));
                    auVar102 = vfnmsub213ss_fma(ZEXT416((uint)fVar193),ZEXT416((uint)fVar193),
                                                auVar103);
                    auVar103 = vfmadd213ss_fma(ZEXT416((uint)fVar209),ZEXT416((uint)fVar209),
                                               auVar103);
                    fVar209 = fVar209 * auVar104._0_4_ * 0.5;
                    fVar192 = auVar102._0_4_ * 0.5;
                    fVar208 = auVar103._0_4_ * 0.5;
                    fVar210 = fVar193 * fVar193 * 0.5;
                    auVar198._0_4_ = fVar210 * (float)local_6d0._0_4_;
                    auVar198._4_4_ = fVar210 * (float)local_6d0._4_4_;
                    auVar198._8_4_ = fVar210 * (float)uStack_6c8;
                    auVar198._12_4_ = fVar210 * uStack_6c8._4_4_;
                    auVar185._4_4_ = fVar208;
                    auVar185._0_4_ = fVar208;
                    auVar185._8_4_ = fVar208;
                    auVar185._12_4_ = fVar208;
                    auVar103 = vfmadd132ps_fma(auVar185,auVar198,local_6c0);
                    auVar199._4_4_ = fVar192;
                    auVar199._0_4_ = fVar192;
                    auVar199._8_4_ = fVar192;
                    auVar199._12_4_ = fVar192;
                    auVar103 = vfmadd132ps_fma(auVar199,auVar103,local_6b0);
                    auVar186._4_4_ = fVar209;
                    auVar186._0_4_ = fVar209;
                    auVar186._8_4_ = fVar209;
                    auVar186._12_4_ = fVar209;
                    auVar103 = vfmadd132ps_fma(auVar186,auVar103,auVar20);
                    *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_360 + uVar89 * 4);
                    *(int *)(ray + k * 4 + 0x180) = auVar103._0_4_;
                    uVar9 = vextractps_avx(auVar103,1);
                    *(undefined4 *)(ray + k * 4 + 0x1a0) = uVar9;
                    uVar9 = vextractps_avx(auVar103,2);
                    *(undefined4 *)(ray + k * 4 + 0x1c0) = uVar9;
                    *(float *)(ray + k * 4 + 0x1e0) = fVar193;
                    *(undefined4 *)(ray + k * 4 + 0x200) = uVar156;
                    *(uint *)(ray + k * 4 + 0x220) = uVar7;
                    *(uint *)(ray + k * 4 + 0x240) = uVar94;
                    *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                    *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
                  }
                  else {
                    local_590 = local_6b0._0_8_;
                    uStack_588 = local_6b0._8_8_;
                    local_5a0 = local_6c0._0_4_;
                    fStack_59c = local_6c0._4_4_;
                    fStack_598 = local_6c0._8_4_;
                    fStack_594 = local_6c0._12_4_;
                    _local_6e0 = _local_6d0;
                    local_2a0 = vmovdqa64_avx512vl(auVar235._0_32_);
                    local_730 = pGVar93;
                    local_460 = local_680;
                    local_420 = local_6a0;
                    local_3fc = iVar8;
                    bVar96 = local_3b0;
                    do {
                      auVar125 = local_4c0;
                      auVar244 = auVar245._0_16_;
                      local_580 = *(undefined4 *)(ray + k * 4 + 0x100);
                      fVar193 = local_3a0[uVar89];
                      auVar176._4_4_ = fVar193;
                      auVar176._0_4_ = fVar193;
                      auVar176._8_4_ = fVar193;
                      auVar176._12_4_ = fVar193;
                      local_200._16_4_ = fVar193;
                      local_200._0_16_ = auVar176;
                      local_200._20_4_ = fVar193;
                      local_200._24_4_ = fVar193;
                      local_200._28_4_ = fVar193;
                      local_1e0 = *(undefined4 *)((long)&local_380 + uVar89 * 4);
                      *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_360 + uVar89 * 4)
                      ;
                      local_760.context = context->user;
                      fVar209 = 1.0 - fVar193;
                      auVar36._8_4_ = 0x80000000;
                      auVar36._0_8_ = 0x8000000080000000;
                      auVar36._12_4_ = 0x80000000;
                      auVar104 = vxorps_avx512vl(ZEXT416((uint)fVar209),auVar36);
                      auVar103 = ZEXT416((uint)(fVar193 * fVar209 * 4.0));
                      auVar102 = vfnmsub213ss_fma(auVar176,auVar176,auVar103);
                      auVar103 = vfmadd213ss_fma(ZEXT416((uint)fVar209),ZEXT416((uint)fVar209),
                                                 auVar103);
                      fVar209 = fVar209 * auVar104._0_4_ * 0.5;
                      fVar192 = auVar102._0_4_ * 0.5;
                      fVar208 = auVar103._0_4_ * 0.5;
                      fVar193 = fVar193 * fVar193 * 0.5;
                      auVar215._0_4_ = fVar193 * (float)local_6e0._0_4_;
                      auVar215._4_4_ = fVar193 * (float)local_6e0._4_4_;
                      auVar215._8_4_ = fVar193 * fStack_6d8;
                      auVar215._12_4_ = fVar193 * fStack_6d4;
                      auVar162._4_4_ = fVar208;
                      auVar162._0_4_ = fVar208;
                      auVar162._8_4_ = fVar208;
                      auVar162._12_4_ = fVar208;
                      auVar81._4_4_ = fStack_59c;
                      auVar81._0_4_ = local_5a0;
                      auVar81._8_4_ = fStack_598;
                      auVar81._12_4_ = fStack_594;
                      auVar103 = vfmadd132ps_fma(auVar162,auVar215,auVar81);
                      auVar200._4_4_ = fVar192;
                      auVar200._0_4_ = fVar192;
                      auVar200._8_4_ = fVar192;
                      auVar200._12_4_ = fVar192;
                      auVar82._8_8_ = uStack_588;
                      auVar82._0_8_ = local_590;
                      auVar103 = vfmadd132ps_fma(auVar200,auVar103,auVar82);
                      auVar163._4_4_ = fVar209;
                      auVar163._0_4_ = fVar209;
                      auVar163._8_4_ = fVar209;
                      auVar163._12_4_ = fVar209;
                      auVar103 = vfmadd132ps_fma(auVar163,auVar103,auVar20);
                      local_260 = auVar103._0_4_;
                      auVar206._8_4_ = 1;
                      auVar206._0_8_ = 0x100000001;
                      auVar206._12_4_ = 1;
                      auVar206._16_4_ = 1;
                      auVar206._20_4_ = 1;
                      auVar206._24_4_ = 1;
                      auVar206._28_4_ = 1;
                      local_240 = vpermps_avx2(auVar206,ZEXT1632(auVar103));
                      auVar219._8_4_ = 2;
                      auVar219._0_8_ = 0x200000002;
                      auVar219._12_4_ = 2;
                      auVar219._16_4_ = 2;
                      auVar219._20_4_ = 2;
                      auVar219._24_4_ = 2;
                      auVar219._28_4_ = 2;
                      local_220 = vpermps_avx2(auVar219,ZEXT1632(auVar103));
                      iStack_25c = local_260;
                      iStack_258 = local_260;
                      iStack_254 = local_260;
                      iStack_250 = local_260;
                      iStack_24c = local_260;
                      iStack_248 = local_260;
                      iStack_244 = local_260;
                      uStack_1dc = local_1e0;
                      uStack_1d8 = local_1e0;
                      uStack_1d4 = local_1e0;
                      uStack_1d0 = local_1e0;
                      uStack_1cc = local_1e0;
                      uStack_1c8 = local_1e0;
                      uStack_1c4 = local_1e0;
                      local_1c0 = local_340._0_8_;
                      uStack_1b8 = local_340._8_8_;
                      uStack_1b0 = local_340._16_8_;
                      uStack_1a8 = local_340._24_8_;
                      local_1a0 = local_320;
                      auVar123 = vpcmpeqd_avx2(local_320,local_320);
                      local_728[1] = auVar123;
                      *local_728 = auVar123;
                      local_180 = (local_760.context)->instID[0];
                      uStack_17c = local_180;
                      uStack_178 = local_180;
                      uStack_174 = local_180;
                      uStack_170 = local_180;
                      uStack_16c = local_180;
                      uStack_168 = local_180;
                      uStack_164 = local_180;
                      local_160 = (local_760.context)->instPrimID[0];
                      uStack_15c = local_160;
                      uStack_158 = local_160;
                      uStack_154 = local_160;
                      uStack_150 = local_160;
                      uStack_14c = local_160;
                      uStack_148 = local_160;
                      uStack_144 = local_160;
                      local_5c0 = local_280._0_8_;
                      uStack_5b8 = local_280._8_8_;
                      uStack_5b0 = local_280._16_8_;
                      uStack_5a8 = local_280._24_8_;
                      local_760.valid = (int *)&local_5c0;
                      local_760.geometryUserPtr = pGVar93->userPtr;
                      local_760.hit = (RTCHitN *)&local_260;
                      local_760.N = 8;
                      local_4c0._1_3_ = 0;
                      local_4c0[0] = bVar96;
                      local_4c0._4_28_ = auVar125._4_28_;
                      local_760.ray = (RTCRayN *)ray;
                      if (pGVar93->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                        (*pGVar93->intersectionFilterN)(&local_760);
                        auVar123 = vmovdqa64_avx512vl(local_2a0);
                        auVar235 = ZEXT3264(auVar123);
                        auVar248 = ZEXT3264(local_620);
                        auVar247 = ZEXT3264(local_600);
                        auVar246 = ZEXT3264(local_5e0);
                        auVar249 = ZEXT3264(local_720);
                        auVar240 = ZEXT3264(local_700);
                        auVar243 = ZEXT3264(local_520);
                        auVar242 = ZEXT3264(local_4e0);
                        auVar241 = ZEXT3264(local_500);
                        auVar103 = vxorps_avx512vl(auVar244,auVar244);
                        auVar245 = ZEXT1664(auVar103);
                        pGVar93 = local_730;
                        bVar96 = local_4c0[0];
                      }
                      auVar103 = auVar245._0_16_;
                      auVar77._8_8_ = uStack_5b8;
                      auVar77._0_8_ = local_5c0;
                      auVar77._16_8_ = uStack_5b0;
                      auVar77._24_8_ = uStack_5a8;
                      if (auVar77 == (undefined1  [32])0x0) {
LAB_01c4e0f7:
                        *(undefined4 *)(ray + k * 4 + 0x100) = local_580;
                      }
                      else {
                        p_Var12 = context->args->filter;
                        if ((p_Var12 != (RTCFilterFunctionN)0x0) &&
                           (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT ||
                            (((pGVar93->field_8).field_0x2 & 0x40) != 0)))) {
                          (*p_Var12)(&local_760);
                          bVar96 = local_4c0[0];
                          auVar123 = vmovdqa64_avx512vl(local_2a0);
                          auVar235 = ZEXT3264(auVar123);
                          auVar248 = ZEXT3264(local_620);
                          auVar247 = ZEXT3264(local_600);
                          auVar246 = ZEXT3264(local_5e0);
                          auVar249 = ZEXT3264(local_720);
                          auVar240 = ZEXT3264(local_700);
                          auVar243 = ZEXT3264(local_520);
                          auVar242 = ZEXT3264(local_4e0);
                          auVar241 = ZEXT3264(local_500);
                          auVar103 = vxorps_avx512vl(auVar103,auVar103);
                          auVar245 = ZEXT1664(auVar103);
                          pGVar93 = local_730;
                        }
                        auVar78._8_8_ = uStack_5b8;
                        auVar78._0_8_ = local_5c0;
                        auVar78._16_8_ = uStack_5b0;
                        auVar78._24_8_ = uStack_5a8;
                        if (auVar78 == (undefined1  [32])0x0) goto LAB_01c4e0f7;
                        uVar27 = vptestmd_avx512vl(auVar78,auVar78);
                        iVar1 = *(int *)(local_760.hit + 4);
                        iVar2 = *(int *)(local_760.hit + 8);
                        iVar72 = *(int *)(local_760.hit + 0xc);
                        iVar73 = *(int *)(local_760.hit + 0x10);
                        iVar74 = *(int *)(local_760.hit + 0x14);
                        iVar75 = *(int *)(local_760.hit + 0x18);
                        iVar76 = *(int *)(local_760.hit + 0x1c);
                        bVar88 = (byte)uVar27;
                        bVar13 = (bool)((byte)(uVar27 >> 1) & 1);
                        bVar14 = (bool)((byte)(uVar27 >> 2) & 1);
                        bVar15 = (bool)((byte)(uVar27 >> 3) & 1);
                        bVar16 = (bool)((byte)(uVar27 >> 4) & 1);
                        bVar17 = (bool)((byte)(uVar27 >> 5) & 1);
                        bVar18 = (bool)((byte)(uVar27 >> 6) & 1);
                        bVar19 = SUB81(uVar27 >> 7,0);
                        *(uint *)(local_760.ray + 0x180) =
                             (uint)(bVar88 & 1) * *(int *)local_760.hit |
                             (uint)!(bool)(bVar88 & 1) * *(int *)(local_760.ray + 0x180);
                        *(uint *)(local_760.ray + 0x184) =
                             (uint)bVar13 * iVar1 | (uint)!bVar13 * *(int *)(local_760.ray + 0x184);
                        *(uint *)(local_760.ray + 0x188) =
                             (uint)bVar14 * iVar2 | (uint)!bVar14 * *(int *)(local_760.ray + 0x188);
                        *(uint *)(local_760.ray + 0x18c) =
                             (uint)bVar15 * iVar72 | (uint)!bVar15 * *(int *)(local_760.ray + 0x18c)
                        ;
                        *(uint *)(local_760.ray + 400) =
                             (uint)bVar16 * iVar73 | (uint)!bVar16 * *(int *)(local_760.ray + 400);
                        *(uint *)(local_760.ray + 0x194) =
                             (uint)bVar17 * iVar74 | (uint)!bVar17 * *(int *)(local_760.ray + 0x194)
                        ;
                        *(uint *)(local_760.ray + 0x198) =
                             (uint)bVar18 * iVar75 | (uint)!bVar18 * *(int *)(local_760.ray + 0x198)
                        ;
                        *(uint *)(local_760.ray + 0x19c) =
                             (uint)bVar19 * iVar76 | (uint)!bVar19 * *(int *)(local_760.ray + 0x19c)
                        ;
                        iVar1 = *(int *)(local_760.hit + 0x24);
                        iVar2 = *(int *)(local_760.hit + 0x28);
                        iVar72 = *(int *)(local_760.hit + 0x2c);
                        iVar73 = *(int *)(local_760.hit + 0x30);
                        iVar74 = *(int *)(local_760.hit + 0x34);
                        iVar75 = *(int *)(local_760.hit + 0x38);
                        iVar76 = *(int *)(local_760.hit + 0x3c);
                        bVar13 = (bool)((byte)(uVar27 >> 1) & 1);
                        bVar14 = (bool)((byte)(uVar27 >> 2) & 1);
                        bVar15 = (bool)((byte)(uVar27 >> 3) & 1);
                        bVar16 = (bool)((byte)(uVar27 >> 4) & 1);
                        bVar17 = (bool)((byte)(uVar27 >> 5) & 1);
                        bVar18 = (bool)((byte)(uVar27 >> 6) & 1);
                        bVar19 = SUB81(uVar27 >> 7,0);
                        *(uint *)(local_760.ray + 0x1a0) =
                             (uint)(bVar88 & 1) * *(int *)(local_760.hit + 0x20) |
                             (uint)!(bool)(bVar88 & 1) * *(int *)(local_760.ray + 0x1a0);
                        *(uint *)(local_760.ray + 0x1a4) =
                             (uint)bVar13 * iVar1 | (uint)!bVar13 * *(int *)(local_760.ray + 0x1a4);
                        *(uint *)(local_760.ray + 0x1a8) =
                             (uint)bVar14 * iVar2 | (uint)!bVar14 * *(int *)(local_760.ray + 0x1a8);
                        *(uint *)(local_760.ray + 0x1ac) =
                             (uint)bVar15 * iVar72 | (uint)!bVar15 * *(int *)(local_760.ray + 0x1ac)
                        ;
                        *(uint *)(local_760.ray + 0x1b0) =
                             (uint)bVar16 * iVar73 | (uint)!bVar16 * *(int *)(local_760.ray + 0x1b0)
                        ;
                        *(uint *)(local_760.ray + 0x1b4) =
                             (uint)bVar17 * iVar74 | (uint)!bVar17 * *(int *)(local_760.ray + 0x1b4)
                        ;
                        *(uint *)(local_760.ray + 0x1b8) =
                             (uint)bVar18 * iVar75 | (uint)!bVar18 * *(int *)(local_760.ray + 0x1b8)
                        ;
                        *(uint *)(local_760.ray + 0x1bc) =
                             (uint)bVar19 * iVar76 | (uint)!bVar19 * *(int *)(local_760.ray + 0x1bc)
                        ;
                        iVar1 = *(int *)(local_760.hit + 0x44);
                        iVar2 = *(int *)(local_760.hit + 0x48);
                        iVar72 = *(int *)(local_760.hit + 0x4c);
                        iVar73 = *(int *)(local_760.hit + 0x50);
                        iVar74 = *(int *)(local_760.hit + 0x54);
                        iVar75 = *(int *)(local_760.hit + 0x58);
                        iVar76 = *(int *)(local_760.hit + 0x5c);
                        bVar13 = (bool)((byte)(uVar27 >> 1) & 1);
                        bVar14 = (bool)((byte)(uVar27 >> 2) & 1);
                        bVar15 = (bool)((byte)(uVar27 >> 3) & 1);
                        bVar16 = (bool)((byte)(uVar27 >> 4) & 1);
                        bVar17 = (bool)((byte)(uVar27 >> 5) & 1);
                        bVar18 = (bool)((byte)(uVar27 >> 6) & 1);
                        bVar19 = SUB81(uVar27 >> 7,0);
                        *(uint *)(local_760.ray + 0x1c0) =
                             (uint)(bVar88 & 1) * *(int *)(local_760.hit + 0x40) |
                             (uint)!(bool)(bVar88 & 1) * *(int *)(local_760.ray + 0x1c0);
                        *(uint *)(local_760.ray + 0x1c4) =
                             (uint)bVar13 * iVar1 | (uint)!bVar13 * *(int *)(local_760.ray + 0x1c4);
                        *(uint *)(local_760.ray + 0x1c8) =
                             (uint)bVar14 * iVar2 | (uint)!bVar14 * *(int *)(local_760.ray + 0x1c8);
                        *(uint *)(local_760.ray + 0x1cc) =
                             (uint)bVar15 * iVar72 | (uint)!bVar15 * *(int *)(local_760.ray + 0x1cc)
                        ;
                        *(uint *)(local_760.ray + 0x1d0) =
                             (uint)bVar16 * iVar73 | (uint)!bVar16 * *(int *)(local_760.ray + 0x1d0)
                        ;
                        *(uint *)(local_760.ray + 0x1d4) =
                             (uint)bVar17 * iVar74 | (uint)!bVar17 * *(int *)(local_760.ray + 0x1d4)
                        ;
                        *(uint *)(local_760.ray + 0x1d8) =
                             (uint)bVar18 * iVar75 | (uint)!bVar18 * *(int *)(local_760.ray + 0x1d8)
                        ;
                        *(uint *)(local_760.ray + 0x1dc) =
                             (uint)bVar19 * iVar76 | (uint)!bVar19 * *(int *)(local_760.ray + 0x1dc)
                        ;
                        iVar1 = *(int *)(local_760.hit + 100);
                        iVar2 = *(int *)(local_760.hit + 0x68);
                        iVar72 = *(int *)(local_760.hit + 0x6c);
                        iVar73 = *(int *)(local_760.hit + 0x70);
                        iVar74 = *(int *)(local_760.hit + 0x74);
                        iVar75 = *(int *)(local_760.hit + 0x78);
                        iVar76 = *(int *)(local_760.hit + 0x7c);
                        bVar13 = (bool)((byte)(uVar27 >> 1) & 1);
                        bVar14 = (bool)((byte)(uVar27 >> 2) & 1);
                        bVar15 = (bool)((byte)(uVar27 >> 3) & 1);
                        bVar16 = (bool)((byte)(uVar27 >> 4) & 1);
                        bVar17 = (bool)((byte)(uVar27 >> 5) & 1);
                        bVar18 = (bool)((byte)(uVar27 >> 6) & 1);
                        bVar19 = SUB81(uVar27 >> 7,0);
                        *(uint *)(local_760.ray + 0x1e0) =
                             (uint)(bVar88 & 1) * *(int *)(local_760.hit + 0x60) |
                             (uint)!(bool)(bVar88 & 1) * *(int *)(local_760.ray + 0x1e0);
                        *(uint *)(local_760.ray + 0x1e4) =
                             (uint)bVar13 * iVar1 | (uint)!bVar13 * *(int *)(local_760.ray + 0x1e4);
                        *(uint *)(local_760.ray + 0x1e8) =
                             (uint)bVar14 * iVar2 | (uint)!bVar14 * *(int *)(local_760.ray + 0x1e8);
                        *(uint *)(local_760.ray + 0x1ec) =
                             (uint)bVar15 * iVar72 | (uint)!bVar15 * *(int *)(local_760.ray + 0x1ec)
                        ;
                        *(uint *)(local_760.ray + 0x1f0) =
                             (uint)bVar16 * iVar73 | (uint)!bVar16 * *(int *)(local_760.ray + 0x1f0)
                        ;
                        *(uint *)(local_760.ray + 500) =
                             (uint)bVar17 * iVar74 | (uint)!bVar17 * *(int *)(local_760.ray + 500);
                        *(uint *)(local_760.ray + 0x1f8) =
                             (uint)bVar18 * iVar75 | (uint)!bVar18 * *(int *)(local_760.ray + 0x1f8)
                        ;
                        *(uint *)(local_760.ray + 0x1fc) =
                             (uint)bVar19 * iVar76 | (uint)!bVar19 * *(int *)(local_760.ray + 0x1fc)
                        ;
                        auVar145._0_4_ =
                             (uint)(bVar88 & 1) * *(int *)(local_760.hit + 0x80) |
                             (uint)!(bool)(bVar88 & 1) * *(int *)(local_760.ray + 0x200);
                        bVar13 = (bool)((byte)(uVar27 >> 1) & 1);
                        auVar145._4_4_ =
                             (uint)bVar13 * *(int *)(local_760.hit + 0x84) |
                             (uint)!bVar13 * *(int *)(local_760.ray + 0x204);
                        bVar13 = (bool)((byte)(uVar27 >> 2) & 1);
                        auVar145._8_4_ =
                             (uint)bVar13 * *(int *)(local_760.hit + 0x88) |
                             (uint)!bVar13 * *(int *)(local_760.ray + 0x208);
                        bVar13 = (bool)((byte)(uVar27 >> 3) & 1);
                        auVar145._12_4_ =
                             (uint)bVar13 * *(int *)(local_760.hit + 0x8c) |
                             (uint)!bVar13 * *(int *)(local_760.ray + 0x20c);
                        bVar13 = (bool)((byte)(uVar27 >> 4) & 1);
                        auVar145._16_4_ =
                             (uint)bVar13 * *(int *)(local_760.hit + 0x90) |
                             (uint)!bVar13 * *(int *)(local_760.ray + 0x210);
                        bVar13 = (bool)((byte)(uVar27 >> 5) & 1);
                        auVar145._20_4_ =
                             (uint)bVar13 * *(int *)(local_760.hit + 0x94) |
                             (uint)!bVar13 * *(int *)(local_760.ray + 0x214);
                        bVar13 = (bool)((byte)(uVar27 >> 6) & 1);
                        auVar145._24_4_ =
                             (uint)bVar13 * *(int *)(local_760.hit + 0x98) |
                             (uint)!bVar13 * *(int *)(local_760.ray + 0x218);
                        bVar13 = SUB81(uVar27 >> 7,0);
                        auVar145._28_4_ =
                             (uint)bVar13 * *(int *)(local_760.hit + 0x9c) |
                             (uint)!bVar13 * *(int *)(local_760.ray + 0x21c);
                        *(undefined1 (*) [32])(local_760.ray + 0x200) = auVar145;
                        auVar123 = vmovdqu32_avx512vl(*(undefined1 (*) [32])(local_760.hit + 0xa0));
                        *(undefined1 (*) [32])(local_760.ray + 0x220) = auVar123;
                        auVar123 = vmovdqu32_avx512vl(*(undefined1 (*) [32])(local_760.hit + 0xc0));
                        *(undefined1 (*) [32])(local_760.ray + 0x240) = auVar123;
                        auVar123 = vmovdqa32_avx512vl(*(undefined1 (*) [32])(local_760.hit + 0xe0));
                        *(undefined1 (*) [32])(local_760.ray + 0x260) = auVar123;
                        auVar123 = vmovdqa32_avx512vl(*(undefined1 (*) [32])(local_760.hit + 0x100))
                        ;
                        *(undefined1 (*) [32])(local_760.ray + 0x280) = auVar123;
                      }
                      bVar88 = ~(byte)(1 << ((uint)uVar89 & 0x1f)) & bVar96;
                      uVar156 = *(undefined4 *)(ray + k * 4 + 0x100);
                      auVar45._4_4_ = uVar156;
                      auVar45._0_4_ = uVar156;
                      auVar45._8_4_ = uVar156;
                      auVar45._12_4_ = uVar156;
                      auVar45._16_4_ = uVar156;
                      auVar45._20_4_ = uVar156;
                      auVar45._24_4_ = uVar156;
                      auVar45._28_4_ = uVar156;
                      uVar157 = vcmpps_avx512vl(local_6a0,auVar45,2);
                      bVar96 = bVar88 & (byte)uVar157;
                      if ((bVar88 & (byte)uVar157) != 0) {
                        auVar170._8_4_ = 0x7f800000;
                        auVar170._0_8_ = 0x7f8000007f800000;
                        auVar170._12_4_ = 0x7f800000;
                        auVar170._16_4_ = 0x7f800000;
                        auVar170._20_4_ = 0x7f800000;
                        auVar170._24_4_ = 0x7f800000;
                        auVar170._28_4_ = 0x7f800000;
                        auVar123 = vblendmps_avx512vl(auVar170,local_6a0);
                        auVar146._0_4_ =
                             (uint)(bVar96 & 1) * auVar123._0_4_ |
                             (uint)!(bool)(bVar96 & 1) * 0x7f800000;
                        bVar13 = (bool)(bVar96 >> 1 & 1);
                        auVar146._4_4_ = (uint)bVar13 * auVar123._4_4_ | (uint)!bVar13 * 0x7f800000;
                        bVar13 = (bool)(bVar96 >> 2 & 1);
                        auVar146._8_4_ = (uint)bVar13 * auVar123._8_4_ | (uint)!bVar13 * 0x7f800000;
                        bVar13 = (bool)(bVar96 >> 3 & 1);
                        auVar146._12_4_ =
                             (uint)bVar13 * auVar123._12_4_ | (uint)!bVar13 * 0x7f800000;
                        bVar13 = (bool)(bVar96 >> 4 & 1);
                        auVar146._16_4_ =
                             (uint)bVar13 * auVar123._16_4_ | (uint)!bVar13 * 0x7f800000;
                        bVar13 = (bool)(bVar96 >> 5 & 1);
                        auVar146._20_4_ =
                             (uint)bVar13 * auVar123._20_4_ | (uint)!bVar13 * 0x7f800000;
                        bVar13 = (bool)(bVar96 >> 6 & 1);
                        auVar146._24_4_ =
                             (uint)bVar13 * auVar123._24_4_ | (uint)!bVar13 * 0x7f800000;
                        auVar146._28_4_ =
                             (uint)(bVar96 >> 7) * auVar123._28_4_ |
                             (uint)!(bool)(bVar96 >> 7) * 0x7f800000;
                        auVar123 = vshufps_avx(auVar146,auVar146,0xb1);
                        auVar123 = vminps_avx(auVar146,auVar123);
                        auVar125 = vshufpd_avx(auVar123,auVar123,5);
                        auVar123 = vminps_avx(auVar123,auVar125);
                        auVar125 = vpermpd_avx2(auVar123,0x4e);
                        auVar123 = vminps_avx(auVar123,auVar125);
                        uVar157 = vcmpps_avx512vl(auVar146,auVar123,0);
                        bVar87 = (byte)uVar157 & bVar96;
                        bVar88 = bVar96;
                        if (bVar87 != 0) {
                          bVar88 = bVar87;
                        }
                        uVar28 = 0;
                        for (uVar90 = (uint)bVar88; (uVar90 & 1) == 0;
                            uVar90 = uVar90 >> 1 | 0x80000000) {
                          uVar28 = uVar28 + 1;
                        }
                        uVar89 = (ulong)uVar28;
                      }
                    } while (bVar96 != 0);
                  }
                }
              }
            }
          }
          lVar91 = lVar91 + 8;
          auVar239 = auVar240;
        } while ((int)lVar91 < iVar8);
      }
      uVar156 = *(undefined4 *)(ray + k * 4 + 0x100);
      auVar34._4_4_ = uVar156;
      auVar34._0_4_ = uVar156;
      auVar34._8_4_ = uVar156;
      auVar34._12_4_ = uVar156;
      uVar157 = vcmpps_avx512vl(local_2b0,auVar34,2);
      uVar94 = (uint)uVar95 & (uint)uVar95 + 0xf & (uint)uVar157;
      uVar95 = (ulong)uVar94;
    } while (uVar94 != 0);
  }
  return;
}

Assistant:

static __forceinline void intersect_t(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID),ray.time()[k]);

          Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }